

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O3

void tinygltf::SerializeGltfModel(Model *model,json *o)

{
  pointer pAVar1;
  pointer pTVar2;
  pointer pSVar3;
  pointer pLVar4;
  pointer pAVar5;
  pointer pAVar6;
  double dVar7;
  value_t vVar8;
  pointer pAVar9;
  double *pdVar10;
  pointer pcVar11;
  pointer pMVar12;
  pointer pMVar13;
  pointer pTVar14;
  pointer pSVar15;
  pointer pLVar16;
  pointer pAVar17;
  pointer pAVar18;
  pointer pNVar19;
  Model *pMVar20;
  pointer pdVar21;
  int iVar22;
  int iVar23;
  ExtensionMap *pEVar24;
  ulong uVar25;
  pointer pAVar26;
  reference pbVar27;
  _Rb_tree_node_base *p_Var28;
  reference pbVar29;
  ulong uVar30;
  char *pcVar31;
  pointer pAVar32;
  pointer pNVar33;
  ulong uVar34;
  pointer pNVar35;
  pointer pMVar36;
  json_value jVar37;
  json_value jVar38;
  json_value jVar39;
  uint uVar40;
  string *psVar41;
  pointer pCVar42;
  long lVar43;
  pointer pMVar44;
  string *psVar45;
  pointer pMVar46;
  double *pdVar47;
  pointer pSVar48;
  long lVar49;
  ExtensionMap *pEVar50;
  ulong uVar51;
  pointer pBVar52;
  pointer pSVar53;
  bool bVar54;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  vector<int,_std::allocator<int>_> values;
  json sparse;
  json indices;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extensionsUsed;
  json animation;
  json asset;
  string type;
  json material;
  json sources;
  json source;
  undefined1 local_378 [40];
  Model *local_350;
  undefined1 local_348 [24];
  primitive_iterator_t local_330;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_328;
  string local_318;
  vector<double,_std::allocator<double>_> local_2f8;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_2e0;
  ExtensionMap *local_2d0;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_2c8;
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  pointer local_288;
  _Alloc_hider _Stack_280;
  pointer local_278;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_270;
  pointer pVStack_260;
  undefined1 local_250 [88];
  ExtensionMap EStack_1f8;
  Value local_1c8;
  ExtensionMap local_130 [3];
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_78;
  ulong local_68;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_60;
  ulong local_50;
  pointer local_48;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_40;
  
  local_350 = model;
  local_318.field_2._8_8_ = o;
  if ((model->accessors).super__Vector_base<tinygltf::Accessor,_std::allocator<tinygltf::Accessor>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (model->accessors).super__Vector_base<tinygltf::Accessor,_std::allocator<tinygltf::Accessor>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_2f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start._0_1_ = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)0x0;
    local_2f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)&local_2f8,true);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)&local_2f8,true);
    if ((model->accessors).
        super__Vector_base<tinygltf::Accessor,_std::allocator<tinygltf::Accessor>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (model->accessors).
        super__Vector_base<tinygltf::Accessor,_std::allocator<tinygltf::Accessor>_>._M_impl.
        super__Vector_impl_data._M_start) {
      psVar41 = (string *)(local_378 + 0x10);
      pEVar50 = (ExtensionMap *)0x0;
      do {
        local_2c8.m_type = null;
        local_2c8.m_value.object = (object_t *)0x0;
        local_2d0 = pEVar50;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::assert_invariant(&local_2c8,true);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::assert_invariant(&local_2c8,true);
        pAVar9 = (model->accessors).
                 super__Vector_base<tinygltf::Accessor,_std::allocator<tinygltf::Accessor>_>._M_impl
                 .super__Vector_impl_data._M_start;
        pAVar1 = pAVar9 + (long)pEVar50;
        if (-1 < pAVar9[(long)pEVar50].bufferView) {
          local_2a8[0] = 'b';
          local_2a8[1] = 'u';
          local_2a8[2] = 'f';
          local_2a8[3] = 'f';
          local_2a8[4] = 'e';
          local_2a8[5] = 'r';
          local_2a8[6] = 'V';
          local_2a8[7] = 'i';
          local_2a8[8] = 'e';
          local_2a8[9] = 'w';
          local_2b8._8_8_ = (pointer)0xa;
          local_2a8[10] = '\0';
          local_2b8._0_8_ = (string *)local_2a8;
          SerializeNumberProperty<int>((string *)local_2a8,pAVar1->bufferView,&local_2c8);
          if ((string *)local_2b8._0_8_ != (string *)local_2a8) {
            operator_delete((void *)local_2b8._0_8_);
          }
        }
        if (pAVar1->byteOffset != 0) {
          local_2a8[0] = 'b';
          local_2a8[1] = 'y';
          local_2a8[2] = 't';
          local_2a8[3] = 'e';
          local_2a8[4] = 'O';
          local_2a8[5] = 'f';
          local_2a8[6] = 'f';
          local_2a8[7] = 's';
          local_2a8[8] = 'e';
          local_2a8[9] = 't';
          local_2b8._8_8_ = (pointer)0xa;
          local_2a8[10] = '\0';
          local_2b8._0_8_ = (string *)local_2a8;
          SerializeNumberProperty<unsigned_long>((string *)local_2a8,pAVar1->byteOffset,&local_2c8);
          if ((string *)local_2b8._0_8_ != (string *)local_2a8) {
            operator_delete((void *)local_2b8._0_8_);
          }
        }
        local_2a8[8] = 't';
        local_2a8[9] = 'T';
        local_2a8[10] = 'y';
        local_2a8[0xb] = 'p';
        local_2a8[0xc] = 'e';
        local_2a8[0] = 'c';
        local_2a8[1] = 'o';
        local_2a8[2] = 'm';
        local_2a8[3] = 'p';
        local_2a8[4] = 'o';
        local_2a8[5] = 'n';
        local_2a8[6] = 'e';
        local_2a8[7] = 'n';
        local_2b8._8_8_ = (pointer)0xd;
        local_2a8[0xd] = '\0';
        local_2b8._0_8_ = (string *)local_2a8;
        SerializeNumberProperty<int>((string *)local_2a8,pAVar1->componentType,&local_2c8);
        if ((string *)local_2b8._0_8_ != (string *)local_2a8) {
          operator_delete((void *)local_2b8._0_8_);
        }
        local_2a8[4] = 't';
        local_2a8[0] = 'c';
        local_2a8[1] = 'o';
        local_2a8[2] = 'u';
        local_2a8[3] = 'n';
        local_2b8._8_8_ = (pointer)0x5;
        local_2a8[5] = '\0';
        local_2b8._0_8_ = (string *)local_2a8;
        SerializeNumberProperty<unsigned_long>((string *)local_2a8,pAVar1->count,&local_2c8);
        if ((string *)local_2b8._0_8_ != (string *)local_2a8) {
          operator_delete((void *)local_2b8._0_8_);
        }
        if ((pAVar1->componentType == 0x140a) || (pAVar1->componentType == 0x1406)) {
          local_2a8[2] = 'n';
          local_2a8[0] = 'm';
          local_2a8[1] = 'i';
          local_2b8._8_8_ = (pointer)0x3;
          local_2a8[3] = '\0';
          local_2b8._0_8_ = (string *)local_2a8;
          SerializeNumberArrayProperty<double>((string *)local_2b8,&pAVar1->minValues,&local_2c8);
          if ((string *)local_2b8._0_8_ != (string *)local_2a8) {
            operator_delete((void *)local_2b8._0_8_);
          }
          local_2a8[2] = 'x';
          local_2a8[0] = 'm';
          local_2a8[1] = 'a';
          local_2b8._8_8_ = (pointer)0x3;
          local_2a8[3] = '\0';
          local_2b8._0_8_ = (string *)local_2a8;
          SerializeNumberArrayProperty<double>((string *)local_2b8,&pAVar1->maxValues,&local_2c8);
          psVar45 = (string *)local_2b8._0_8_;
          if ((string *)local_2b8._0_8_ != (string *)local_2a8) goto LAB_0011e3c7;
        }
        else {
          local_378._0_8_ = (pointer)0x0;
          local_378._8_8_ = (object_t *)0x0;
          local_378[0x10] = '\0';
          local_378[0x11] = '\0';
          local_378[0x12] = '\0';
          local_378[0x13] = '\0';
          local_378[0x14] = '\0';
          local_378[0x15] = '\0';
          local_378[0x16] = '\0';
          local_378[0x17] = '\0';
          pdVar10 = *(pointer *)
                     ((long)&(pAVar1->minValues).super__Vector_base<double,_std::allocator<double>_>
                     + 8);
          for (pdVar47 = *(double **)
                          &(pAVar1->minValues).super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl; pdVar47 != pdVar10; pdVar47 = pdVar47 + 1) {
            local_2b8._0_4_ = (int)*pdVar47;
            if ((object_t *)local_378._8_8_ ==
                (object_t *)
                CONCAT17(local_378[0x17],
                         CONCAT16(local_378[0x16],
                                  CONCAT15(local_378[0x15],
                                           CONCAT14(local_378[0x14],
                                                    CONCAT13(local_378[0x13],
                                                             CONCAT12(local_378[0x12],
                                                                      CONCAT11(local_378[0x11],
                                                                               local_378[0x10]))))))
                        )) {
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        ((vector<int,_std::allocator<int>_> *)local_378,(iterator)local_378._8_8_,
                         (int *)local_2b8);
            }
            else {
              *(int *)&((_Rep_type *)local_378._8_8_)->_M_impl = (int)*pdVar47;
              local_378._8_8_ = &(((_Rep_type *)local_378._8_8_)->_M_impl).field_0x4;
            }
          }
          local_2a8[2] = 'n';
          local_2a8[0] = 'm';
          local_2a8[1] = 'i';
          local_2b8._8_8_ = (pointer)0x3;
          local_2a8[3] = '\0';
          local_2b8._0_8_ = (string *)local_2a8;
          SerializeNumberArrayProperty<int>
                    ((string *)local_2b8,(vector<int,_std::allocator<int>_> *)local_378,&local_2c8);
          if ((string *)local_2b8._0_8_ != (string *)local_2a8) {
            operator_delete((void *)local_2b8._0_8_);
          }
          if ((pointer)local_378._0_8_ != (pointer)0x0) {
            operator_delete((void *)local_378._0_8_);
          }
          local_378._0_8_ = (string *)0x0;
          local_378._8_8_ = (object_t *)0x0;
          local_378[0x10] = '\0';
          local_378[0x11] = '\0';
          local_378[0x12] = '\0';
          local_378[0x13] = '\0';
          local_378[0x14] = '\0';
          local_378[0x15] = '\0';
          local_378[0x16] = '\0';
          local_378[0x17] = '\0';
          pdVar10 = *(pointer *)
                     ((long)&(pAVar1->maxValues).super__Vector_base<double,_std::allocator<double>_>
                     + 8);
          for (pdVar47 = *(double **)
                          &(pAVar1->maxValues).super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl; pdVar47 != pdVar10; pdVar47 = pdVar47 + 1) {
            local_2b8._0_4_ = (int)*pdVar47;
            if ((object_t *)local_378._8_8_ ==
                (object_t *)
                CONCAT17(local_378[0x17],
                         CONCAT16(local_378[0x16],
                                  CONCAT15(local_378[0x15],
                                           CONCAT14(local_378[0x14],
                                                    CONCAT13(local_378[0x13],
                                                             CONCAT12(local_378[0x12],
                                                                      CONCAT11(local_378[0x11],
                                                                               local_378[0x10]))))))
                        )) {
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        ((vector<int,_std::allocator<int>_> *)local_378,(iterator)local_378._8_8_,
                         (int *)local_2b8);
            }
            else {
              *(int *)&((_Rep_type *)local_378._8_8_)->_M_impl = (int)*pdVar47;
              local_378._8_8_ = &(((_Rep_type *)local_378._8_8_)->_M_impl).field_0x4;
            }
          }
          local_2a8[2] = 'x';
          local_2a8[0] = 'm';
          local_2a8[1] = 'a';
          local_2b8._8_8_ = (pointer)0x3;
          local_2a8[3] = '\0';
          local_2b8._0_8_ = (string *)local_2a8;
          SerializeNumberArrayProperty<int>
                    ((string *)local_2b8,(vector<int,_std::allocator<int>_> *)local_378,&local_2c8);
          model = local_350;
          if ((string *)local_2b8._0_8_ != (string *)local_2a8) {
            operator_delete((void *)local_2b8._0_8_);
          }
          psVar45 = (string *)local_378._0_8_;
          if ((string *)local_378._0_8_ != (string *)0x0) {
LAB_0011e3c7:
            operator_delete(psVar45);
          }
        }
        if (pAVar1->normalized == true) {
          local_378[0x10] = 'n';
          local_378[0x11] = 'o';
          local_378[0x12] = 'r';
          local_378[0x13] = 'm';
          local_378[0x14] = 'a';
          local_378[0x15] = 'l';
          local_378[0x16] = 'i';
          local_378[0x17] = 'z';
          local_378[0x18] = 'e';
          local_378[0x19] = 'd';
          local_378._8_8_ = (int *)0xa;
          local_378[0x1a] = '\0';
          local_250[0x28] = pAVar1->normalized;
          local_2b8._0_8_ = (pointer)0x3;
          local_2b8._8_8_ = (object_t *)0x0;
          local_2a8[0] = SUB81(local_298,0);
          local_2a8[1] = (undefined1)((ulong)local_298 >> 8);
          local_2a8[2] = (undefined1)((ulong)local_298 >> 0x10);
          local_2a8[3] = (undefined1)((ulong)local_298 >> 0x18);
          local_2a8[4] = (undefined1)((ulong)local_298 >> 0x20);
          local_2a8[5] = (undefined1)((ulong)local_298 >> 0x28);
          local_2a8[6] = (undefined1)((ulong)local_298 >> 0x30);
          local_2a8[7] = (undefined1)((ulong)local_298 >> 0x38);
          local_2a8[8] = '\0';
          local_2a8[9] = '\0';
          local_2a8[10] = '\0';
          local_2a8[0xb] = '\0';
          local_2a8[0xc] = '\0';
          local_2a8[0xd] = '\0';
          local_2a8[0xe] = '\0';
          local_2a8[0xf] = '\0';
          local_298[0] = '\0';
          local_250._0_4_ = _S_red;
          local_250._8_8_ = (pointer)0x0;
          aStack_270._8_8_ = (pointer)0x0;
          pVStack_260 = (pointer)0x0;
          local_278 = (pointer)0x0;
          aStack_270._M_allocated_capacity = 0;
          local_288 = (pointer)0x0;
          _Stack_280._M_p = (pointer)0x0;
          local_250._16_8_ = local_250;
          local_250._32_8_ = 0;
          local_378._0_8_ = psVar41;
          local_250._24_8_ = local_250._16_8_;
          SerializeValue((string *)local_378,(Value *)local_2b8,&local_2c8);
          Value::~Value((Value *)local_2b8);
          if ((string *)local_378._0_8_ != psVar41) {
            operator_delete((void *)local_378._0_8_);
          }
        }
        local_2b8._8_8_ = (string *)0x0;
        local_2a8[0] = '\0';
        iVar22 = pAVar1->type;
        if (iVar22 < 0x22) {
          if (iVar22 == 2) {
            pcVar31 = "VEC2";
          }
          else if (iVar22 == 3) {
            pcVar31 = "VEC3";
          }
          else {
            local_2b8._0_8_ = (string *)local_2a8;
            if (iVar22 != 4) goto LAB_0011e6f1;
            pcVar31 = "VEC4";
          }
LAB_0011e6dd:
          local_2b8._0_8_ = (string *)local_2a8;
          std::__cxx11::string::_M_replace((ulong)local_2b8,0,(char *)0x0,(ulong)pcVar31);
        }
        else {
          if (0x23 < iVar22) {
            if (iVar22 == 0x24) {
              pcVar31 = "MAT4";
            }
            else {
              local_2b8._0_8_ = (string *)local_2a8;
              if (iVar22 != 0x41) goto LAB_0011e6f1;
              pcVar31 = "SCALAR";
            }
            goto LAB_0011e6dd;
          }
          if (iVar22 == 0x22) {
            pcVar31 = "MAT2";
            goto LAB_0011e6dd;
          }
          local_2b8._0_8_ = (string *)local_2a8;
          if (iVar22 == 0x23) {
            pcVar31 = "MAT3";
            goto LAB_0011e6dd;
          }
        }
LAB_0011e6f1:
        local_378[0x10] = 't';
        local_378[0x11] = 'y';
        local_378[0x12] = 'p';
        local_378[0x13] = 'e';
        local_378._8_8_ = (int *)0x4;
        local_378[0x14] = '\0';
        local_378._0_8_ = psVar41;
        SerializeStringProperty(psVar41,(string *)local_2b8._0_8_,&local_2c8);
        if ((string *)local_378._0_8_ != psVar41) {
          operator_delete((void *)local_378._0_8_);
        }
        if ((pAVar1->name)._M_string_length != 0) {
          local_378[0x10] = 'n';
          local_378[0x11] = 'a';
          local_378[0x12] = 'm';
          local_378[0x13] = 'e';
          local_378._8_8_ = (int *)0x4;
          local_378[0x14] = '\0';
          local_378._0_8_ = psVar41;
          SerializeStringProperty(psVar41,(string *)(pAVar1->name)._M_dataplus._M_p,&local_2c8);
          if ((string *)local_378._0_8_ != psVar41) {
            operator_delete((void *)local_378._0_8_);
          }
        }
        SerializeExtensionMap(&pAVar1->extensions,&local_2c8);
        SerializeExtras(&pAVar1->extras,&local_2c8);
        if ((pAVar1->sparse).isSparse == true) {
          local_348._0_8_ = local_348._0_8_ & 0xffffffffffffff00;
          local_348._8_8_ = (string *)0x0;
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)local_348,true);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)local_348,true);
          local_378[0x14] = 't';
          local_378[0x10] = 'c';
          local_378[0x11] = 'o';
          local_378[0x12] = 'u';
          local_378[0x13] = 'n';
          local_378._8_8_ = (pointer)0x5;
          local_378[0x15] = '\0';
          local_378._0_8_ = psVar41;
          SerializeNumberProperty<int>
                    (psVar41,(pAVar1->sparse).count,
                     (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)local_348);
          if ((string *)local_378._0_8_ != psVar41) {
            operator_delete((void *)local_378._0_8_);
          }
          local_328._M_allocated_capacity = local_328._M_allocated_capacity & 0xffffffffffffff00;
          local_328._8_8_ = 0;
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)&local_328,true);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)&local_328,true);
          local_378[0x10] = 'b';
          local_378[0x11] = 'u';
          local_378[0x12] = 'f';
          local_378[0x13] = 'f';
          local_378[0x14] = 'e';
          local_378[0x15] = 'r';
          local_378[0x16] = 'V';
          local_378[0x17] = 'i';
          local_378[0x18] = 'e';
          local_378[0x19] = 'w';
          local_378._8_8_ = (pointer)0xa;
          local_378[0x1a] = '\0';
          local_378._0_8_ = psVar41;
          SerializeNumberProperty<int>
                    (psVar41,*(int *)((long)&(pAVar1->sparse).indices + 8),(json *)&local_328);
          if ((string *)local_378._0_8_ != psVar41) {
            operator_delete((void *)local_378._0_8_);
          }
          local_378[0x10] = 'b';
          local_378[0x11] = 'y';
          local_378[0x12] = 't';
          local_378[0x13] = 'e';
          local_378[0x14] = 'O';
          local_378[0x15] = 'f';
          local_378[0x16] = 'f';
          local_378[0x17] = 's';
          local_378[0x18] = 'e';
          local_378[0x19] = 't';
          local_378._8_8_ = (pointer)0xa;
          local_378[0x1a] = '\0';
          local_378._0_8_ = psVar41;
          SerializeNumberProperty<unsigned_long>
                    (psVar41,(pAVar1->sparse).indices.byteOffset,(json *)&local_328);
          if ((string *)local_378._0_8_ != psVar41) {
            operator_delete((void *)local_378._0_8_);
          }
          local_378[0x18] = 't';
          local_378[0x19] = 'T';
          local_378[0x1a] = 'y';
          local_378._27_2_ = 0x6570;
          local_378[0x10] = 'c';
          local_378[0x11] = 'o';
          local_378[0x12] = 'm';
          local_378[0x13] = 'p';
          local_378[0x14] = 'o';
          local_378[0x15] = 'n';
          local_378[0x16] = 'e';
          local_378[0x17] = 'n';
          local_378._8_8_ = (pointer)0xd;
          local_378[0x1d] = '\0';
          local_378._0_8_ = psVar41;
          SerializeNumberProperty<int>
                    (psVar41,*(int *)((long)&(pAVar1->sparse).indices + 0xc),(json *)&local_328);
          if ((string *)local_378._0_8_ != psVar41) {
            operator_delete((void *)local_378._0_8_);
          }
          SerializeExtensionMap
                    ((ExtensionMap *)((long)&(pAVar1->sparse).indices + 0xa8),(json *)&local_328);
          SerializeExtras((Value *)((long)&(pAVar1->sparse).indices + 0x10),(json *)&local_328);
          detail::JsonAddMember((json *)local_348,"indices",(json *)&local_328);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         *)&local_328);
          local_328._M_allocated_capacity = local_328._M_allocated_capacity & 0xffffffffffffff00;
          local_328._8_8_ = (string *)0x0;
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)&local_328,true);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)&local_328,true);
          local_378[0x10] = 'b';
          local_378[0x11] = 'u';
          local_378[0x12] = 'f';
          local_378[0x13] = 'f';
          local_378[0x14] = 'e';
          local_378[0x15] = 'r';
          local_378[0x16] = 'V';
          local_378[0x17] = 'i';
          local_378[0x18] = 'e';
          local_378[0x19] = 'w';
          local_378._8_8_ = (pointer)0xa;
          local_378[0x1a] = '\0';
          local_378._0_8_ = psVar41;
          SerializeNumberProperty<int>
                    (psVar41,(pAVar1->sparse).values.bufferView,(json *)&local_328);
          if ((string *)local_378._0_8_ != psVar41) {
            operator_delete((void *)local_378._0_8_);
          }
          local_378[0x10] = 'b';
          local_378[0x11] = 'y';
          local_378[0x12] = 't';
          local_378[0x13] = 'e';
          local_378[0x14] = 'O';
          local_378[0x15] = 'f';
          local_378[0x16] = 'f';
          local_378[0x17] = 's';
          local_378[0x18] = 'e';
          local_378[0x19] = 't';
          local_378._8_8_ = (int *)0xa;
          local_378[0x1a] = '\0';
          local_378._0_8_ = psVar41;
          SerializeNumberProperty<unsigned_long>
                    (psVar41,*(size_t *)((long)&(pAVar1->sparse).values + 8),(json *)&local_328);
          if ((string *)local_378._0_8_ != psVar41) {
            operator_delete((void *)local_378._0_8_);
          }
          SerializeExtensionMap
                    ((ExtensionMap *)((long)&(pAVar1->sparse).values + 0xa8),(json *)&local_328);
          SerializeExtras((Value *)((long)&(pAVar1->sparse).values + 0x10),(json *)&local_328);
          detail::JsonAddMember((json *)local_348,"values",(json *)&local_328);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         *)&local_328);
          SerializeExtensionMap
                    (&(pAVar1->sparse).extensions,
                     (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)local_348);
          SerializeExtras(&(pAVar1->sparse).extras,
                          (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                           *)local_348);
          detail::JsonAddMember
                    (&local_2c8,"sparse",
                     (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)local_348);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         *)local_348);
          model = local_350;
        }
        if ((string *)local_2b8._0_8_ != (string *)local_2a8) {
          operator_delete((void *)local_2b8._0_8_);
        }
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::push_back((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)&local_2f8,&local_2c8);
        pEVar50 = local_2d0;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::~basic_json(&local_2c8);
        pEVar50 = (ExtensionMap *)(ulong)((int)pEVar50 + 1);
        pEVar24 = (ExtensionMap *)
                  (((long)(model->accessors).
                          super__Vector_base<tinygltf::Accessor,_std::allocator<tinygltf::Accessor>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(model->accessors).
                          super__Vector_base<tinygltf::Accessor,_std::allocator<tinygltf::Accessor>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 6) * -0x79435e50d79435e5);
      } while (pEVar50 <= pEVar24 && (long)pEVar24 - (long)pEVar50 != 0);
    }
    detail::JsonAddMember((json *)local_318.field_2._8_8_,"accessors",(json *)&local_2f8);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)&local_2f8);
  }
  if ((model->animations).
      super__Vector_base<tinygltf::Animation,_std::allocator<tinygltf::Animation>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (model->animations).
      super__Vector_base<tinygltf::Animation,_std::allocator<tinygltf::Animation>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_2c8.m_type = null;
    local_2c8.m_value.object = (object_t *)0x0;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::assert_invariant(&local_2c8,true);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::assert_invariant(&local_2c8,true);
    pAVar26 = (model->animations).
              super__Vector_base<tinygltf::Animation,_std::allocator<tinygltf::Animation>_>._M_impl.
              super__Vector_impl_data._M_start;
    pAVar32 = (model->animations).
              super__Vector_base<tinygltf::Animation,_std::allocator<tinygltf::Animation>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (pAVar32 != pAVar26) {
      psVar41 = (string *)(local_378 + 0x10);
      local_2d0 = (ExtensionMap *)(local_250 + 0x58);
      uVar25 = 0;
      do {
        if (pAVar26[uVar25].channels.
            super__Vector_base<tinygltf::AnimationChannel,_std::allocator<tinygltf::AnimationChannel>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            pAVar26[uVar25].channels.
            super__Vector_base<tinygltf::AnimationChannel,_std::allocator<tinygltf::AnimationChannel>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          local_2e0.m_type = null;
          local_2e0.m_value.object = (object_t *)0x0;
          local_68 = uVar25;
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::assert_invariant(&local_2e0,true);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::assert_invariant(&local_2e0,true);
          pAVar32 = (local_350->animations).
                    super__Vector_base<tinygltf::Animation,_std::allocator<tinygltf::Animation>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pAVar26 = pAVar32 + uVar25;
          if (pAVar32[uVar25].name._M_string_length != 0) {
            local_2a8[0] = 'n';
            local_2a8[1] = 'a';
            local_2a8[2] = 'm';
            local_2a8[3] = 'e';
            local_2b8._8_8_ = (string *)0x4;
            local_2a8[4] = '\0';
            local_2b8._0_8_ = (string *)local_2a8;
            SerializeStringProperty
                      ((string *)local_2a8,(string *)(pAVar26->name)._M_dataplus._M_p,&local_2e0);
            if ((string *)local_2b8._0_8_ != (string *)local_2a8) {
              operator_delete((void *)local_2b8._0_8_);
            }
          }
          local_328._M_allocated_capacity = local_328._M_allocated_capacity & 0xffffffffffffff00;
          local_328._8_8_ = (string *)0x0;
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)&local_328,true);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)&local_328,true);
          if (*(pointer *)
               ((long)&(pAVar26->channels).
                       super__Vector_base<tinygltf::AnimationChannel,_std::allocator<tinygltf::AnimationChannel>_>
                       ._M_impl + 8) !=
              (pAVar26->channels).
              super__Vector_base<tinygltf::AnimationChannel,_std::allocator<tinygltf::AnimationChannel>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            uVar25 = 0;
            uVar34 = 1;
            do {
              local_2f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start._0_1_ =
                   (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)0x0;
              local_2f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                  *)&local_2f8,true);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                  *)&local_2f8,true);
              AnimationChannel::AnimationChannel
                        ((AnimationChannel *)local_2b8,
                         (AnimationChannel *)
                         (uVar25 * 0x238 +
                         *(long *)&(pAVar26->channels).
                                   super__Vector_base<tinygltf::AnimationChannel,_std::allocator<tinygltf::AnimationChannel>_>
                                   ._M_impl.super__Vector_impl_data));
              local_378[0x14] = 'l';
              local_378[0x15] = 'e';
              local_378[0x16] = 'r';
              local_378[0x10] = 's';
              local_378[0x11] = 'a';
              local_378[0x12] = 'm';
              local_378[0x13] = 'p';
              local_378._8_8_ = (pointer)0x7;
              local_378[0x17] = '\0';
              local_378._0_8_ = psVar41;
              SerializeNumberProperty<int>
                        (psVar41,local_2b8._0_4_,
                         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)&local_2f8);
              if ((string *)local_378._0_8_ != psVar41) {
                operator_delete((void *)local_378._0_8_);
              }
              local_348._0_8_ = local_348._0_8_ & 0xffffffffffffff00;
              local_348._8_8_ = (string *)0x0;
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                  *)local_348,true);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                  *)local_348,true);
              if (-1 < (long)local_2b8._0_8_) {
                local_378[0x10] = 'n';
                local_378[0x11] = 'o';
                local_378[0x12] = 'd';
                local_378[0x13] = 'e';
                local_378._8_8_ = (pointer)0x4;
                local_378[0x14] = '\0';
                local_378._0_8_ = psVar41;
                SerializeNumberProperty<int>
                          (psVar41,local_2b8._4_4_,
                           (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            *)local_348);
                if ((string *)local_378._0_8_ != psVar41) {
                  operator_delete((void *)local_378._0_8_);
                }
              }
              local_378[0x10] = 'p';
              local_378[0x11] = 'a';
              local_378[0x12] = 't';
              local_378[0x13] = 'h';
              local_378._8_8_ = (int *)0x4;
              local_378[0x14] = '\0';
              local_378._0_8_ = psVar41;
              SerializeStringProperty
                        (psVar41,(string *)local_2b8._8_8_,
                         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)local_348);
              if ((string *)local_378._0_8_ != psVar41) {
                operator_delete((void *)local_378._0_8_);
              }
              SerializeExtensionMap
                        (local_130,
                         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)local_348);
              SerializeExtras(&local_1c8,
                              (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                               *)local_348);
              detail::JsonAddMember
                        ((json *)&local_2f8,"target",
                         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)local_348);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                             *)local_348);
              SerializeExtensionMap
                        (local_2d0,
                         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)&local_2f8);
              SerializeExtras((Value *)(local_298 + 8),
                              (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                               *)&local_2f8);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::push_back((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                           *)&local_328,
                          (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                           *)&local_2f8);
              AnimationChannel::~AnimationChannel((AnimationChannel *)local_2b8);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                             *)&local_2f8);
              uVar25 = ((long)*(pointer *)
                               ((long)&(pAVar26->channels).
                                       super__Vector_base<tinygltf::AnimationChannel,_std::allocator<tinygltf::AnimationChannel>_>
                                       ._M_impl + 8) -
                        *(long *)&(pAVar26->channels).
                                  super__Vector_base<tinygltf::AnimationChannel,_std::allocator<tinygltf::AnimationChannel>_>
                                  ._M_impl.super__Vector_impl_data >> 3) * 0x193d4bb7e327a977;
              bVar54 = uVar34 <= uVar25;
              lVar49 = uVar25 - uVar34;
              uVar25 = uVar34;
              uVar34 = (ulong)((int)uVar34 + 1);
            } while (bVar54 && lVar49 != 0);
          }
          detail::JsonAddMember(&local_2e0,"channels",(json *)&local_328);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         *)&local_328);
          local_348._0_8_ = local_348._0_8_ & 0xffffffffffffff00;
          local_348._8_8_ = (string *)0x0;
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)local_348,true);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)local_348,true);
          if (*(pointer *)
               ((long)&(pAVar26->samplers).
                       super__Vector_base<tinygltf::AnimationSampler,_std::allocator<tinygltf::AnimationSampler>_>
                       ._M_impl + 8) !=
              (pAVar26->samplers).
              super__Vector_base<tinygltf::AnimationSampler,_std::allocator<tinygltf::AnimationSampler>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            uVar25 = 0;
            uVar34 = 1;
            do {
              local_328._M_allocated_capacity = local_328._M_allocated_capacity & 0xffffffffffffff00
              ;
              local_328._8_8_ = (string *)0x0;
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                  *)&local_328,true);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                  *)&local_328,true);
              AnimationSampler::AnimationSampler
                        ((AnimationSampler *)local_2b8,
                         (AnimationSampler *)
                         (uVar25 * 0x130 +
                         *(long *)&(pAVar26->samplers).
                                   super__Vector_base<tinygltf::AnimationSampler,_std::allocator<tinygltf::AnimationSampler>_>
                                   ._M_impl.super__Vector_impl_data));
              local_378[0x14] = 't';
              local_378[0x10] = 'i';
              local_378[0x11] = 'n';
              local_378[0x12] = 'p';
              local_378[0x13] = 'u';
              local_378._8_8_ = (pointer)0x5;
              local_378[0x15] = '\0';
              local_378._0_8_ = psVar41;
              SerializeNumberProperty<int>(psVar41,local_2b8._0_4_,(json *)&local_328);
              if ((string *)local_378._0_8_ != psVar41) {
                operator_delete((void *)local_378._0_8_);
              }
              local_378[0x14] = 'u';
              local_378[0x15] = 't';
              local_378[0x10] = 'o';
              local_378[0x11] = 'u';
              local_378[0x12] = 't';
              local_378[0x13] = 'p';
              local_378._8_8_ = (pointer)0x6;
              local_378[0x16] = '\0';
              local_378._0_8_ = psVar41;
              SerializeNumberProperty<int>(psVar41,local_2b8._4_4_,(json *)&local_328);
              if ((string *)local_378._0_8_ != psVar41) {
                operator_delete((void *)local_378._0_8_);
              }
              local_378[0x18] = 'a';
              local_378[0x19] = 't';
              local_378[0x1a] = 'i';
              local_378._27_2_ = 0x6e6f;
              local_378[0x10] = 'i';
              local_378[0x11] = 'n';
              local_378[0x12] = 't';
              local_378[0x13] = 'e';
              local_378[0x14] = 'r';
              local_378[0x15] = 'p';
              local_378[0x16] = 'o';
              local_378[0x17] = 'l';
              local_378._8_8_ = (int *)0xd;
              local_378[0x1d] = '\0';
              local_378._0_8_ = psVar41;
              SerializeStringProperty(psVar41,(string *)local_2b8._8_8_,(json *)&local_328);
              if ((string *)local_378._0_8_ != psVar41) {
                operator_delete((void *)local_378._0_8_);
              }
              SerializeExtensionMap(local_2d0,(json *)&local_328);
              SerializeExtras((Value *)(local_298 + 8),(json *)&local_328);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::push_back((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                           *)local_348,
                          (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                           *)&local_328);
              AnimationSampler::~AnimationSampler((AnimationSampler *)local_2b8);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                             *)&local_328);
              uVar25 = ((long)*(pointer *)
                               ((long)&(pAVar26->samplers).
                                       super__Vector_base<tinygltf::AnimationSampler,_std::allocator<tinygltf::AnimationSampler>_>
                                       ._M_impl + 8) -
                        *(long *)&(pAVar26->samplers).
                                  super__Vector_base<tinygltf::AnimationSampler,_std::allocator<tinygltf::AnimationSampler>_>
                                  ._M_impl.super__Vector_impl_data >> 4) * -0x79435e50d79435e5;
              bVar54 = uVar34 <= uVar25;
              lVar49 = uVar25 - uVar34;
              uVar25 = uVar34;
              uVar34 = (ulong)((int)uVar34 + 1);
            } while (bVar54 && lVar49 != 0);
          }
          detail::JsonAddMember
                    (&local_2e0,"samplers",
                     (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)local_348);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         *)local_348);
          SerializeExtensionMap(&pAVar26->extensions,&local_2e0);
          SerializeExtras(&pAVar26->extras,&local_2e0);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::push_back(&local_2c8,&local_2e0);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::~basic_json(&local_2e0);
          pAVar26 = (local_350->animations).
                    super__Vector_base<tinygltf::Animation,_std::allocator<tinygltf::Animation>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pAVar32 = (local_350->animations).
                    super__Vector_base<tinygltf::Animation,_std::allocator<tinygltf::Animation>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          uVar25 = local_68;
        }
        uVar25 = (ulong)((int)uVar25 + 1);
        uVar34 = ((long)pAVar32 - (long)pAVar26 >> 3) * -0x7d05f417d05f417d;
      } while (uVar25 <= uVar34 && uVar34 - uVar25 != 0);
    }
    detail::JsonAddMember((json *)local_318.field_2._8_8_,"animations",&local_2c8);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json(&local_2c8);
    model = local_350;
  }
  local_2c8.m_type = null;
  local_2c8.m_value.object = (object_t *)0x0;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::assert_invariant(&local_2c8,true);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::assert_invariant(&local_2c8,true);
  if ((model->asset).generator._M_string_length != 0) {
    local_2a8[0] = 'g';
    local_2a8[1] = 'e';
    local_2a8[2] = 'n';
    local_2a8[3] = 'e';
    local_2a8[4] = 'r';
    local_2a8[5] = 'a';
    local_2a8[6] = 't';
    local_2a8[7] = 'o';
    local_2a8[8] = 'r';
    local_2a8[9] = '\0';
    local_2b8._8_8_ = (string *)0x9;
    local_2b8._0_8_ = (string *)local_2a8;
    SerializeStringProperty
              ((string *)local_2a8,(string *)(model->asset).generator._M_dataplus._M_p,&local_2c8);
    if ((string *)local_2b8._0_8_ != (string *)local_2a8) {
      operator_delete((void *)local_2b8._0_8_);
    }
  }
  if ((model->asset).copyright._M_string_length != 0) {
    local_2a8[0] = 'c';
    local_2a8[1] = 'o';
    local_2a8[2] = 'p';
    local_2a8[3] = 'y';
    local_2a8[4] = 'r';
    local_2a8[5] = 'i';
    local_2a8[6] = 'g';
    local_2a8[7] = 'h';
    local_2a8[8] = 't';
    local_2a8[9] = '\0';
    local_2b8._8_8_ = (string *)0x9;
    local_2b8._0_8_ = (string *)local_2a8;
    SerializeStringProperty
              ((string *)local_2a8,(string *)(model->asset).copyright._M_dataplus._M_p,&local_2c8);
    if ((string *)local_2b8._0_8_ != (string *)local_2a8) {
      operator_delete((void *)local_2b8._0_8_);
    }
  }
  local_2b8._0_8_ = local_2a8;
  pcVar11 = (model->asset).version._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_2b8,pcVar11,pcVar11 + (model->asset).version._M_string_length);
  if ((string *)local_2b8._8_8_ == (string *)0x0) {
    std::__cxx11::string::_M_replace((ulong)local_2b8,0,(char *)0x0,0x162037);
  }
  psVar41 = (string *)(local_378 + 0x10);
  local_378[0x10] = 'v';
  local_378[0x11] = 'e';
  local_378[0x12] = 'r';
  local_378[0x13] = 's';
  local_378[0x14] = 'i';
  local_378[0x15] = 'o';
  local_378[0x16] = 'n';
  local_378._8_8_ = (pointer)0x7;
  local_378[0x17] = '\0';
  local_378._0_8_ = psVar41;
  SerializeStringProperty(psVar41,(string *)local_2b8._0_8_,&local_2c8);
  if ((string *)local_378._0_8_ != psVar41) {
    operator_delete((void *)local_378._0_8_);
  }
  SerializeExtensionMap(&(model->asset).extensions,&local_2c8);
  SerializeExtras(&(model->asset).extras,&local_2c8);
  if ((string *)local_2b8._0_8_ != (string *)local_2a8) {
    operator_delete((void *)local_2b8._0_8_);
  }
  detail::JsonAddMember((json *)local_318.field_2._8_8_,"asset",&local_2c8);
  if ((model->bufferViews).
      super__Vector_base<tinygltf::BufferView,_std::allocator<tinygltf::BufferView>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (model->bufferViews).
      super__Vector_base<tinygltf::BufferView,_std::allocator<tinygltf::BufferView>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_378._0_8_ = local_378._0_8_ & 0xffffffffffffff00;
    local_378._8_8_ = (object_t *)0x0;
    uVar40 = 1;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)local_378,true);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)local_378,true);
    if ((model->bufferViews).
        super__Vector_base<tinygltf::BufferView,_std::allocator<tinygltf::BufferView>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (model->bufferViews).
        super__Vector_base<tinygltf::BufferView,_std::allocator<tinygltf::BufferView>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar25 = 0;
      do {
        local_348._0_8_ = local_348._0_8_ & 0xffffffffffffff00;
        local_348._8_8_ = (string *)0x0;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            *)local_348,true);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            *)local_348,true);
        pBVar52 = (model->bufferViews).
                  super__Vector_base<tinygltf::BufferView,_std::allocator<tinygltf::BufferView>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        local_2a8[4] = 'e';
        local_2a8[5] = 'r';
        local_2a8[0] = 'b';
        local_2a8[1] = 'u';
        local_2a8[2] = 'f';
        local_2a8[3] = 'f';
        local_2b8._8_8_ = (pointer)0x6;
        local_2a8[6] = '\0';
        local_2b8._0_8_ = (string *)local_2a8;
        SerializeNumberProperty<int>
                  ((string *)local_2a8,pBVar52[uVar25].buffer,
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)local_348);
        if ((string *)local_2b8._0_8_ != (string *)local_2a8) {
          operator_delete((void *)local_2b8._0_8_);
        }
        pBVar52 = pBVar52 + uVar25;
        local_2a8[0] = 'b';
        local_2a8[1] = 'y';
        local_2a8[2] = 't';
        local_2a8[3] = 'e';
        local_2a8[4] = 'L';
        local_2a8[5] = 'e';
        local_2a8[6] = 'n';
        local_2a8[7] = 'g';
        local_2a8[8] = 't';
        local_2a8[9] = 'h';
        local_2b8._8_8_ = (string *)0xa;
        local_2a8[10] = '\0';
        local_2b8._0_8_ = (string *)local_2a8;
        SerializeNumberProperty<unsigned_long>
                  ((string *)local_2a8,pBVar52->byteLength,
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)local_348);
        if ((string *)local_2b8._0_8_ != (string *)local_2a8) {
          operator_delete((void *)local_2b8._0_8_);
        }
        if (3 < pBVar52->byteStride) {
          local_2a8[0] = 'b';
          local_2a8[1] = 'y';
          local_2a8[2] = 't';
          local_2a8[3] = 'e';
          local_2a8[4] = 'S';
          local_2a8[5] = 't';
          local_2a8[6] = 'r';
          local_2a8[7] = 'i';
          local_2a8[8] = 'd';
          local_2a8[9] = 'e';
          local_2b8._8_8_ = (string *)0xa;
          local_2a8[10] = '\0';
          local_2b8._0_8_ = (string *)local_2a8;
          SerializeNumberProperty<unsigned_long>
                    ((string *)local_2a8,pBVar52->byteStride,
                     (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)local_348);
          if ((string *)local_2b8._0_8_ != (string *)local_2a8) {
            operator_delete((void *)local_2b8._0_8_);
          }
        }
        if (pBVar52->byteOffset != 0) {
          local_2a8[0] = 'b';
          local_2a8[1] = 'y';
          local_2a8[2] = 't';
          local_2a8[3] = 'e';
          local_2a8[4] = 'O';
          local_2a8[5] = 'f';
          local_2a8[6] = 'f';
          local_2a8[7] = 's';
          local_2a8[8] = 'e';
          local_2a8[9] = 't';
          local_2b8._8_8_ = (string *)0xa;
          local_2a8[10] = '\0';
          local_2b8._0_8_ = (string *)local_2a8;
          SerializeNumberProperty<unsigned_long>
                    ((string *)local_2a8,pBVar52->byteOffset,
                     (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)local_348);
          if ((string *)local_2b8._0_8_ != (string *)local_2a8) {
            operator_delete((void *)local_2b8._0_8_);
          }
        }
        if ((pBVar52->target & 0xfffffffeU) == 0x8892) {
          local_2a8[4] = 'e';
          local_2a8[5] = 't';
          local_2a8[0] = 't';
          local_2a8[1] = 'a';
          local_2a8[2] = 'r';
          local_2a8[3] = 'g';
          local_2b8._8_8_ = (string *)0x6;
          local_2a8[6] = '\0';
          local_2b8._0_8_ = (string *)local_2a8;
          SerializeNumberProperty<int>
                    ((string *)local_2a8,pBVar52->target,
                     (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)local_348);
          if ((string *)local_2b8._0_8_ != (string *)local_2a8) {
            operator_delete((void *)local_2b8._0_8_);
          }
        }
        if ((pBVar52->name)._M_string_length != 0) {
          local_2a8[0] = 'n';
          local_2a8[1] = 'a';
          local_2a8[2] = 'm';
          local_2a8[3] = 'e';
          local_2b8._8_8_ = (string *)0x4;
          local_2a8[4] = '\0';
          local_2b8._0_8_ = (string *)local_2a8;
          SerializeStringProperty
                    ((string *)local_2a8,(string *)(pBVar52->name)._M_dataplus._M_p,
                     (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)local_348);
          if ((string *)local_2b8._0_8_ != (string *)local_2a8) {
            operator_delete((void *)local_2b8._0_8_);
          }
        }
        SerializeExtensionMap
                  (&pBVar52->extensions,
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)local_348);
        SerializeExtras(&pBVar52->extras,
                        (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         *)local_348);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::push_back((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)local_378,
                    (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)local_348);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                       *)local_348);
        uVar25 = (ulong)uVar40;
        uVar34 = ((long)(local_350->bufferViews).
                        super__Vector_base<tinygltf::BufferView,_std::allocator<tinygltf::BufferView>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(local_350->bufferViews).
                        super__Vector_base<tinygltf::BufferView,_std::allocator<tinygltf::BufferView>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x7d05f417d05f417d;
        uVar40 = uVar40 + 1;
        model = local_350;
      } while (uVar25 <= uVar34 && uVar34 - uVar25 != 0);
    }
    detail::JsonAddMember((json *)local_318.field_2._8_8_,"bufferViews",(json *)local_378);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)local_378);
    model = local_350;
  }
  if ((model->extensionsRequired).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (model->extensionsRequired).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_2b8._0_8_ = local_2a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"extensionsRequired","");
    SerializeStringArrayProperty
              ((string *)local_2b8,&model->extensionsRequired,(json *)local_318.field_2._8_8_);
    if ((string *)local_2b8._0_8_ != (string *)local_2a8) {
      operator_delete((void *)local_2b8._0_8_);
    }
  }
  if ((model->materials).super__Vector_base<tinygltf::Material,_std::allocator<tinygltf::Material>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (model->materials).super__Vector_base<tinygltf::Material,_std::allocator<tinygltf::Material>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_2e0.m_type = null;
    local_2e0.m_value.object = (object_t *)0x0;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::assert_invariant(&local_2e0,true);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::assert_invariant(&local_2e0,true);
    if ((model->materials).
        super__Vector_base<tinygltf::Material,_std::allocator<tinygltf::Material>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (model->materials).
        super__Vector_base<tinygltf::Material,_std::allocator<tinygltf::Material>_>._M_impl.
        super__Vector_impl_data._M_start) {
      pEVar50 = (ExtensionMap *)0x0;
      do {
        local_78.m_type = null;
        local_78.m_value.object = (object_t *)0x0;
        local_2d0 = pEVar50;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::assert_invariant(&local_78,true);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::assert_invariant(&local_78,true);
        pMVar12 = (model->materials).
                  super__Vector_base<tinygltf::Material,_std::allocator<tinygltf::Material>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pMVar44 = pMVar12 + (long)pEVar50;
        if (pMVar12[(long)pEVar50].name._M_string_length != 0) {
          local_2a8[0] = 'n';
          local_2a8[1] = 'a';
          local_2a8[2] = 'm';
          local_2a8[3] = 'e';
          local_2b8._8_8_ = (string *)0x4;
          local_2a8[4] = '\0';
          local_2b8._0_8_ = (string *)local_2a8;
          SerializeStringProperty
                    ((string *)local_2a8,(string *)(pMVar44->name)._M_dataplus._M_p,&local_78);
          if ((string *)local_2b8._0_8_ != (string *)local_2a8) {
            operator_delete((void *)local_2b8._0_8_);
          }
        }
        if (1e-12 <= ABS(0.5 - pMVar44->alphaCutoff)) {
          local_2a8[0] = 'a';
          local_2a8[1] = 'l';
          local_2a8[2] = 'p';
          local_2a8[3] = 'h';
          local_2a8[4] = 'a';
          local_2a8[5] = 'C';
          local_2a8[6] = 'u';
          local_2a8[7] = 't';
          local_2a8[8] = 'o';
          local_2a8[9] = 'f';
          local_2a8[10] = 'f';
          local_2b8._8_8_ = (string *)0xb;
          local_2a8[0xb] = '\0';
          local_2b8._0_8_ = (string *)local_2a8;
          SerializeNumberProperty<double>((string *)local_2a8,pMVar44->alphaCutoff,&local_78);
          if ((string *)local_2b8._0_8_ != (string *)local_2a8) {
            operator_delete((void *)local_2b8._0_8_);
          }
        }
        iVar22 = std::__cxx11::string::compare((char *)&pMVar44->alphaMode);
        if (iVar22 != 0) {
          local_2a8[0] = 'a';
          local_2a8[1] = 'l';
          local_2a8[2] = 'p';
          local_2a8[3] = 'h';
          local_2a8[4] = 'a';
          local_2a8[5] = 'M';
          local_2a8[6] = 'o';
          local_2a8[7] = 'd';
          local_2a8[8] = 'e';
          local_2b8._8_8_ = (string *)0x9;
          local_2a8[9] = '\0';
          local_2b8._0_8_ = (string *)local_2a8;
          SerializeStringProperty
                    ((string *)local_2a8,(string *)(pMVar44->alphaMode)._M_dataplus._M_p,&local_78);
          if ((string *)local_2b8._0_8_ != (string *)local_2a8) {
            operator_delete((void *)local_2b8._0_8_);
          }
        }
        if (pMVar44->doubleSided == true) {
          local_2b8._0_8_ = local_2b8._0_8_ & 0xffffffffffffff00;
          local_2b8._8_8_ = (string *)0x0;
          nlohmann::detail::external_constructor<(nlohmann::detail::value_t)4>::
          construct<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)local_2b8,true);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)local_2b8,true);
          detail::JsonAddMember(&local_78,"doubleSided",(json *)local_2b8);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         *)local_2b8);
        }
        if (-1 < (pMVar44->normalTexture).index) {
          local_378._0_8_ = local_378._0_8_ & 0xffffffffffffff00;
          local_378._8_8_ = (object_t *)0x0;
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)local_378,true);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)local_378,true);
          local_2a8[4] = 'x';
          local_2a8[0] = 'i';
          local_2a8[1] = 'n';
          local_2a8[2] = 'd';
          local_2a8[3] = 'e';
          local_2b8._8_8_ = (string *)0x5;
          local_2a8[5] = '\0';
          local_2b8._0_8_ = (string *)local_2a8;
          SerializeNumberProperty<int>
                    ((string *)local_2a8,(pMVar44->normalTexture).index,(json *)local_378);
          if ((string *)local_2b8._0_8_ != (string *)local_2a8) {
            operator_delete((void *)local_2b8._0_8_);
          }
          iVar22 = (pMVar44->normalTexture).texCoord;
          if (iVar22 != 0) {
            local_2a8[0] = 't';
            local_2a8[1] = 'e';
            local_2a8[2] = 'x';
            local_2a8[3] = 'C';
            local_2a8[4] = 'o';
            local_2a8[5] = 'o';
            local_2a8[6] = 'r';
            local_2a8[7] = 'd';
            local_2b8._8_8_ = (string *)0x8;
            local_2a8[8] = '\0';
            local_2b8._0_8_ = (string *)local_2a8;
            SerializeNumberProperty<int>((string *)local_2a8,iVar22,(json *)local_378);
            if ((string *)local_2b8._0_8_ != (string *)local_2a8) {
              operator_delete((void *)local_2b8._0_8_);
            }
          }
          dVar7 = (pMVar44->normalTexture).scale;
          if (1e-12 <= ABS(1.0 - dVar7)) {
            local_2a8[4] = 'e';
            local_2a8[0] = 's';
            local_2a8[1] = 'c';
            local_2a8[2] = 'a';
            local_2a8[3] = 'l';
            local_2b8._8_8_ = (string *)0x5;
            local_2a8[5] = '\0';
            local_2b8._0_8_ = (string *)local_2a8;
            SerializeNumberProperty<double>((string *)local_2a8,dVar7,(json *)local_378);
            if ((string *)local_2b8._0_8_ != (string *)local_2a8) {
              operator_delete((void *)local_2b8._0_8_);
            }
          }
          SerializeExtensionMap(&(pMVar44->normalTexture).extensions,(json *)local_378);
          SerializeExtras(&(pMVar44->normalTexture).extras,(json *)local_378);
          detail::JsonAddMember(&local_78,"normalTexture",(json *)local_378);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         *)local_378);
        }
        if (-1 < (pMVar44->occlusionTexture).index) {
          local_378._0_8_ = local_378._0_8_ & 0xffffffffffffff00;
          local_378._8_8_ = (object_t *)0x0;
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)local_378,true);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)local_378,true);
          local_2a8[4] = 'x';
          local_2a8[0] = 'i';
          local_2a8[1] = 'n';
          local_2a8[2] = 'd';
          local_2a8[3] = 'e';
          local_2b8._8_8_ = (pointer)0x5;
          local_2a8[5] = '\0';
          local_2b8._0_8_ = (string *)local_2a8;
          SerializeNumberProperty<int>
                    ((string *)local_2a8,(pMVar44->occlusionTexture).index,(json *)local_378);
          if ((string *)local_2b8._0_8_ != (string *)local_2a8) {
            operator_delete((void *)local_2b8._0_8_);
          }
          iVar22 = (pMVar44->occlusionTexture).texCoord;
          if (iVar22 != 0) {
            local_2a8[0] = 't';
            local_2a8[1] = 'e';
            local_2a8[2] = 'x';
            local_2a8[3] = 'C';
            local_2a8[4] = 'o';
            local_2a8[5] = 'o';
            local_2a8[6] = 'r';
            local_2a8[7] = 'd';
            local_2b8._8_8_ = (pointer)0x8;
            local_2a8[8] = '\0';
            local_2b8._0_8_ = (string *)local_2a8;
            SerializeNumberProperty<int>((string *)local_2a8,iVar22,(json *)local_378);
            if ((string *)local_2b8._0_8_ != (string *)local_2a8) {
              operator_delete((void *)local_2b8._0_8_);
            }
          }
          dVar7 = (pMVar44->occlusionTexture).strength;
          if (1e-12 <= ABS(1.0 - dVar7)) {
            local_2a8[0] = 's';
            local_2a8[1] = 't';
            local_2a8[2] = 'r';
            local_2a8[3] = 'e';
            local_2a8[4] = 'n';
            local_2a8[5] = 'g';
            local_2a8[6] = 't';
            local_2a8[7] = 'h';
            local_2b8._8_8_ = (pointer)0x8;
            local_2a8[8] = '\0';
            local_2b8._0_8_ = (string *)local_2a8;
            SerializeNumberProperty<double>((string *)local_2a8,dVar7,(json *)local_378);
            if ((string *)local_2b8._0_8_ != (string *)local_2a8) {
              operator_delete((void *)local_2b8._0_8_);
            }
          }
          SerializeExtensionMap(&(pMVar44->occlusionTexture).extensions,(json *)local_378);
          SerializeExtras(&(pMVar44->occlusionTexture).extras,(json *)local_378);
          detail::JsonAddMember(&local_78,"occlusionTexture",(json *)local_378);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         *)local_378);
        }
        if (-1 < (pMVar44->emissiveTexture).index) {
          local_2b8._0_8_ = local_2b8._0_8_ & 0xffffffffffffff00;
          local_2b8._8_8_ = (object_t *)0x0;
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)local_2b8,true);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)local_2b8,true);
          SerializeGltfTextureInfo(&pMVar44->emissiveTexture,(json *)local_2b8);
          detail::JsonAddMember(&local_78,"emissiveTexture",(json *)local_2b8);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         *)local_2b8);
        }
        local_2b8._0_8_ = (pointer)0x0;
        local_2b8._8_8_ = (object_t *)0x0;
        local_2a8[0] = '\0';
        local_2a8[1] = '\0';
        local_2a8[2] = '\0';
        local_2a8[3] = '\0';
        local_2a8[4] = '\0';
        local_2a8[5] = '\0';
        local_2a8[6] = '\0';
        local_2a8[7] = '\0';
        __l._M_len = 3;
        __l._M_array = (iterator)local_2b8;
        std::vector<double,_std::allocator<double>_>::vector
                  (&local_2f8,__l,(allocator_type *)local_378);
        lVar49 = *(long *)&(pMVar44->emissiveFactor).
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data;
        uVar25 = (long)*(pointer *)
                        ((long)&(pMVar44->emissiveFactor).
                                super__Vector_base<double,_std::allocator<double>_>._M_impl + 8) -
                 lVar49;
        if (uVar25 == (long)local_2f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      CONCAT71(local_2f8.super__Vector_base<double,_std::allocator<double>_>._M_impl
                               .super__Vector_impl_data._M_start._1_7_,
                               local_2f8.super__Vector_base<double,_std::allocator<double>_>._M_impl
                               .super__Vector_impl_data._M_start._0_1_)) {
          uVar40 = (uint)(uVar25 >> 3);
          if (0 < (int)uVar40) {
            uVar25 = 0;
            do {
              if (1e-12 <= ABS(*(double *)
                                (CONCAT71(local_2f8.
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_start._1_7_,
                                          local_2f8.
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_start._0_1_) +
                                uVar25 * 8) - *(double *)(lVar49 + uVar25 * 8))) goto LAB_0011fce8;
              uVar25 = uVar25 + 1;
            } while ((uVar40 & 0x7fffffff) != uVar25);
          }
        }
        else {
LAB_0011fce8:
          local_2a8[8] = 'F';
          local_2a8[9] = 'a';
          local_2a8[10] = 'c';
          local_2a8[0xb] = 't';
          local_2a8[0xc] = 'o';
          local_2a8[0xd] = 'r';
          local_2a8[0] = 'e';
          local_2a8[1] = 'm';
          local_2a8[2] = 'i';
          local_2a8[3] = 's';
          local_2a8[4] = 's';
          local_2a8[5] = 'i';
          local_2a8[6] = 'v';
          local_2a8[7] = 'e';
          local_2b8._8_8_ = (pointer)0xe;
          local_2a8[0xe] = '\0';
          local_2b8._0_8_ = local_2a8;
          SerializeNumberArrayProperty<double>
                    ((string *)local_2b8,&pMVar44->emissiveFactor,&local_78);
          if ((undefined1 *)local_2b8._0_8_ != local_2a8) {
            operator_delete((void *)local_2b8._0_8_);
          }
        }
        local_348._0_8_ = local_348._0_8_ & 0xffffffffffffff00;
        local_348._8_8_ = (string *)0x0;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            *)local_348,true);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            *)local_348,true);
        local_2a8[0] = '\0';
        local_2a8[1] = '\0';
        local_2a8[2] = '\0';
        local_2a8[3] = '\0';
        local_2a8[4] = '\0';
        local_2a8[5] = '\0';
        local_2a8[6] = -0x10;
        local_2a8[7] = '?';
        local_2a8[8] = '\0';
        local_2a8[9] = '\0';
        local_2a8[10] = '\0';
        local_2a8[0xb] = '\0';
        local_2a8[0xc] = '\0';
        local_2a8[0xd] = '\0';
        local_2a8[0xe] = -0x10;
        local_2a8[0xf] = '?';
        local_2b8._0_8_ = (string *)0x3ff0000000000000;
        local_2b8._8_8_ = (string *)0x3ff0000000000000;
        __l_00._M_len = 4;
        __l_00._M_array = (iterator)local_2b8;
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)local_378,__l_00,
                   (allocator_type *)local_328._M_local_buf);
        lVar49 = *(long *)&(pMVar44->pbrMetallicRoughness).baseColorFactor.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl;
        uVar25 = (long)*(pointer *)
                        ((long)&(pMVar44->pbrMetallicRoughness).baseColorFactor.
                                super__Vector_base<double,_std::allocator<double>_> + 8) - lVar49;
        if (uVar25 == local_378._8_8_ - local_378._0_8_) {
          uVar40 = (uint)(uVar25 >> 3);
          if (0 < (int)uVar40) {
            uVar25 = 0;
            do {
              if (1e-12 <= ABS(*(double *)(local_378._0_8_ + uVar25 * 8) -
                               *(double *)(lVar49 + uVar25 * 8))) goto LAB_0011fe11;
              uVar25 = uVar25 + 1;
            } while ((uVar40 & 0x7fffffff) != uVar25);
          }
        }
        else {
LAB_0011fe11:
          local_2a8[8] = 'r';
          local_2a8[9] = 'F';
          local_2a8[10] = 'a';
          local_2a8[0xb] = 'c';
          local_2a8[0xc] = 't';
          local_2a8[0xd] = 'o';
          local_2a8[0xe] = 'r';
          local_2a8[0] = 'b';
          local_2a8[1] = 'a';
          local_2a8[2] = 's';
          local_2a8[3] = 'e';
          local_2a8[4] = 'C';
          local_2a8[5] = 'o';
          local_2a8[6] = 'l';
          local_2a8[7] = 'o';
          local_2b8._8_8_ = (string *)0xf;
          local_2a8[0xf] = '\0';
          local_2b8._0_8_ = (string *)local_2a8;
          SerializeNumberArrayProperty<double>
                    ((string *)local_2b8,&(pMVar44->pbrMetallicRoughness).baseColorFactor,
                     (json *)local_348);
          if ((string *)local_2b8._0_8_ != (string *)local_2a8) {
            operator_delete((void *)local_2b8._0_8_);
          }
        }
        dVar7 = (pMVar44->pbrMetallicRoughness).metallicFactor;
        if (1e-12 <= ABS(1.0 - dVar7)) {
          local_2a8[8] = 'F';
          local_2a8[9] = 'a';
          local_2a8[10] = 'c';
          local_2a8[0xb] = 't';
          local_2a8[0xc] = 'o';
          local_2a8[0xd] = 'r';
          local_2a8[0] = 'm';
          local_2a8[1] = 'e';
          local_2a8[2] = 't';
          local_2a8[3] = 'a';
          local_2a8[4] = 'l';
          local_2a8[5] = 'l';
          local_2a8[6] = 'i';
          local_2a8[7] = 'c';
          local_2b8._8_8_ = (string *)0xe;
          local_2a8[0xe] = '\0';
          local_2b8._0_8_ = (string *)local_2a8;
          SerializeNumberProperty<double>((string *)local_2a8,dVar7,(json *)local_348);
          if ((string *)local_2b8._0_8_ != (string *)local_2a8) {
            operator_delete((void *)local_2b8._0_8_);
          }
        }
        dVar7 = (pMVar44->pbrMetallicRoughness).roughnessFactor;
        if (1e-12 <= ABS(1.0 - dVar7)) {
          local_2a8[8] = 's';
          local_2a8[9] = 'F';
          local_2a8[10] = 'a';
          local_2a8[0xb] = 'c';
          local_2a8[0xc] = 't';
          local_2a8[0xd] = 'o';
          local_2a8[0xe] = 'r';
          local_2a8[0] = 'r';
          local_2a8[1] = 'o';
          local_2a8[2] = 'u';
          local_2a8[3] = 'g';
          local_2a8[4] = 'h';
          local_2a8[5] = 'n';
          local_2a8[6] = 'e';
          local_2a8[7] = 's';
          local_2b8._8_8_ = (string *)0xf;
          local_2a8[0xf] = '\0';
          local_2b8._0_8_ = (string *)local_2a8;
          SerializeNumberProperty<double>((string *)local_2a8,dVar7,(json *)local_348);
          if ((string *)local_2b8._0_8_ != (string *)local_2a8) {
            operator_delete((void *)local_2b8._0_8_);
          }
        }
        if (-1 < (pMVar44->pbrMetallicRoughness).baseColorTexture.index) {
          local_2b8._0_8_ = local_2b8._0_8_ & 0xffffffffffffff00;
          local_2b8._8_8_ = (string *)0x0;
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)local_2b8,true);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)local_2b8,true);
          SerializeGltfTextureInfo
                    (&(pMVar44->pbrMetallicRoughness).baseColorTexture,(json *)local_2b8);
          detail::JsonAddMember((json *)local_348,"baseColorTexture",(json *)local_2b8);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         *)local_2b8);
        }
        if (-1 < (pMVar44->pbrMetallicRoughness).metallicRoughnessTexture.index) {
          local_2b8._0_8_ = local_2b8._0_8_ & 0xffffffffffffff00;
          local_2b8._8_8_ = (string *)0x0;
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)local_2b8,true);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)local_2b8,true);
          SerializeGltfTextureInfo
                    (&(pMVar44->pbrMetallicRoughness).metallicRoughnessTexture,(json *)local_2b8);
          detail::JsonAddMember((json *)local_348,"metallicRoughnessTexture",(json *)local_2b8);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         *)local_2b8);
        }
        SerializeExtensionMap(&(pMVar44->pbrMetallicRoughness).extensions,(json *)local_348);
        SerializeExtras(&(pMVar44->pbrMetallicRoughness).extras,(json *)local_348);
        if ((string *)local_378._0_8_ != (string *)0x0) {
          operator_delete((void *)local_378._0_8_);
        }
        if (local_348[0] != null) {
          detail::JsonAddMember(&local_78,"pbrMetallicRoughness",(json *)local_348);
        }
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                       *)local_348);
        SerializeExtensionMap(&pMVar44->extensions,&local_78);
        SerializeExtras(&pMVar44->extras,&local_78);
        if ((pMVar44->lods).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start ==
            *(pointer *)
             ((long)&(pMVar44->lods).super__Vector_base<int,_std::allocator<int>_>._M_impl + 8)) {
          local_348._0_8_ = (string *)0x0;
          local_348._8_8_ = (string *)0x0;
          local_348._16_8_ =
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)0x0;
          local_330.m_it = -0x8000000000000000;
          bVar54 = detail::FindMember(&local_78,"extensions",(json_iterator *)local_348);
          if (bVar54) {
            pbVar27 = nlohmann::detail::
                      iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                   *)local_348);
            local_328._M_allocated_capacity = 0;
            local_328._8_8_ = (string *)0x0;
            local_318._M_dataplus._M_p = (pointer)0x0;
            local_318._M_string_length = 0x8000000000000000;
            bVar54 = detail::FindMember(pbVar27,"MSFT_lod",(json_iterator *)&local_328);
            if (bVar54) {
              local_2b8._0_8_ = local_328._M_allocated_capacity;
              local_2a8[8] = (undefined1)local_318._M_string_length;
              local_2a8[9] = (undefined1)(local_318._M_string_length >> 8);
              local_2a8[10] = (undefined1)(local_318._M_string_length >> 0x10);
              local_2a8[0xb] = (undefined1)(local_318._M_string_length >> 0x18);
              local_2a8[0xc] = (undefined1)(local_318._M_string_length >> 0x20);
              local_2a8[0xd] = (undefined1)(local_318._M_string_length >> 0x28);
              local_2a8[0xe] = (undefined1)(local_318._M_string_length >> 0x30);
              local_2a8[0xf] = (undefined1)(local_318._M_string_length >> 0x38);
              local_2b8._8_8_ = local_328._8_8_;
              local_2a8[0] = SUB81(local_318._M_dataplus._M_p,0);
              local_2a8[1] = (undefined1)((ulong)local_318._M_dataplus._M_p >> 8);
              local_2a8[2] = (undefined1)((ulong)local_318._M_dataplus._M_p >> 0x10);
              local_2a8[3] = (undefined1)((ulong)local_318._M_dataplus._M_p >> 0x18);
              local_2a8[4] = (undefined1)((ulong)local_318._M_dataplus._M_p >> 0x20);
              local_2a8[5] = (undefined1)((ulong)local_318._M_dataplus._M_p >> 0x28);
              local_2a8[6] = (undefined1)((ulong)local_318._M_dataplus._M_p >> 0x30);
              local_2a8[7] = (undefined1)((ulong)local_318._M_dataplus._M_p >> 0x38);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::
              erase<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0>
                        ((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          *)local_378,pbVar27,
                         (iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          *)local_2b8);
            }
            vVar8 = pbVar27->m_type;
            if (vVar8 == null) {
LAB_00120345:
              local_2b8._0_8_ = local_348._0_8_;
              local_2a8[8] = (undefined1)local_330.m_it;
              local_2a8[9] = (undefined1)((ulong)local_330.m_it >> 8);
              local_2a8[10] = (undefined1)((ulong)local_330.m_it >> 0x10);
              local_2a8[0xb] = (undefined1)((ulong)local_330.m_it >> 0x18);
              local_2a8[0xc] = (undefined1)((ulong)local_330.m_it >> 0x20);
              local_2a8[0xd] = (undefined1)((ulong)local_330.m_it >> 0x28);
              local_2a8[0xe] = (undefined1)((ulong)local_330.m_it >> 0x30);
              local_2a8[0xf] = (undefined1)((ulong)local_330.m_it >> 0x38);
              local_2b8._8_8_ = local_348._8_8_;
              local_2a8[0] = (undefined1)local_348._16_8_;
              local_2a8[1] = SUB81(local_348._16_8_,1);
              local_2a8[2] = SUB81(local_348._16_8_,2);
              local_2a8[3] = SUB81(local_348._16_8_,3);
              local_2a8[4] = SUB81(local_348._16_8_,4);
              local_2a8[5] = SUB81(local_348._16_8_,5);
              local_2a8[6] = SUB81(local_348._16_8_,6);
              local_2a8[7] = SUB81(local_348._16_8_,7);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::
              erase<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0>
                        ((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          *)local_378,&local_78,
                         (iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          *)local_2b8);
            }
            else if (vVar8 == array) {
              if ((((pbVar27->m_value).array)->
                  super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start ==
                  (((pbVar27->m_value).array)->
                  super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish) goto LAB_00120345;
            }
            else if ((vVar8 == object) &&
                    ((((pbVar27->m_value).object)->_M_t)._M_impl.super__Rb_tree_header._M_node_count
                     == 0)) goto LAB_00120345;
          }
        }
        else {
          local_2b8._0_8_ = (string *)0x0;
          local_2b8._8_8_ = (string *)0x0;
          local_2a8[0] = '\0';
          local_2a8[1] = '\0';
          local_2a8[2] = '\0';
          local_2a8[3] = '\0';
          local_2a8[4] = '\0';
          local_2a8[5] = '\0';
          local_2a8[6] = '\0';
          local_2a8[7] = '\0';
          local_2a8[8] = '\0';
          local_2a8[9] = '\0';
          local_2a8[10] = '\0';
          local_2a8[0xb] = '\0';
          local_2a8[0xc] = '\0';
          local_2a8[0xd] = '\0';
          local_2a8[0xe] = '\0';
          local_2a8[0xf] = -0x80;
          bVar54 = detail::FindMember(&local_78,"extensions",(json_iterator *)local_2b8);
          if (!bVar54) {
            local_378._0_8_ = local_378._0_8_ & 0xffffffffffffff00;
            local_378._8_8_ = (object_t *)0x0;
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                *)local_378,true);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                *)local_378,true);
            detail::JsonSetObject((json *)local_378);
            detail::JsonAddMember(&local_78,"extensions",(json *)local_378);
            detail::FindMember(&local_78,"extensions",(json_iterator *)local_2b8);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                           *)local_378);
          }
          pbVar27 = nlohmann::detail::
                    iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                 *)local_2b8);
          bVar54 = detail::FindMember(pbVar27,"MSFT_lod",(json_iterator *)local_2b8);
          if (!bVar54) {
            local_378._0_8_ = local_378._0_8_ & 0xffffffffffffff00;
            local_378._8_8_ = (object_t *)0x0;
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                *)local_378,true);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                *)local_378,true);
            detail::JsonSetObject((json *)local_378);
            detail::JsonAddMember(pbVar27,"MSFT_lod",(json *)local_378);
            detail::FindMember(pbVar27,"MSFT_lod",(json_iterator *)local_2b8);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                           *)local_378);
          }
          local_378._0_8_ = local_378 + 0x10;
          local_378[0x12] = 's';
          local_378[0x10] = 'i';
          local_378[0x11] = 'd';
          local_378._8_8_ = (pointer)0x3;
          local_378[0x13] = '\0';
          pbVar27 = nlohmann::detail::
                    iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                 *)local_2b8);
          SerializeNumberArrayProperty<int>((string *)local_378,&pMVar44->lods,pbVar27);
          if ((string *)local_378._0_8_ != (string *)(local_378 + 0x10)) {
            operator_delete((void *)local_378._0_8_);
          }
        }
        if ((void *)CONCAT71(local_2f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start._1_7_,
                             local_2f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start._0_1_) != (void *)0x0) {
          operator_delete((void *)CONCAT71(local_2f8.
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data._M_start._1_7_,
                                           local_2f8.
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data._M_start._0_1_));
        }
        pEVar50 = local_2d0;
        if (local_78.m_type == null) {
          detail::JsonSetObject(&local_78);
        }
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::push_back(&local_2e0,&local_78);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::~basic_json(&local_78);
        pEVar50 = (ExtensionMap *)(ulong)((int)pEVar50 + 1);
        pEVar24 = (ExtensionMap *)
                  (((long)(local_350->materials).
                          super__Vector_base<tinygltf::Material,_std::allocator<tinygltf::Material>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(local_350->materials).
                          super__Vector_base<tinygltf::Material,_std::allocator<tinygltf::Material>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x2a825c935d853211);
        model = local_350;
      } while (pEVar50 <= pEVar24 && (long)pEVar24 - (long)pEVar50 != 0);
    }
    detail::JsonAddMember((json *)local_318.field_2._8_8_,"materials",&local_2e0);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json(&local_2e0);
    model = local_350;
  }
  if ((model->meshes).super__Vector_base<tinygltf::Mesh,_std::allocator<tinygltf::Mesh>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (model->meshes).super__Vector_base<tinygltf::Mesh,_std::allocator<tinygltf::Mesh>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_2e0.m_type = null;
    local_2e0.m_value.object = (object_t *)0x0;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::assert_invariant(&local_2e0,true);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::assert_invariant(&local_2e0,true);
    if ((model->meshes).super__Vector_base<tinygltf::Mesh,_std::allocator<tinygltf::Mesh>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (model->meshes).super__Vector_base<tinygltf::Mesh,_std::allocator<tinygltf::Mesh>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar25 = 0;
      do {
        local_78.m_type = null;
        local_78.m_value.object = (object_t *)0x0;
        local_50 = uVar25;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::assert_invariant(&local_78,true);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::assert_invariant(&local_78,true);
        pMVar13 = (model->meshes).
                  super__Vector_base<tinygltf::Mesh,_std::allocator<tinygltf::Mesh>_>._M_impl.
                  super__Vector_impl_data._M_start;
        local_378._0_8_ = local_378._0_8_ & 0xffffffffffffff00;
        local_378._8_8_ = (object_t *)0x0;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            *)local_378,true);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            *)local_378,true);
        pMVar36 = pMVar13 + uVar25;
        if (*(pointer *)
             ((long)&pMVar13[uVar25].primitives.
                     super__Vector_base<tinygltf::Primitive,_std::allocator<tinygltf::Primitive>_>.
                     _M_impl + 8) !=
            *(pointer *)
             &pMVar13[uVar25].primitives.
              super__Vector_base<tinygltf::Primitive,_std::allocator<tinygltf::Primitive>_>._M_impl)
        {
          uVar34 = 0;
          local_48 = pMVar13 + uVar25;
          do {
            pMVar13 = local_48;
            local_348._0_8_ = local_348._0_8_ & 0xffffffffffffff00;
            local_348._8_8_ = (string *)0x0;
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                *)local_348,true);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                *)local_348,true);
            lVar49 = *(long *)&(pMVar13->primitives).
                               super__Vector_base<tinygltf::Primitive,_std::allocator<tinygltf::Primitive>_>
                               ._M_impl.super__Vector_impl_data;
            pEVar50 = (ExtensionMap *)(uVar34 * 0x160);
            local_2b8._0_8_ = local_2b8._0_8_ & 0xffffffffffffff00;
            local_2b8._8_8_ = (object_t *)0x0;
            local_68 = uVar34;
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                *)local_2b8,true);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                *)local_2b8,true);
            local_2d0 = pEVar50;
            for (p_Var28 = *(_Rb_tree_node_base **)
                            ((long)&(pEVar50->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left
                            + lVar49);
                p_Var28 !=
                (_Rb_tree_node_base *)
                ((long)&(pEVar50->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color + lVar49);
                p_Var28 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var28)) {
              SerializeNumberProperty<int>
                        (*(string **)(p_Var28 + 1),p_Var28[2]._M_color,(json *)local_2b8);
            }
            detail::JsonAddMember
                      ((json *)local_348,"attributes",
                       (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)local_2b8);
            pEVar50 = local_2d0;
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                           *)local_2b8);
            if (-1 < *(int *)(&pEVar50[1]._M_t._M_impl.field_0x4 + lVar49)) {
              local_2a8[4] = 'c';
              local_2a8[5] = 'e';
              local_2a8[6] = 's';
              local_2a8[0] = 'i';
              local_2a8[1] = 'n';
              local_2a8[2] = 'd';
              local_2a8[3] = 'i';
              local_2b8._8_8_ = (pointer)0x7;
              local_2a8[7] = '\0';
              local_2b8._0_8_ = (string *)local_2a8;
              SerializeNumberProperty<int>
                        ((string *)local_2a8,*(int *)(&pEVar50[1]._M_t._M_impl.field_0x4 + lVar49),
                         (json *)local_348);
              if ((string *)local_2b8._0_8_ != (string *)local_2a8) {
                operator_delete((void *)local_2b8._0_8_);
              }
            }
            if (-1 < *(int *)(&pEVar50[1]._M_t._M_impl.field_0x0 + lVar49)) {
              local_2a8[0] = 'm';
              local_2a8[1] = 'a';
              local_2a8[2] = 't';
              local_2a8[3] = 'e';
              local_2a8[4] = 'r';
              local_2a8[5] = 'i';
              local_2a8[6] = 'a';
              local_2a8[7] = 'l';
              local_2b8._8_8_ = (pointer)0x8;
              local_2a8[8] = '\0';
              local_2b8._0_8_ = (string *)local_2a8;
              SerializeNumberProperty<int>
                        ((string *)local_2a8,*(int *)(&pEVar50[1]._M_t._M_impl.field_0x0 + lVar49),
                         (json *)local_348);
              if ((string *)local_2b8._0_8_ != (string *)local_2a8) {
                operator_delete((void *)local_2b8._0_8_);
              }
            }
            local_2a8[0] = 'm';
            local_2a8[1] = 'o';
            local_2a8[2] = 'd';
            local_2a8[3] = 'e';
            local_2b8._8_8_ = (string *)0x4;
            local_2a8[4] = '\0';
            local_2b8._0_8_ = (string *)local_2a8;
            SerializeNumberProperty<int>
                      ((string *)local_2a8,
                       *(int *)((long)&pEVar50[1]._M_t._M_impl.super__Rb_tree_header._M_header.
                                       _M_color + lVar49),(json *)local_348);
            if ((string *)local_2b8._0_8_ != (string *)local_2a8) {
              operator_delete((void *)local_2b8._0_8_);
            }
            if (*(long *)((long)&pEVar50[1]._M_t._M_impl.super__Rb_tree_header._M_header._M_left +
                         lVar49) !=
                *(long *)((long)&pEVar50[1]._M_t._M_impl.super__Rb_tree_header._M_header._M_parent +
                         lVar49)) {
              local_328._M_allocated_capacity = local_328._M_allocated_capacity & 0xffffffffffffff00
              ;
              local_328._8_8_ = (string *)0x0;
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                  *)&local_328,true);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                  *)&local_328,true);
              if (*(long *)((long)&pEVar50[1]._M_t._M_impl.super__Rb_tree_header._M_header._M_left +
                           lVar49) !=
                  *(long *)((long)&pEVar50[1]._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
                           + lVar49)) {
                uVar25 = 0;
                do {
                  local_2f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start._0_1_ =
                       (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)0x0;
                  local_2f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish = (pointer)0x0;
                  nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                      *)&local_2f8,true);
                  nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                      *)&local_2f8,true);
                  std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                              *)local_2b8,
                             (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                              *)(uVar25 * 0x30 +
                                *(long *)((long)&pEVar50[1]._M_t._M_impl.super__Rb_tree_header.
                                                 _M_header._M_parent + lVar49)));
                  for (p_Var28 = (_Rb_tree_node_base *)
                                 CONCAT17(local_2a8[0xf],
                                          CONCAT16(local_2a8[0xe],
                                                   CONCAT15(local_2a8[0xd],
                                                            CONCAT14(local_2a8[0xc],
                                                                     CONCAT13(local_2a8[0xb],
                                                                              CONCAT12(local_2a8[10]
                                                                                       ,CONCAT11(
                                                  local_2a8[9],local_2a8[8])))))));
                      p_Var28 != (_Rb_tree_node_base *)(local_2b8 + 8);
                      p_Var28 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var28)) {
                    SerializeNumberProperty<int>
                              (*(string **)(p_Var28 + 1),p_Var28[2]._M_color,
                               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                *)&local_2f8);
                  }
                  nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::push_back((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                               *)&local_328,
                              (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                               *)&local_2f8);
                  std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                               *)local_2b8);
                  nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                 *)&local_2f8);
                  uVar25 = (ulong)((int)uVar25 + 1);
                  uVar34 = (*(long *)((long)&pEVar50[1]._M_t._M_impl.super__Rb_tree_header._M_header
                                             ._M_left + lVar49) -
                            *(long *)((long)&pEVar50[1]._M_t._M_impl.super__Rb_tree_header._M_header
                                             ._M_parent + lVar49) >> 4) * -0x5555555555555555;
                } while (uVar25 <= uVar34 && uVar34 - uVar25 != 0);
              }
              detail::JsonAddMember((json *)local_348,"targets",(json *)&local_328);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                             *)&local_328);
            }
            SerializeExtensionMap
                      ((ExtensionMap *)
                       ((long)&pEVar50[1]._M_t._M_impl.super__Rb_tree_header._M_node_count + lVar49)
                       ,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         *)local_348);
            SerializeExtras((Value *)((long)&pEVar50[2]._M_t._M_impl.super__Rb_tree_header.
                                             _M_node_count + lVar49),
                            (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                             *)local_348);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::push_back((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         *)local_378,
                        (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         *)local_348);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                           *)local_348);
            uVar34 = (ulong)((int)local_68 + 1);
            uVar25 = ((long)*(pointer *)
                             ((long)&(local_48->primitives).
                                     super__Vector_base<tinygltf::Primitive,_std::allocator<tinygltf::Primitive>_>
                                     ._M_impl + 8) -
                      *(long *)&(local_48->primitives).
                                super__Vector_base<tinygltf::Primitive,_std::allocator<tinygltf::Primitive>_>
                                ._M_impl.super__Vector_impl_data >> 5) * 0x2e8ba2e8ba2e8ba3;
            pMVar36 = local_48;
          } while (uVar34 <= uVar25 && uVar25 - uVar34 != 0);
        }
        detail::JsonAddMember(&local_78,"primitives",(json *)local_378);
        if (*(pointer *)
             ((long)&(pMVar36->weights).super__Vector_base<double,_std::allocator<double>_>._M_impl
             + 8) != (pMVar36->weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start) {
          local_2a8[4] = 'h';
          local_2a8[5] = 't';
          local_2a8[6] = 's';
          local_2a8[0] = 'w';
          local_2a8[1] = 'e';
          local_2a8[2] = 'i';
          local_2a8[3] = 'g';
          local_2b8._8_8_ = (string *)0x7;
          local_2a8[7] = '\0';
          local_2b8._0_8_ = (string *)local_2a8;
          SerializeNumberArrayProperty<double>((string *)local_2b8,&pMVar36->weights,&local_78);
          if ((string *)local_2b8._0_8_ != (string *)local_2a8) {
            operator_delete((void *)local_2b8._0_8_);
          }
        }
        if ((pMVar36->name)._M_string_length != 0) {
          local_2a8[0] = 'n';
          local_2a8[1] = 'a';
          local_2a8[2] = 'm';
          local_2a8[3] = 'e';
          local_2b8._8_8_ = (string *)0x4;
          local_2a8[4] = '\0';
          local_2b8._0_8_ = (string *)local_2a8;
          SerializeStringProperty
                    ((string *)local_2a8,(string *)(pMVar36->name)._M_dataplus._M_p,&local_78);
          if ((string *)local_2b8._0_8_ != (string *)local_2a8) {
            operator_delete((void *)local_2b8._0_8_);
          }
        }
        SerializeExtensionMap(&pMVar36->extensions,&local_78);
        SerializeExtras(&pMVar36->extras,&local_78);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                       *)local_378);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::push_back(&local_2e0,&local_78);
        uVar25 = local_50;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::~basic_json(&local_78);
        uVar25 = (ulong)((int)uVar25 + 1);
        uVar34 = ((long)(local_350->meshes).
                        super__Vector_base<tinygltf::Mesh,_std::allocator<tinygltf::Mesh>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(local_350->meshes).
                        super__Vector_base<tinygltf::Mesh,_std::allocator<tinygltf::Mesh>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3) * -0x7d05f417d05f417d;
        model = local_350;
      } while (uVar25 <= uVar34 && uVar34 - uVar25 != 0);
    }
    detail::JsonAddMember((json *)local_318.field_2._8_8_,"meshes",&local_2e0);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json(&local_2e0);
    model = local_350;
  }
  if ((model->nodes).super__Vector_base<tinygltf::Node,_std::allocator<tinygltf::Node>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (model->nodes).super__Vector_base<tinygltf::Node,_std::allocator<tinygltf::Node>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_2f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start._0_1_ = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)0x0;
    local_2f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)&local_2f8,true);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)&local_2f8,true);
    if ((model->nodes).super__Vector_base<tinygltf::Node,_std::allocator<tinygltf::Node>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (model->nodes).super__Vector_base<tinygltf::Node,_std::allocator<tinygltf::Node>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar25 = 0;
      uVar34 = 1;
      do {
        local_2e0.m_type = null;
        local_2e0.m_value.object = (object_t *)0x0;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::assert_invariant(&local_2e0,true);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::assert_invariant(&local_2e0,true);
        pNVar35 = (model->nodes).super__Vector_base<tinygltf::Node,_std::allocator<tinygltf::Node>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (*(pointer *)
             ((long)&pNVar35[uVar25].translation.super__Vector_base<double,_std::allocator<double>_>
                     ._M_impl + 8) !=
            *(pointer *)
             &pNVar35[uVar25].translation.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl) {
          local_2a8[0] = 't';
          local_2a8[1] = 'r';
          local_2a8[2] = 'a';
          local_2a8[3] = 'n';
          local_2a8[4] = 's';
          local_2a8[5] = 'l';
          local_2a8[6] = 'a';
          local_2a8[7] = 't';
          local_2a8[8] = 'i';
          local_2a8[9] = 'o';
          local_2a8[10] = 'n';
          local_2b8._8_8_ = (string *)0xb;
          local_2a8[0xb] = '\0';
          local_2b8._0_8_ = (string *)local_2a8;
          SerializeNumberArrayProperty<double>
                    ((string *)local_2b8,&pNVar35[uVar25].translation,&local_2e0);
          if ((string *)local_2b8._0_8_ != (string *)local_2a8) {
            operator_delete((void *)local_2b8._0_8_);
          }
        }
        psVar41 = (string *)(local_378 + 0x10);
        pNVar35 = pNVar35 + uVar25;
        if (*(pointer *)
             ((long)&(pNVar35->rotation).super__Vector_base<double,_std::allocator<double>_>._M_impl
             + 8) != (pNVar35->rotation).super__Vector_base<double,_std::allocator<double>_>._M_impl
                     .super__Vector_impl_data._M_start) {
          local_2a8[0] = 'r';
          local_2a8[1] = 'o';
          local_2a8[2] = 't';
          local_2a8[3] = 'a';
          local_2a8[4] = 't';
          local_2a8[5] = 'i';
          local_2a8[6] = 'o';
          local_2a8[7] = 'n';
          local_2b8._8_8_ = (string *)0x8;
          local_2a8[8] = '\0';
          local_2b8._0_8_ = (string *)local_2a8;
          SerializeNumberArrayProperty<double>((string *)local_2b8,&pNVar35->rotation,&local_2e0);
          if ((string *)local_2b8._0_8_ != (string *)local_2a8) {
            operator_delete((void *)local_2b8._0_8_);
          }
        }
        if (*(pointer *)
             ((long)&(pNVar35->scale).super__Vector_base<double,_std::allocator<double>_>._M_impl +
             8) != (pNVar35->scale).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start) {
          local_2a8[4] = 'e';
          local_2a8[0] = 's';
          local_2a8[1] = 'c';
          local_2a8[2] = 'a';
          local_2a8[3] = 'l';
          local_2b8._8_8_ = (string *)0x5;
          local_2a8[5] = '\0';
          local_2b8._0_8_ = (string *)local_2a8;
          SerializeNumberArrayProperty<double>((string *)local_2b8,&pNVar35->scale,&local_2e0);
          if ((string *)local_2b8._0_8_ != (string *)local_2a8) {
            operator_delete((void *)local_2b8._0_8_);
          }
        }
        if (*(pointer *)
             ((long)&(pNVar35->matrix).super__Vector_base<double,_std::allocator<double>_>._M_impl +
             8) != (pNVar35->matrix).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start) {
          local_2a8[4] = 'i';
          local_2a8[5] = 'x';
          local_2a8[0] = 'm';
          local_2a8[1] = 'a';
          local_2a8[2] = 't';
          local_2a8[3] = 'r';
          local_2b8._8_8_ = (string *)0x6;
          local_2a8[6] = '\0';
          local_2b8._0_8_ = (string *)local_2a8;
          SerializeNumberArrayProperty<double>((string *)local_2b8,&pNVar35->matrix,&local_2e0);
          if ((string *)local_2b8._0_8_ != (string *)local_2a8) {
            operator_delete((void *)local_2b8._0_8_);
          }
        }
        if (pNVar35->mesh != -1) {
          local_2a8[0] = 'm';
          local_2a8[1] = 'e';
          local_2a8[2] = 's';
          local_2a8[3] = 'h';
          local_2b8._8_8_ = (string *)0x4;
          local_2a8[4] = '\0';
          local_2b8._0_8_ = (string *)local_2a8;
          SerializeNumberProperty<int>((string *)local_2a8,pNVar35->mesh,&local_2e0);
          if ((string *)local_2b8._0_8_ != (string *)local_2a8) {
            operator_delete((void *)local_2b8._0_8_);
          }
        }
        if (pNVar35->skin != -1) {
          local_2a8[0] = 's';
          local_2a8[1] = 'k';
          local_2a8[2] = 'i';
          local_2a8[3] = 'n';
          local_2b8._8_8_ = (string *)0x4;
          local_2a8[4] = '\0';
          local_2b8._0_8_ = (string *)local_2a8;
          SerializeNumberProperty<int>((string *)local_2a8,pNVar35->skin,&local_2e0);
          if ((string *)local_2b8._0_8_ != (string *)local_2a8) {
            operator_delete((void *)local_2b8._0_8_);
          }
        }
        if (pNVar35->camera != -1) {
          local_2a8[4] = 'r';
          local_2a8[5] = 'a';
          local_2a8[0] = 'c';
          local_2a8[1] = 'a';
          local_2a8[2] = 'm';
          local_2a8[3] = 'e';
          local_2b8._8_8_ = (string *)0x6;
          local_2a8[6] = '\0';
          local_2b8._0_8_ = (string *)local_2a8;
          SerializeNumberProperty<int>((string *)local_2a8,pNVar35->camera,&local_2e0);
          if ((string *)local_2b8._0_8_ != (string *)local_2a8) {
            operator_delete((void *)local_2b8._0_8_);
          }
        }
        if (*(pointer *)
             ((long)&(pNVar35->weights).super__Vector_base<double,_std::allocator<double>_>._M_impl
             + 8) != (pNVar35->weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start) {
          local_2a8[4] = 'h';
          local_2a8[5] = 't';
          local_2a8[6] = 's';
          local_2a8[0] = 'w';
          local_2a8[1] = 'e';
          local_2a8[2] = 'i';
          local_2a8[3] = 'g';
          local_2b8._8_8_ = (string *)0x7;
          local_2a8[7] = '\0';
          local_2b8._0_8_ = (string *)local_2a8;
          SerializeNumberArrayProperty<double>((string *)local_2b8,&pNVar35->weights,&local_2e0);
          if ((string *)local_2b8._0_8_ != (string *)local_2a8) {
            operator_delete((void *)local_2b8._0_8_);
          }
        }
        SerializeExtensionMap(&pNVar35->extensions,&local_2e0);
        SerializeExtras(&pNVar35->extras,&local_2e0);
        if (pNVar35->light == -1) {
          local_348._0_8_ = (string *)0x0;
          local_348._8_8_ = (string *)0x0;
          local_348._16_8_ =
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)0x0;
          local_330.m_it = -0x8000000000000000;
          bVar54 = detail::FindMember(&local_2e0,"extensions",(json_iterator *)local_348);
          if (bVar54) {
            pbVar27 = nlohmann::detail::
                      iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                   *)local_348);
            local_328._M_allocated_capacity = 0;
            local_328._8_8_ = (string *)0x0;
            local_318._M_dataplus._M_p = (pointer)0x0;
            local_318._M_string_length = 0x8000000000000000;
            bVar54 = detail::FindMember(pbVar27,"KHR_lights_punctual",(json_iterator *)&local_328);
            if (bVar54) {
              local_2b8._0_8_ = local_328._M_allocated_capacity;
              local_2a8[8] = (undefined1)local_318._M_string_length;
              local_2a8[9] = (undefined1)(local_318._M_string_length >> 8);
              local_2a8[10] = (undefined1)(local_318._M_string_length >> 0x10);
              local_2a8[0xb] = (undefined1)(local_318._M_string_length >> 0x18);
              local_2a8[0xc] = (undefined1)(local_318._M_string_length >> 0x20);
              local_2a8[0xd] = (undefined1)(local_318._M_string_length >> 0x28);
              local_2a8[0xe] = (undefined1)(local_318._M_string_length >> 0x30);
              local_2a8[0xf] = (undefined1)(local_318._M_string_length >> 0x38);
              local_2b8._8_8_ = local_328._8_8_;
              local_2a8[0] = SUB81(local_318._M_dataplus._M_p,0);
              local_2a8[1] = (undefined1)((ulong)local_318._M_dataplus._M_p >> 8);
              local_2a8[2] = (undefined1)((ulong)local_318._M_dataplus._M_p >> 0x10);
              local_2a8[3] = (undefined1)((ulong)local_318._M_dataplus._M_p >> 0x18);
              local_2a8[4] = (undefined1)((ulong)local_318._M_dataplus._M_p >> 0x20);
              local_2a8[5] = (undefined1)((ulong)local_318._M_dataplus._M_p >> 0x28);
              local_2a8[6] = (undefined1)((ulong)local_318._M_dataplus._M_p >> 0x30);
              local_2a8[7] = (undefined1)((ulong)local_318._M_dataplus._M_p >> 0x38);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::
              erase<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0>
                        ((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          *)local_378,pbVar27,
                         (iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          *)local_2b8);
            }
            vVar8 = pbVar27->m_type;
            if (vVar8 == null) {
LAB_00121074:
              local_2b8._0_8_ = local_348._0_8_;
              local_2a8[8] = (undefined1)local_330.m_it;
              local_2a8[9] = (undefined1)((ulong)local_330.m_it >> 8);
              local_2a8[10] = (undefined1)((ulong)local_330.m_it >> 0x10);
              local_2a8[0xb] = (undefined1)((ulong)local_330.m_it >> 0x18);
              local_2a8[0xc] = (undefined1)((ulong)local_330.m_it >> 0x20);
              local_2a8[0xd] = (undefined1)((ulong)local_330.m_it >> 0x28);
              local_2a8[0xe] = (undefined1)((ulong)local_330.m_it >> 0x30);
              local_2a8[0xf] = (undefined1)((ulong)local_330.m_it >> 0x38);
              local_2b8._8_8_ = local_348._8_8_;
              local_2a8[0] = (undefined1)local_348._16_8_;
              local_2a8[1] = SUB81(local_348._16_8_,1);
              local_2a8[2] = SUB81(local_348._16_8_,2);
              local_2a8[3] = SUB81(local_348._16_8_,3);
              local_2a8[4] = SUB81(local_348._16_8_,4);
              local_2a8[5] = SUB81(local_348._16_8_,5);
              local_2a8[6] = SUB81(local_348._16_8_,6);
              local_2a8[7] = SUB81(local_348._16_8_,7);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::
              erase<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0>
                        ((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          *)local_378,&local_2e0,
                         (iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          *)local_2b8);
            }
            else if (vVar8 == array) {
              if ((((pbVar27->m_value).array)->
                  super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start ==
                  (((pbVar27->m_value).array)->
                  super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish) goto LAB_00121074;
            }
            else if ((vVar8 == object) &&
                    ((((pbVar27->m_value).object)->_M_t)._M_impl.super__Rb_tree_header._M_node_count
                     == 0)) goto LAB_00121074;
          }
        }
        else {
          local_2b8._0_8_ = (string *)0x0;
          local_2b8._8_8_ = (string *)0x0;
          local_2a8[0] = '\0';
          local_2a8[1] = '\0';
          local_2a8[2] = '\0';
          local_2a8[3] = '\0';
          local_2a8[4] = '\0';
          local_2a8[5] = '\0';
          local_2a8[6] = '\0';
          local_2a8[7] = '\0';
          local_2a8[8] = '\0';
          local_2a8[9] = '\0';
          local_2a8[10] = '\0';
          local_2a8[0xb] = '\0';
          local_2a8[0xc] = '\0';
          local_2a8[0xd] = '\0';
          local_2a8[0xe] = '\0';
          local_2a8[0xf] = -0x80;
          bVar54 = detail::FindMember(&local_2e0,"extensions",(json_iterator *)local_2b8);
          if (!bVar54) {
            local_378._0_8_ = local_378._0_8_ & 0xffffffffffffff00;
            local_378._8_8_ = (object_t *)0x0;
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                *)local_378,true);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                *)local_378,true);
            detail::JsonSetObject((json *)local_378);
            detail::JsonAddMember(&local_2e0,"extensions",(json *)local_378);
            detail::FindMember(&local_2e0,"extensions",(json_iterator *)local_2b8);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                           *)local_378);
          }
          pbVar27 = nlohmann::detail::
                    iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                 *)local_2b8);
          bVar54 = detail::FindMember(pbVar27,"KHR_lights_punctual",(json_iterator *)local_2b8);
          if (!bVar54) {
            local_378._0_8_ = local_378._0_8_ & 0xffffffffffffff00;
            local_378._8_8_ = (object_t *)0x0;
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                *)local_378,true);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                *)local_378,true);
            detail::JsonSetObject((json *)local_378);
            detail::JsonAddMember(pbVar27,"KHR_lights_punctual",(json *)local_378);
            detail::FindMember(pbVar27,"KHR_lights_punctual",(json_iterator *)local_2b8);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                           *)local_378);
          }
          local_378[0x14] = 't';
          local_378[0x10] = 'l';
          local_378[0x11] = 'i';
          local_378[0x12] = 'g';
          local_378[0x13] = 'h';
          local_378._8_8_ = (pointer)0x5;
          local_378[0x15] = '\0';
          iVar22 = pNVar35->light;
          local_378._0_8_ = psVar41;
          pbVar27 = nlohmann::detail::
                    iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                 *)local_2b8);
          SerializeNumberProperty<int>((string *)local_378._0_8_,iVar22,pbVar27);
          if ((string *)local_378._0_8_ != psVar41) {
            operator_delete((void *)local_378._0_8_);
          }
        }
        if (pNVar35->emitter == -1) {
          local_348._0_8_ = (string *)0x0;
          local_348._8_8_ = (string *)0x0;
          local_348._16_8_ =
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)0x0;
          local_330.m_it = -0x8000000000000000;
          bVar54 = detail::FindMember(&local_2e0,"extensions",(json_iterator *)local_348);
          if (bVar54) {
            pbVar27 = nlohmann::detail::
                      iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                   *)local_348);
            local_328._M_allocated_capacity = 0;
            local_328._8_8_ = (string *)0x0;
            local_318._M_dataplus._M_p = (pointer)0x0;
            local_318._M_string_length = 0x8000000000000000;
            bVar54 = detail::FindMember(pbVar27,"KHR_audio",(json_iterator *)&local_328);
            if (bVar54) {
              local_2b8._0_8_ = local_328._M_allocated_capacity;
              local_2a8[8] = (undefined1)local_318._M_string_length;
              local_2a8[9] = (undefined1)(local_318._M_string_length >> 8);
              local_2a8[10] = (undefined1)(local_318._M_string_length >> 0x10);
              local_2a8[0xb] = (undefined1)(local_318._M_string_length >> 0x18);
              local_2a8[0xc] = (undefined1)(local_318._M_string_length >> 0x20);
              local_2a8[0xd] = (undefined1)(local_318._M_string_length >> 0x28);
              local_2a8[0xe] = (undefined1)(local_318._M_string_length >> 0x30);
              local_2a8[0xf] = (undefined1)(local_318._M_string_length >> 0x38);
              local_2b8._8_8_ = local_328._8_8_;
              local_2a8[0] = SUB81(local_318._M_dataplus._M_p,0);
              local_2a8[1] = (undefined1)((ulong)local_318._M_dataplus._M_p >> 8);
              local_2a8[2] = (undefined1)((ulong)local_318._M_dataplus._M_p >> 0x10);
              local_2a8[3] = (undefined1)((ulong)local_318._M_dataplus._M_p >> 0x18);
              local_2a8[4] = (undefined1)((ulong)local_318._M_dataplus._M_p >> 0x20);
              local_2a8[5] = (undefined1)((ulong)local_318._M_dataplus._M_p >> 0x28);
              local_2a8[6] = (undefined1)((ulong)local_318._M_dataplus._M_p >> 0x30);
              local_2a8[7] = (undefined1)((ulong)local_318._M_dataplus._M_p >> 0x38);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::
              erase<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0>
                        ((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          *)local_378,pbVar27,
                         (iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          *)local_2b8);
            }
            vVar8 = pbVar27->m_type;
            if (vVar8 == null) {
LAB_00121325:
              local_2b8._0_8_ = local_348._0_8_;
              local_2a8[8] = (undefined1)local_330.m_it;
              local_2a8[9] = (undefined1)((ulong)local_330.m_it >> 8);
              local_2a8[10] = (undefined1)((ulong)local_330.m_it >> 0x10);
              local_2a8[0xb] = (undefined1)((ulong)local_330.m_it >> 0x18);
              local_2a8[0xc] = (undefined1)((ulong)local_330.m_it >> 0x20);
              local_2a8[0xd] = (undefined1)((ulong)local_330.m_it >> 0x28);
              local_2a8[0xe] = (undefined1)((ulong)local_330.m_it >> 0x30);
              local_2a8[0xf] = (undefined1)((ulong)local_330.m_it >> 0x38);
              local_2b8._8_8_ = local_348._8_8_;
              local_2a8[0] = (undefined1)local_348._16_8_;
              local_2a8[1] = SUB81(local_348._16_8_,1);
              local_2a8[2] = SUB81(local_348._16_8_,2);
              local_2a8[3] = SUB81(local_348._16_8_,3);
              local_2a8[4] = SUB81(local_348._16_8_,4);
              local_2a8[5] = SUB81(local_348._16_8_,5);
              local_2a8[6] = SUB81(local_348._16_8_,6);
              local_2a8[7] = SUB81(local_348._16_8_,7);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::
              erase<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0>
                        ((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          *)local_378,&local_2e0,
                         (iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          *)local_2b8);
            }
            else if (vVar8 == array) {
              if ((((pbVar27->m_value).array)->
                  super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start ==
                  (((pbVar27->m_value).array)->
                  super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish) goto LAB_00121325;
            }
            else if ((vVar8 == object) &&
                    ((((pbVar27->m_value).object)->_M_t)._M_impl.super__Rb_tree_header._M_node_count
                     == 0)) goto LAB_00121325;
          }
        }
        else {
          local_2b8._0_8_ = (string *)0x0;
          local_2b8._8_8_ = (string *)0x0;
          local_2a8[0] = '\0';
          local_2a8[1] = '\0';
          local_2a8[2] = '\0';
          local_2a8[3] = '\0';
          local_2a8[4] = '\0';
          local_2a8[5] = '\0';
          local_2a8[6] = '\0';
          local_2a8[7] = '\0';
          local_2a8[8] = '\0';
          local_2a8[9] = '\0';
          local_2a8[10] = '\0';
          local_2a8[0xb] = '\0';
          local_2a8[0xc] = '\0';
          local_2a8[0xd] = '\0';
          local_2a8[0xe] = '\0';
          local_2a8[0xf] = -0x80;
          bVar54 = detail::FindMember(&local_2e0,"extensions",
                                      (iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                       *)local_2b8);
          if (!bVar54) {
            local_378._0_8_ = local_378._0_8_ & 0xffffffffffffff00;
            local_378._8_8_ = (object_t *)0x0;
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                *)local_378,true);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                *)local_378,true);
            detail::JsonSetObject((json *)local_378);
            detail::JsonAddMember(&local_2e0,"extensions",(json *)local_378);
            detail::FindMember(&local_2e0,"extensions",
                               (iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                *)local_2b8);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                           *)local_378);
          }
          pbVar27 = nlohmann::detail::
                    iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                 *)local_2b8);
          bVar54 = detail::FindMember(pbVar27,"KHR_audio",
                                      (iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                       *)local_2b8);
          if (!bVar54) {
            local_378._0_8_ = local_378._0_8_ & 0xffffffffffffff00;
            local_378._8_8_ = (object_t *)0x0;
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                *)local_378,true);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                *)local_378,true);
            detail::JsonSetObject((json *)local_378);
            detail::JsonAddMember(pbVar27,"KHR_audio",(json *)local_378);
            detail::FindMember(pbVar27,"KHR_audio",(json_iterator *)local_2b8);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                           *)local_378);
          }
          local_378[0x14] = 't';
          local_378[0x15] = 'e';
          local_378[0x16] = 'r';
          local_378[0x10] = 'e';
          local_378[0x11] = 'm';
          local_378[0x12] = 'i';
          local_378[0x13] = 't';
          local_378._8_8_ = (pointer)0x7;
          local_378[0x17] = '\0';
          iVar22 = pNVar35->emitter;
          local_378._0_8_ = psVar41;
          pbVar27 = nlohmann::detail::
                    iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                 *)local_2b8);
          SerializeNumberProperty<int>((string *)local_378._0_8_,iVar22,pbVar27);
          if ((string *)local_378._0_8_ != psVar41) {
            operator_delete((void *)local_378._0_8_);
          }
        }
        if ((pNVar35->lods).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start ==
            *(pointer *)
             ((long)&(pNVar35->lods).super__Vector_base<int,_std::allocator<int>_>._M_impl + 8)) {
          local_348._0_8_ = (string *)0x0;
          local_348._8_8_ = (string *)0x0;
          local_348._16_8_ =
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)0x0;
          local_330.m_it = -0x8000000000000000;
          bVar54 = detail::FindMember(&local_2e0,"extensions",(json_iterator *)local_348);
          if (bVar54) {
            pbVar27 = nlohmann::detail::
                      iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                   *)local_348);
            local_328._M_allocated_capacity = 0;
            local_328._8_8_ = (string *)0x0;
            local_318._M_dataplus._M_p = (pointer)0x0;
            local_318._M_string_length = 0x8000000000000000;
            bVar54 = detail::FindMember(pbVar27,"MSFT_lod",(json_iterator *)&local_328);
            if (bVar54) {
              local_2b8._0_8_ = local_328._M_allocated_capacity;
              local_2a8[8] = (undefined1)local_318._M_string_length;
              local_2a8[9] = (undefined1)(local_318._M_string_length >> 8);
              local_2a8[10] = (undefined1)(local_318._M_string_length >> 0x10);
              local_2a8[0xb] = (undefined1)(local_318._M_string_length >> 0x18);
              local_2a8[0xc] = (undefined1)(local_318._M_string_length >> 0x20);
              local_2a8[0xd] = (undefined1)(local_318._M_string_length >> 0x28);
              local_2a8[0xe] = (undefined1)(local_318._M_string_length >> 0x30);
              local_2a8[0xf] = (undefined1)(local_318._M_string_length >> 0x38);
              local_2b8._8_8_ = local_328._8_8_;
              local_2a8[0] = SUB81(local_318._M_dataplus._M_p,0);
              local_2a8[1] = (undefined1)((ulong)local_318._M_dataplus._M_p >> 8);
              local_2a8[2] = (undefined1)((ulong)local_318._M_dataplus._M_p >> 0x10);
              local_2a8[3] = (undefined1)((ulong)local_318._M_dataplus._M_p >> 0x18);
              local_2a8[4] = (undefined1)((ulong)local_318._M_dataplus._M_p >> 0x20);
              local_2a8[5] = (undefined1)((ulong)local_318._M_dataplus._M_p >> 0x28);
              local_2a8[6] = (undefined1)((ulong)local_318._M_dataplus._M_p >> 0x30);
              local_2a8[7] = (undefined1)((ulong)local_318._M_dataplus._M_p >> 0x38);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::
              erase<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0>
                        ((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          *)local_378,pbVar27,
                         (iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          *)local_2b8);
            }
            vVar8 = pbVar27->m_type;
            if (vVar8 == null) {
LAB_001215d2:
              local_2b8._0_8_ = local_348._0_8_;
              local_2a8[8] = (undefined1)local_330.m_it;
              local_2a8[9] = (undefined1)((ulong)local_330.m_it >> 8);
              local_2a8[10] = (undefined1)((ulong)local_330.m_it >> 0x10);
              local_2a8[0xb] = (undefined1)((ulong)local_330.m_it >> 0x18);
              local_2a8[0xc] = (undefined1)((ulong)local_330.m_it >> 0x20);
              local_2a8[0xd] = (undefined1)((ulong)local_330.m_it >> 0x28);
              local_2a8[0xe] = (undefined1)((ulong)local_330.m_it >> 0x30);
              local_2a8[0xf] = (undefined1)((ulong)local_330.m_it >> 0x38);
              local_2b8._8_8_ = local_348._8_8_;
              local_2a8[0] = (undefined1)local_348._16_8_;
              local_2a8[1] = SUB81(local_348._16_8_,1);
              local_2a8[2] = SUB81(local_348._16_8_,2);
              local_2a8[3] = SUB81(local_348._16_8_,3);
              local_2a8[4] = SUB81(local_348._16_8_,4);
              local_2a8[5] = SUB81(local_348._16_8_,5);
              local_2a8[6] = SUB81(local_348._16_8_,6);
              local_2a8[7] = SUB81(local_348._16_8_,7);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::
              erase<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0>
                        ((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          *)local_378,&local_2e0,
                         (iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          *)local_2b8);
            }
            else if (vVar8 == array) {
              if ((((pbVar27->m_value).array)->
                  super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start ==
                  (((pbVar27->m_value).array)->
                  super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish) goto LAB_001215d2;
            }
            else if ((vVar8 == object) &&
                    ((((pbVar27->m_value).object)->_M_t)._M_impl.super__Rb_tree_header._M_node_count
                     == 0)) goto LAB_001215d2;
          }
        }
        else {
          local_2b8._0_8_ = (pointer)0x0;
          local_2b8._8_8_ = (object_t *)0x0;
          local_2a8[0] = '\0';
          local_2a8[1] = '\0';
          local_2a8[2] = '\0';
          local_2a8[3] = '\0';
          local_2a8[4] = '\0';
          local_2a8[5] = '\0';
          local_2a8[6] = '\0';
          local_2a8[7] = '\0';
          local_2a8[8] = '\0';
          local_2a8[9] = '\0';
          local_2a8[10] = '\0';
          local_2a8[0xb] = '\0';
          local_2a8[0xc] = '\0';
          local_2a8[0xd] = '\0';
          local_2a8[0xe] = '\0';
          local_2a8[0xf] = -0x80;
          bVar54 = detail::FindMember(&local_2e0,"extensions",
                                      (iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                       *)local_2b8);
          if (!bVar54) {
            local_378._0_8_ = local_378._0_8_ & 0xffffffffffffff00;
            local_378._8_8_ = (object_t *)0x0;
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                *)local_378,true);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                *)local_378,true);
            detail::JsonSetObject((json *)local_378);
            detail::JsonAddMember(&local_2e0,"extensions",(json *)local_378);
            detail::FindMember(&local_2e0,"extensions",
                               (iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                *)local_2b8);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                           *)local_378);
          }
          pbVar27 = nlohmann::detail::
                    iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                 *)local_2b8);
          bVar54 = detail::FindMember(pbVar27,"MSFT_lod",
                                      (iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                       *)local_2b8);
          if (!bVar54) {
            local_378._0_8_ = local_378._0_8_ & 0xffffffffffffff00;
            local_378._8_8_ = (object_t *)0x0;
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                *)local_378,true);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                *)local_378,true);
            detail::JsonSetObject((json *)local_378);
            detail::JsonAddMember(pbVar27,"MSFT_lod",(json *)local_378);
            detail::FindMember(pbVar27,"MSFT_lod",(json_iterator *)local_2b8);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                           *)local_378);
          }
          local_378[0x12] = 's';
          local_378[0x10] = 'i';
          local_378[0x11] = 'd';
          local_378._8_8_ = (pointer)0x3;
          local_378[0x13] = '\0';
          local_378._0_8_ = psVar41;
          pbVar27 = nlohmann::detail::
                    iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                 *)local_2b8);
          SerializeNumberArrayProperty<int>((string *)local_378,&pNVar35->lods,pbVar27);
          if ((string *)local_378._0_8_ != psVar41) {
            operator_delete((void *)local_378._0_8_);
          }
        }
        if ((pNVar35->name)._M_string_length != 0) {
          local_2a8[0] = 'n';
          local_2a8[1] = 'a';
          local_2a8[2] = 'm';
          local_2a8[3] = 'e';
          local_2b8._8_8_ = (pointer)0x4;
          local_2a8[4] = '\0';
          local_2b8._0_8_ = (string *)local_2a8;
          SerializeStringProperty
                    ((string *)local_2a8,(string *)(pNVar35->name)._M_dataplus._M_p,&local_2e0);
          if ((string *)local_2b8._0_8_ != (string *)local_2a8) {
            operator_delete((void *)local_2b8._0_8_);
          }
        }
        local_2a8[0] = 'c';
        local_2a8[1] = 'h';
        local_2a8[2] = 'i';
        local_2a8[3] = 'l';
        local_2a8[4] = 'd';
        local_2a8[5] = 'r';
        local_2a8[6] = 'e';
        local_2a8[7] = 'n';
        local_2b8._8_8_ = (string *)0x8;
        local_2a8[8] = '\0';
        local_2b8._0_8_ = (string *)local_2a8;
        SerializeNumberArrayProperty<int>((string *)local_2b8,&pNVar35->children,&local_2e0);
        if ((string *)local_2b8._0_8_ != (string *)local_2a8) {
          operator_delete((void *)local_2b8._0_8_);
        }
        if (local_2e0.m_type == null) {
          detail::JsonSetObject(&local_2e0);
        }
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::push_back((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)&local_2f8,&local_2e0);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::~basic_json(&local_2e0);
        uVar25 = ((long)(local_350->nodes).
                        super__Vector_base<tinygltf::Node,_std::allocator<tinygltf::Node>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(local_350->nodes).
                        super__Vector_base<tinygltf::Node,_std::allocator<tinygltf::Node>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3) * 0x4fbcda3ac10c9715;
        bVar54 = uVar34 <= uVar25;
        lVar49 = uVar25 - uVar34;
        model = local_350;
        uVar25 = uVar34;
        uVar34 = (ulong)((int)uVar34 + 1);
      } while (bVar54 && lVar49 != 0);
    }
    detail::JsonAddMember((json *)local_318.field_2._8_8_,"nodes",(json *)&local_2f8);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)&local_2f8);
    model = local_350;
  }
  if (-1 < model->defaultScene) {
    local_2b8._0_8_ = local_2a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"scene","");
    SerializeNumberProperty<int>
              ((string *)local_2b8._0_8_,model->defaultScene,(json *)local_318.field_2._8_8_);
    if ((string *)local_2b8._0_8_ != (string *)local_2a8) {
      operator_delete((void *)local_2b8._0_8_);
    }
  }
  if ((model->scenes).super__Vector_base<tinygltf::Scene,_std::allocator<tinygltf::Scene>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (model->scenes).super__Vector_base<tinygltf::Scene,_std::allocator<tinygltf::Scene>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_2f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start._0_1_ = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)0x0;
    local_2f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)&local_2f8,true);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)&local_2f8,true);
    if ((model->scenes).super__Vector_base<tinygltf::Scene,_std::allocator<tinygltf::Scene>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        (model->scenes).super__Vector_base<tinygltf::Scene,_std::allocator<tinygltf::Scene>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      uVar25 = 0;
      uVar34 = 1;
      do {
        local_2e0.m_type = null;
        local_2e0.m_value.object = (object_t *)0x0;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::assert_invariant(&local_2e0,true);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::assert_invariant(&local_2e0,true);
        pSVar53 = (model->scenes).
                  super__Vector_base<tinygltf::Scene,_std::allocator<tinygltf::Scene>_>._M_impl.
                  super__Vector_impl_data._M_start;
        local_2a8[4] = 's';
        local_2a8[0] = 'n';
        local_2a8[1] = 'o';
        local_2a8[2] = 'd';
        local_2a8[3] = 'e';
        local_2b8._8_8_ = (string *)0x5;
        local_2a8[5] = '\0';
        local_2b8._0_8_ = (string *)local_2a8;
        SerializeNumberArrayProperty<int>((string *)local_2b8,&pSVar53[uVar25].nodes,&local_2e0);
        if ((string *)local_2b8._0_8_ != (string *)local_2a8) {
          operator_delete((void *)local_2b8._0_8_);
        }
        pSVar53 = pSVar53 + uVar25;
        if ((pSVar53->name)._M_string_length != 0) {
          local_2a8[0] = 'n';
          local_2a8[1] = 'a';
          local_2a8[2] = 'm';
          local_2a8[3] = 'e';
          local_2b8._8_8_ = (string *)0x4;
          local_2a8[4] = '\0';
          local_2b8._0_8_ = (string *)local_2a8;
          SerializeStringProperty
                    ((string *)local_2a8,(string *)(pSVar53->name)._M_dataplus._M_p,&local_2e0);
          if ((string *)local_2b8._0_8_ != (string *)local_2a8) {
            operator_delete((void *)local_2b8._0_8_);
          }
        }
        SerializeExtensionMap(&pSVar53->extensions,&local_2e0);
        SerializeExtras(&pSVar53->extras,&local_2e0);
        if ((pSVar53->audioEmitters).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start ==
            *(pointer *)
             ((long)&(pSVar53->audioEmitters).super__Vector_base<int,_std::allocator<int>_>._M_impl
             + 8)) {
          local_348._0_8_ = (string *)0x0;
          local_348._8_8_ = (string *)0x0;
          local_348._16_8_ =
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)0x0;
          local_330.m_it = -0x8000000000000000;
          bVar54 = detail::FindMember(&local_2e0,"extensions",(json_iterator *)local_348);
          if (bVar54) {
            pbVar27 = nlohmann::detail::
                      iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                   *)local_348);
            local_328._M_allocated_capacity = 0;
            local_328._8_8_ = (string *)0x0;
            local_318._M_dataplus._M_p = (pointer)0x0;
            local_318._M_string_length = 0x8000000000000000;
            bVar54 = detail::FindMember(pbVar27,"KHR_audio",(json_iterator *)&local_328);
            if (bVar54) {
              local_2b8._0_8_ = local_328._M_allocated_capacity;
              local_2a8[8] = (undefined1)local_318._M_string_length;
              local_2a8[9] = (undefined1)(local_318._M_string_length >> 8);
              local_2a8[10] = (undefined1)(local_318._M_string_length >> 0x10);
              local_2a8[0xb] = (undefined1)(local_318._M_string_length >> 0x18);
              local_2a8[0xc] = (undefined1)(local_318._M_string_length >> 0x20);
              local_2a8[0xd] = (undefined1)(local_318._M_string_length >> 0x28);
              local_2a8[0xe] = (undefined1)(local_318._M_string_length >> 0x30);
              local_2a8[0xf] = (undefined1)(local_318._M_string_length >> 0x38);
              local_2b8._8_8_ = local_328._8_8_;
              local_2a8[0] = SUB81(local_318._M_dataplus._M_p,0);
              local_2a8[1] = (undefined1)((ulong)local_318._M_dataplus._M_p >> 8);
              local_2a8[2] = (undefined1)((ulong)local_318._M_dataplus._M_p >> 0x10);
              local_2a8[3] = (undefined1)((ulong)local_318._M_dataplus._M_p >> 0x18);
              local_2a8[4] = (undefined1)((ulong)local_318._M_dataplus._M_p >> 0x20);
              local_2a8[5] = (undefined1)((ulong)local_318._M_dataplus._M_p >> 0x28);
              local_2a8[6] = (undefined1)((ulong)local_318._M_dataplus._M_p >> 0x30);
              local_2a8[7] = (undefined1)((ulong)local_318._M_dataplus._M_p >> 0x38);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::
              erase<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0>
                        ((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          *)local_378,pbVar27,
                         (iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          *)local_2b8);
            }
            vVar8 = pbVar27->m_type;
            if (vVar8 == null) {
LAB_00121b8c:
              local_2b8._0_8_ = local_348._0_8_;
              local_2a8[8] = (undefined1)local_330.m_it;
              local_2a8[9] = (undefined1)((ulong)local_330.m_it >> 8);
              local_2a8[10] = (undefined1)((ulong)local_330.m_it >> 0x10);
              local_2a8[0xb] = (undefined1)((ulong)local_330.m_it >> 0x18);
              local_2a8[0xc] = (undefined1)((ulong)local_330.m_it >> 0x20);
              local_2a8[0xd] = (undefined1)((ulong)local_330.m_it >> 0x28);
              local_2a8[0xe] = (undefined1)((ulong)local_330.m_it >> 0x30);
              local_2a8[0xf] = (undefined1)((ulong)local_330.m_it >> 0x38);
              local_2b8._8_8_ = local_348._8_8_;
              local_2a8[0] = (undefined1)local_348._16_8_;
              local_2a8[1] = SUB81(local_348._16_8_,1);
              local_2a8[2] = SUB81(local_348._16_8_,2);
              local_2a8[3] = SUB81(local_348._16_8_,3);
              local_2a8[4] = SUB81(local_348._16_8_,4);
              local_2a8[5] = SUB81(local_348._16_8_,5);
              local_2a8[6] = SUB81(local_348._16_8_,6);
              local_2a8[7] = SUB81(local_348._16_8_,7);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::
              erase<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0>
                        ((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          *)local_378,&local_2e0,
                         (iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          *)local_2b8);
            }
            else if (vVar8 == array) {
              if ((((pbVar27->m_value).array)->
                  super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start ==
                  (((pbVar27->m_value).array)->
                  super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish) goto LAB_00121b8c;
            }
            else if ((vVar8 == object) &&
                    ((((pbVar27->m_value).object)->_M_t)._M_impl.super__Rb_tree_header._M_node_count
                     == 0)) goto LAB_00121b8c;
          }
        }
        else {
          local_2b8._0_8_ = (string *)0x0;
          local_2b8._8_8_ = (string *)0x0;
          local_2a8[0] = '\0';
          local_2a8[1] = '\0';
          local_2a8[2] = '\0';
          local_2a8[3] = '\0';
          local_2a8[4] = '\0';
          local_2a8[5] = '\0';
          local_2a8[6] = '\0';
          local_2a8[7] = '\0';
          local_2a8[8] = '\0';
          local_2a8[9] = '\0';
          local_2a8[10] = '\0';
          local_2a8[0xb] = '\0';
          local_2a8[0xc] = '\0';
          local_2a8[0xd] = '\0';
          local_2a8[0xe] = '\0';
          local_2a8[0xf] = -0x80;
          bVar54 = detail::FindMember(&local_2e0,"extensions",(json_iterator *)local_2b8);
          if (!bVar54) {
            local_378._0_8_ = local_378._0_8_ & 0xffffffffffffff00;
            local_378._8_8_ = (object_t *)0x0;
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                *)local_378,true);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                *)local_378,true);
            detail::JsonSetObject((json *)local_378);
            detail::JsonAddMember(&local_2e0,"extensions",(json *)local_378);
            detail::FindMember(&local_2e0,"extensions",(json_iterator *)local_2b8);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                           *)local_378);
          }
          pbVar27 = nlohmann::detail::
                    iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                 *)local_2b8);
          bVar54 = detail::FindMember(pbVar27,"KHR_audio",(json_iterator *)local_2b8);
          if (!bVar54) {
            local_378._0_8_ = local_378._0_8_ & 0xffffffffffffff00;
            local_378._8_8_ = (object_t *)0x0;
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                *)local_378,true);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                *)local_378,true);
            detail::JsonSetObject((json *)local_378);
            detail::JsonAddMember(pbVar27,"KHR_audio",(json *)local_378);
            detail::FindMember(&local_2e0,"KHR_audio",(json_iterator *)local_2b8);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                           *)local_378);
          }
          local_378[0x10] = 'e';
          local_378[0x11] = 'm';
          local_378[0x12] = 'i';
          local_378[0x13] = 't';
          local_378[0x14] = 't';
          local_378[0x15] = 'e';
          local_378[0x16] = 'r';
          local_378[0x17] = 's';
          local_378._8_8_ = (pointer)0x8;
          local_378[0x18] = '\0';
          local_378._0_8_ = (string *)(local_378 + 0x10);
          pbVar27 = nlohmann::detail::
                    iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                 *)local_2b8);
          SerializeNumberArrayProperty<int>((string *)local_378,&pSVar53->audioEmitters,pbVar27);
          if ((string *)local_378._0_8_ != (string *)(local_378 + 0x10)) {
            operator_delete((void *)local_378._0_8_);
          }
        }
        if (local_2e0.m_type == null) {
          detail::JsonSetObject(&local_2e0);
        }
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::push_back((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)&local_2f8,&local_2e0);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::~basic_json(&local_2e0);
        uVar25 = ((long)(local_350->scenes).
                        super__Vector_base<tinygltf::Scene,_std::allocator<tinygltf::Scene>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)(local_350->scenes).
                        super__Vector_base<tinygltf::Scene,_std::allocator<tinygltf::Scene>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 3) * -0x7d05f417d05f417d;
        bVar54 = uVar34 <= uVar25;
        lVar49 = uVar25 - uVar34;
        uVar25 = uVar34;
        uVar34 = (ulong)((int)uVar34 + 1);
        model = local_350;
      } while (bVar54 && lVar49 != 0);
    }
    detail::JsonAddMember((json *)local_318.field_2._8_8_,"scenes",(json *)&local_2f8);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)&local_2f8);
    model = local_350;
  }
  if ((model->skins).super__Vector_base<tinygltf::Skin,_std::allocator<tinygltf::Skin>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (model->skins).super__Vector_base<tinygltf::Skin,_std::allocator<tinygltf::Skin>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_378._0_8_ = local_378._0_8_ & 0xffffffffffffff00;
    local_378._8_8_ = (object_t *)0x0;
    uVar40 = 1;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)local_378,true);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)local_378,true);
    if ((model->skins).super__Vector_base<tinygltf::Skin,_std::allocator<tinygltf::Skin>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (model->skins).super__Vector_base<tinygltf::Skin,_std::allocator<tinygltf::Skin>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar25 = 0;
      do {
        local_348._0_8_ = local_348._0_8_ & 0xffffffffffffff00;
        local_348._8_8_ = (string *)0x0;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            *)local_348,true);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            *)local_348,true);
        pSVar48 = (model->skins).super__Vector_base<tinygltf::Skin,_std::allocator<tinygltf::Skin>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_2a8[4] = 't';
        local_2a8[5] = 's';
        local_2a8[0] = 'j';
        local_2a8[1] = 'o';
        local_2a8[2] = 'i';
        local_2a8[3] = 'n';
        local_2b8._8_8_ = (string *)0x6;
        local_2a8[6] = '\0';
        local_2b8._0_8_ = (string *)local_2a8;
        SerializeNumberArrayProperty<int>
                  ((string *)local_2b8,&pSVar48[uVar25].joints,
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)local_348);
        if ((string *)local_2b8._0_8_ != (string *)local_2a8) {
          operator_delete((void *)local_2b8._0_8_);
        }
        pSVar48 = pSVar48 + uVar25;
        if (-1 < pSVar48->inverseBindMatrices) {
          local_2b8._0_8_ = local_2a8;
          local_328._M_allocated_capacity = 0x13;
          local_2b8._0_8_ = std::__cxx11::string::_M_create((ulong *)local_2b8,(ulong)&local_328);
          local_2a8[0] = (undefined1)local_328._M_allocated_capacity;
          local_2a8[1] = (undefined1)((ulong)local_328._0_8_ >> 8);
          local_2a8[2] = (undefined1)((ulong)local_328._0_8_ >> 0x10);
          local_2a8[3] = (undefined1)((ulong)local_328._0_8_ >> 0x18);
          local_2a8[4] = (undefined1)((ulong)local_328._0_8_ >> 0x20);
          local_2a8[5] = (undefined1)((ulong)local_328._0_8_ >> 0x28);
          local_2a8[6] = (undefined1)((ulong)local_328._0_8_ >> 0x30);
          local_2a8[7] = (undefined1)((ulong)local_328._0_8_ >> 0x38);
          (((string *)local_2b8._0_8_)->_M_dataplus)._M_p = (pointer)0x4265737265766e69;
          ((string *)local_2b8._0_8_)->_M_string_length = 0x697274614d646e69;
          *(undefined4 *)((long)&((string *)local_2b8._0_8_)->_M_string_length + 7) = 0x73656369;
          local_2b8._8_8_ = local_328._M_allocated_capacity;
          *(undefined1 *)
           ((long)&(((string *)local_2b8._0_8_)->_M_dataplus)._M_p + local_328._M_allocated_capacity
           ) = 0;
          SerializeNumberProperty<int>
                    ((string *)local_2b8._0_8_,pSVar48->inverseBindMatrices,
                     (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)local_348);
          if ((string *)local_2b8._0_8_ != (string *)local_2a8) {
            operator_delete((void *)local_2b8._0_8_);
          }
        }
        if (-1 < pSVar48->skeleton) {
          local_2a8[0] = 's';
          local_2a8[1] = 'k';
          local_2a8[2] = 'e';
          local_2a8[3] = 'l';
          local_2a8[4] = 'e';
          local_2a8[5] = 't';
          local_2a8[6] = 'o';
          local_2a8[7] = 'n';
          local_2b8._8_8_ = (string *)0x8;
          local_2a8[8] = '\0';
          local_2b8._0_8_ = (string *)local_2a8;
          SerializeNumberProperty<int>
                    ((string *)local_2a8,pSVar48->skeleton,
                     (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)local_348);
          if ((string *)local_2b8._0_8_ != (string *)local_2a8) {
            operator_delete((void *)local_2b8._0_8_);
          }
        }
        if ((pSVar48->name)._M_string_length != 0) {
          local_2a8[0] = 'n';
          local_2a8[1] = 'a';
          local_2a8[2] = 'm';
          local_2a8[3] = 'e';
          local_2b8._8_8_ = (string *)0x4;
          local_2a8[4] = '\0';
          local_2b8._0_8_ = (string *)local_2a8;
          SerializeStringProperty
                    ((string *)local_2a8,(string *)(pSVar48->name)._M_dataplus._M_p,
                     (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)local_348);
          if ((string *)local_2b8._0_8_ != (string *)local_2a8) {
            operator_delete((void *)local_2b8._0_8_);
          }
        }
        SerializeExtensionMap
                  (&pSVar48->extensions,
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)local_348);
        SerializeExtras(&pSVar48->extras,
                        (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         *)local_348);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::push_back((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)local_378,
                    (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)local_348);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                       *)local_348);
        uVar25 = (ulong)uVar40;
        uVar34 = ((long)(local_350->skins).
                        super__Vector_base<tinygltf::Skin,_std::allocator<tinygltf::Skin>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(local_350->skins).
                        super__Vector_base<tinygltf::Skin,_std::allocator<tinygltf::Skin>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3) * -0x7063e7063e7063e7;
        uVar40 = uVar40 + 1;
        model = local_350;
      } while (uVar25 <= uVar34 && uVar34 - uVar25 != 0);
    }
    detail::JsonAddMember((json *)local_318.field_2._8_8_,"skins",(json *)local_378);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)local_378);
  }
  if ((model->textures).super__Vector_base<tinygltf::Texture,_std::allocator<tinygltf::Texture>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (model->textures).super__Vector_base<tinygltf::Texture,_std::allocator<tinygltf::Texture>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    local_378._0_8_ = local_378._0_8_ & 0xffffffffffffff00;
    local_378._8_8_ = (object_t *)0x0;
    uVar40 = 1;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)local_378,true);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)local_378,true);
    if ((model->textures).super__Vector_base<tinygltf::Texture,_std::allocator<tinygltf::Texture>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        (model->textures).super__Vector_base<tinygltf::Texture,_std::allocator<tinygltf::Texture>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      uVar25 = 0;
      do {
        local_348._0_8_ = local_348._0_8_ & 0xffffffffffffff00;
        local_348._8_8_ = (string *)0x0;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            *)local_348,true);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            *)local_348,true);
        pTVar14 = (model->textures).
                  super__Vector_base<tinygltf::Texture,_std::allocator<tinygltf::Texture>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pTVar2 = pTVar14 + uVar25;
        if (-1 < pTVar14[uVar25].sampler) {
          local_2a8[4] = 'l';
          local_2a8[5] = 'e';
          local_2a8[6] = 'r';
          local_2a8[0] = 's';
          local_2a8[1] = 'a';
          local_2a8[2] = 'm';
          local_2a8[3] = 'p';
          local_2b8._8_8_ = (string *)0x7;
          local_2a8[7] = '\0';
          local_2b8._0_8_ = (string *)local_2a8;
          SerializeNumberProperty<int>
                    ((string *)local_2a8,pTVar2->sampler,
                     (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)local_348);
          if ((string *)local_2b8._0_8_ != (string *)local_2a8) {
            operator_delete((void *)local_2b8._0_8_);
          }
        }
        if (-1 < pTVar2->source) {
          local_2a8[4] = 'c';
          local_2a8[5] = 'e';
          local_2a8[0] = 's';
          local_2a8[1] = 'o';
          local_2a8[2] = 'u';
          local_2a8[3] = 'r';
          local_2b8._8_8_ = (string *)0x6;
          local_2a8[6] = '\0';
          local_2b8._0_8_ = (string *)local_2a8;
          SerializeNumberProperty<int>
                    ((string *)local_2a8,pTVar2->source,
                     (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)local_348);
          if ((string *)local_2b8._0_8_ != (string *)local_2a8) {
            operator_delete((void *)local_2b8._0_8_);
          }
        }
        if ((pTVar2->name)._M_string_length != 0) {
          local_2a8[0] = 'n';
          local_2a8[1] = 'a';
          local_2a8[2] = 'm';
          local_2a8[3] = 'e';
          local_2b8._8_8_ = (string *)0x4;
          local_2a8[4] = '\0';
          local_2b8._0_8_ = (string *)local_2a8;
          SerializeStringProperty
                    ((string *)local_2a8,(string *)(pTVar2->name)._M_dataplus._M_p,
                     (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)local_348);
          if ((string *)local_2b8._0_8_ != (string *)local_2a8) {
            operator_delete((void *)local_2b8._0_8_);
          }
        }
        SerializeExtensionMap
                  (&pTVar2->extensions,
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)local_348);
        SerializeExtras(&pTVar2->extras,
                        (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         *)local_348);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::push_back((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)local_378,
                    (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)local_348);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                       *)local_348);
        uVar25 = (ulong)uVar40;
        uVar34 = ((long)(model->textures).
                        super__Vector_base<tinygltf::Texture,_std::allocator<tinygltf::Texture>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)(model->textures).
                        super__Vector_base<tinygltf::Texture,_std::allocator<tinygltf::Texture>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 4) * -0x79435e50d79435e5;
        uVar40 = uVar40 + 1;
      } while (uVar25 <= uVar34 && uVar34 - uVar25 != 0);
    }
    detail::JsonAddMember((json *)local_318.field_2._8_8_,"textures",(json *)local_378);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)local_378);
  }
  if ((model->samplers).super__Vector_base<tinygltf::Sampler,_std::allocator<tinygltf::Sampler>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (model->samplers).super__Vector_base<tinygltf::Sampler,_std::allocator<tinygltf::Sampler>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    local_378._0_8_ = local_378._0_8_ & 0xffffffffffffff00;
    local_378._8_8_ = (object_t *)0x0;
    uVar40 = 1;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)local_378,true);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)local_378,true);
    if ((model->samplers).super__Vector_base<tinygltf::Sampler,_std::allocator<tinygltf::Sampler>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        (model->samplers).super__Vector_base<tinygltf::Sampler,_std::allocator<tinygltf::Sampler>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      uVar25 = 0;
      do {
        local_348._0_8_ = local_348._0_8_ & 0xffffffffffffff00;
        local_348._8_8_ = (string *)0x0;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            *)local_348,true);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            *)local_348,true);
        pSVar15 = (model->samplers).
                  super__Vector_base<tinygltf::Sampler,_std::allocator<tinygltf::Sampler>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pSVar3 = pSVar15 + uVar25;
        if (pSVar15[uVar25].name._M_string_length != 0) {
          local_2a8[0] = 'n';
          local_2a8[1] = 'a';
          local_2a8[2] = 'm';
          local_2a8[3] = 'e';
          local_2b8._8_8_ = (pointer)0x4;
          local_2a8[4] = '\0';
          local_2b8._0_8_ = (string *)local_2a8;
          SerializeStringProperty
                    ((string *)local_2a8,(string *)(pSVar3->name)._M_dataplus._M_p,
                     (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)local_348);
          if ((string *)local_2b8._0_8_ != (string *)local_2a8) {
            operator_delete((void *)local_2b8._0_8_);
          }
        }
        if (pSVar3->magFilter != -1) {
          local_2a8[0] = 'm';
          local_2a8[1] = 'a';
          local_2a8[2] = 'g';
          local_2a8[3] = 'F';
          local_2a8[4] = 'i';
          local_2a8[5] = 'l';
          local_2a8[6] = 't';
          local_2a8[7] = 'e';
          local_2a8[8] = 'r';
          local_2b8._8_8_ = (pointer)0x9;
          local_2a8[9] = '\0';
          local_2b8._0_8_ = (string *)local_2a8;
          SerializeNumberProperty<int>
                    ((string *)local_2a8,pSVar3->magFilter,
                     (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)local_348);
          if ((string *)local_2b8._0_8_ != (string *)local_2a8) {
            operator_delete((void *)local_2b8._0_8_);
          }
        }
        if (pSVar3->minFilter != -1) {
          local_2a8[0] = 'm';
          local_2a8[1] = 'i';
          local_2a8[2] = 'n';
          local_2a8[3] = 'F';
          local_2a8[4] = 'i';
          local_2a8[5] = 'l';
          local_2a8[6] = 't';
          local_2a8[7] = 'e';
          local_2a8[8] = 'r';
          local_2b8._8_8_ = (pointer)0x9;
          local_2a8[9] = '\0';
          local_2b8._0_8_ = (string *)local_2a8;
          SerializeNumberProperty<int>
                    ((string *)local_2a8,pSVar3->minFilter,
                     (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)local_348);
          if ((string *)local_2b8._0_8_ != (string *)local_2a8) {
            operator_delete((void *)local_2b8._0_8_);
          }
        }
        local_2a8[4] = 'S';
        local_2a8[0] = 'w';
        local_2a8[1] = 'r';
        local_2a8[2] = 'a';
        local_2a8[3] = 'p';
        local_2b8._8_8_ = (pointer)0x5;
        local_2a8[5] = '\0';
        local_2b8._0_8_ = (string *)local_2a8;
        SerializeNumberProperty<int>
                  ((string *)local_2a8,pSVar3->wrapS,
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)local_348);
        if ((string *)local_2b8._0_8_ != (string *)local_2a8) {
          operator_delete((void *)local_2b8._0_8_);
        }
        local_2a8[4] = 'T';
        local_2a8[0] = 'w';
        local_2a8[1] = 'r';
        local_2a8[2] = 'a';
        local_2a8[3] = 'p';
        local_2b8._8_8_ = (string *)0x5;
        local_2a8[5] = '\0';
        local_2b8._0_8_ = (string *)local_2a8;
        SerializeNumberProperty<int>
                  ((string *)local_2a8,pSVar3->wrapT,
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)local_348);
        if ((string *)local_2b8._0_8_ != (string *)local_2a8) {
          operator_delete((void *)local_2b8._0_8_);
        }
        SerializeExtensionMap
                  (&pSVar3->extensions,
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)local_348);
        SerializeExtras(&pSVar3->extras,
                        (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         *)local_348);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::push_back((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)local_378,
                    (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)local_348);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                       *)local_348);
        uVar25 = (ulong)uVar40;
        uVar34 = ((long)(local_350->samplers).
                        super__Vector_base<tinygltf::Sampler,_std::allocator<tinygltf::Sampler>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)(local_350->samplers).
                        super__Vector_base<tinygltf::Sampler,_std::allocator<tinygltf::Sampler>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 3) * 0x6f96f96f96f96f97;
        uVar40 = uVar40 + 1;
        model = local_350;
      } while (uVar25 <= uVar34 && uVar34 - uVar25 != 0);
    }
    detail::JsonAddMember((json *)local_318.field_2._8_8_,"samplers",(json *)local_378);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)local_378);
    model = local_350;
  }
  if ((model->cameras).super__Vector_base<tinygltf::Camera,_std::allocator<tinygltf::Camera>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (model->cameras).super__Vector_base<tinygltf::Camera,_std::allocator<tinygltf::Camera>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    local_348._0_8_ = local_348._0_8_ & 0xffffffffffffff00;
    local_348._8_8_ = (string *)0x0;
    iVar22 = 1;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)local_348,true);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)local_348,true);
    if ((model->cameras).super__Vector_base<tinygltf::Camera,_std::allocator<tinygltf::Camera>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        (model->cameras).super__Vector_base<tinygltf::Camera,_std::allocator<tinygltf::Camera>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      uVar25 = 0;
      do {
        local_2d0 = (ExtensionMap *)CONCAT44(local_2d0._4_4_,iVar22);
        local_328._M_allocated_capacity = local_328._M_allocated_capacity & 0xffffffffffffff00;
        local_328._8_8_ = (string *)0x0;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            *)&local_328,true);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            *)&local_328,true);
        pCVar42 = (model->cameras).
                  super__Vector_base<tinygltf::Camera,_std::allocator<tinygltf::Camera>_>._M_impl.
                  super__Vector_impl_data._M_start;
        local_2a8[0] = 't';
        local_2a8[1] = 'y';
        local_2a8[2] = 'p';
        local_2a8[3] = 'e';
        local_2b8._8_8_ = (string *)0x4;
        local_2a8[4] = '\0';
        local_2b8._0_8_ = (string *)local_2a8;
        SerializeStringProperty
                  ((string *)local_2a8,(string *)pCVar42[uVar25].type._M_dataplus._M_p,
                   (json *)&local_328);
        if ((string *)local_2b8._0_8_ != (string *)local_2a8) {
          operator_delete((void *)local_2b8._0_8_);
        }
        pEVar50 = local_2d0;
        pCVar42 = pCVar42 + uVar25;
        iVar22 = (uint)local_2d0;
        if ((pCVar42->name)._M_string_length != 0) {
          local_2a8[0] = 'n';
          local_2a8[1] = 'a';
          local_2a8[2] = 'm';
          local_2a8[3] = 'e';
          local_2b8._8_8_ = (string *)0x4;
          local_2a8[4] = '\0';
          local_2b8._0_8_ = (string *)local_2a8;
          SerializeStringProperty
                    ((string *)local_2a8,(string *)(pCVar42->name)._M_dataplus._M_p,
                     (json *)&local_328);
          if ((string *)local_2b8._0_8_ != (string *)local_2a8) {
            operator_delete((void *)local_2b8._0_8_);
          }
        }
        iVar23 = std::__cxx11::string::compare((char *)pCVar42);
        if (iVar23 == 0) {
          local_378._0_8_ = local_378._0_8_ & 0xffffffffffffff00;
          local_378._8_8_ = (object_t *)0x0;
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)local_378,true);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)local_378,true);
          local_2a8[0] = 'z';
          local_2a8[1] = 'f';
          local_2a8[2] = 'a';
          local_2a8[3] = 'r';
          local_2b8._8_8_ = (pointer)0x4;
          local_2a8[4] = '\0';
          local_2b8._0_8_ = (string *)local_2a8;
          SerializeNumberProperty<double>
                    ((string *)local_2a8,(pCVar42->orthographic).zfar,(json *)local_378);
          if ((string *)local_2b8._0_8_ != (string *)local_2a8) {
            operator_delete((void *)local_2b8._0_8_);
          }
          local_2a8[4] = 'r';
          local_2a8[0] = 'z';
          local_2a8[1] = 'n';
          local_2a8[2] = 'e';
          local_2a8[3] = 'a';
          local_2b8._8_8_ = (pointer)0x5;
          local_2a8[5] = '\0';
          local_2b8._0_8_ = (string *)local_2a8;
          SerializeNumberProperty<double>
                    ((string *)local_2a8,(pCVar42->orthographic).znear,(json *)local_378);
          if ((string *)local_2b8._0_8_ != (string *)local_2a8) {
            operator_delete((void *)local_2b8._0_8_);
          }
          local_2a8[0] = 'x';
          local_2a8[1] = 'm';
          local_2a8[2] = 'a';
          local_2a8[3] = 'g';
          local_2b8._8_8_ = (pointer)0x4;
          local_2a8[4] = '\0';
          local_2b8._0_8_ = (string *)local_2a8;
          SerializeNumberProperty<double>
                    ((string *)local_2a8,(pCVar42->orthographic).xmag,(json *)local_378);
          if ((string *)local_2b8._0_8_ != (string *)local_2a8) {
            operator_delete((void *)local_2b8._0_8_);
          }
          local_2a8[0] = 'y';
          local_2a8[1] = 'm';
          local_2a8[2] = 'a';
          local_2a8[3] = 'g';
          local_2b8._8_8_ = (string *)0x4;
          local_2a8[4] = '\0';
          local_2b8._0_8_ = (string *)local_2a8;
          SerializeNumberProperty<double>
                    ((string *)local_2a8,(pCVar42->orthographic).ymag,(json *)local_378);
          if ((string *)local_2b8._0_8_ != (string *)local_2a8) {
            operator_delete((void *)local_2b8._0_8_);
          }
          SerializeExtensionMap(&(pCVar42->orthographic).extensions,(json *)local_378);
          SerializeExtras(&(pCVar42->orthographic).extras,(json *)local_378);
          detail::JsonAddMember((json *)&local_328,"orthographic",(json *)local_378);
LAB_001228f0:
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         *)local_378);
        }
        else {
          iVar23 = std::__cxx11::string::compare((char *)pCVar42);
          if (iVar23 == 0) {
            local_378._0_8_ = local_378._0_8_ & 0xffffffffffffff00;
            local_378._8_8_ = (object_t *)0x0;
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                *)local_378,true);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                *)local_378,true);
            local_2a8[0] = 'z';
            local_2a8[1] = 'f';
            local_2a8[2] = 'a';
            local_2a8[3] = 'r';
            local_2b8._8_8_ = (pointer)0x4;
            local_2a8[4] = '\0';
            local_2b8._0_8_ = (string *)local_2a8;
            SerializeNumberProperty<double>
                      ((string *)local_2a8,(pCVar42->perspective).zfar,(json *)local_378);
            if ((string *)local_2b8._0_8_ != (string *)local_2a8) {
              operator_delete((void *)local_2b8._0_8_);
            }
            local_2a8[4] = 'r';
            local_2a8[0] = 'z';
            local_2a8[1] = 'n';
            local_2a8[2] = 'e';
            local_2a8[3] = 'a';
            local_2b8._8_8_ = (string *)0x5;
            local_2a8[5] = '\0';
            local_2b8._0_8_ = (string *)local_2a8;
            SerializeNumberProperty<double>
                      ((string *)local_2a8,(pCVar42->perspective).znear,(json *)local_378);
            if ((string *)local_2b8._0_8_ != (string *)local_2a8) {
              operator_delete((void *)local_2b8._0_8_);
            }
            dVar7 = (pCVar42->perspective).aspectRatio;
            if (0.0 < dVar7) {
              local_2a8[0] = 'a';
              local_2a8[1] = 's';
              local_2a8[2] = 'p';
              local_2a8[3] = 'e';
              local_2a8[4] = 'c';
              local_2a8[5] = 't';
              local_2a8[6] = 'R';
              local_2a8[7] = 'a';
              local_2a8[8] = 't';
              local_2a8[9] = 'i';
              local_2a8[10] = 'o';
              local_2b8._8_8_ = (string *)0xb;
              local_2a8[0xb] = '\0';
              local_2b8._0_8_ = (string *)local_2a8;
              SerializeNumberProperty<double>((string *)local_2a8,dVar7,(json *)local_378);
              if ((string *)local_2b8._0_8_ != (string *)local_2a8) {
                operator_delete((void *)local_2b8._0_8_);
              }
            }
            dVar7 = (pCVar42->perspective).yfov;
            if (0.0 < dVar7) {
              local_2a8[0] = 'y';
              local_2a8[1] = 'f';
              local_2a8[2] = 'o';
              local_2a8[3] = 'v';
              local_2b8._8_8_ = (string *)0x4;
              local_2a8[4] = '\0';
              local_2b8._0_8_ = (string *)local_2a8;
              SerializeNumberProperty<double>((string *)local_2a8,dVar7,(json *)local_378);
              if ((string *)local_2b8._0_8_ != (string *)local_2a8) {
                operator_delete((void *)local_2b8._0_8_);
              }
            }
            SerializeExtensionMap(&(pCVar42->perspective).extensions,(json *)local_378);
            SerializeExtras(&(pCVar42->perspective).extras,(json *)local_378);
            detail::JsonAddMember((json *)&local_328,"perspective",(json *)local_378);
            goto LAB_001228f0;
          }
        }
        SerializeExtensionMap(&pCVar42->extensions,(json *)&local_328);
        SerializeExtras(&pCVar42->extras,(json *)&local_328);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::push_back((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)local_348,
                    (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)&local_328);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                       *)&local_328);
        uVar25 = (ulong)pEVar50 & 0xffffffff;
        uVar34 = ((long)(local_350->cameras).
                        super__Vector_base<tinygltf::Camera,_std::allocator<tinygltf::Camera>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)(local_350->cameras).
                        super__Vector_base<tinygltf::Camera,_std::allocator<tinygltf::Camera>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 3) * 0x2a4bafdc61f2a4bb;
        iVar22 = iVar22 + 1;
        model = local_350;
      } while (uVar25 <= uVar34 && uVar34 - uVar25 != 0);
    }
    detail::JsonAddMember((json *)local_318.field_2._8_8_,"cameras",(json *)local_348);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)local_348);
    model = local_350;
  }
  SerializeExtensionMap(&model->extensions,(json *)local_318.field_2._8_8_);
  SerializeExtras(&model->extras,(json *)local_318.field_2._8_8_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_2f8,&model->extensionsUsed);
  if ((model->lights).super__Vector_base<tinygltf::Light,_std::allocator<tinygltf::Light>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (model->lights).super__Vector_base<tinygltf::Light,_std::allocator<tinygltf::Light>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_348._0_8_ = local_348._0_8_ & 0xffffffffffffff00;
    local_348._8_8_ = (string *)0x0;
    uVar40 = 1;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)local_348,true);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)local_348,true);
    if ((model->lights).super__Vector_base<tinygltf::Light,_std::allocator<tinygltf::Light>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        (model->lights).super__Vector_base<tinygltf::Light,_std::allocator<tinygltf::Light>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      uVar25 = 0;
      do {
        local_328._M_allocated_capacity = local_328._M_allocated_capacity & 0xffffffffffffff00;
        local_328._8_8_ = (string *)0x0;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            *)&local_328,true);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            *)&local_328,true);
        pLVar16 = (model->lights).
                  super__Vector_base<tinygltf::Light,_std::allocator<tinygltf::Light>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pLVar4 = pLVar16 + uVar25;
        if (pLVar16[uVar25].name._M_string_length != 0) {
          local_2a8[0] = 'n';
          local_2a8[1] = 'a';
          local_2a8[2] = 'm';
          local_2a8[3] = 'e';
          local_2b8._8_8_ = (pointer)0x4;
          local_2a8[4] = '\0';
          local_2b8._0_8_ = (string *)local_2a8;
          SerializeStringProperty
                    ((string *)local_2a8,(string *)(pLVar4->name)._M_dataplus._M_p,
                     (json *)&local_328);
          if ((string *)local_2b8._0_8_ != (string *)local_2a8) {
            operator_delete((void *)local_2b8._0_8_);
          }
        }
        local_2a8[0] = 'i';
        local_2a8[1] = 'n';
        local_2a8[2] = 't';
        local_2a8[3] = 'e';
        local_2a8[4] = 'n';
        local_2a8[5] = 's';
        local_2a8[6] = 'i';
        local_2a8[7] = 't';
        local_2a8[8] = 'y';
        local_2b8._8_8_ = (pointer)0x9;
        local_2a8[9] = '\0';
        local_2b8._0_8_ = (string *)local_2a8;
        SerializeNumberProperty<double>((string *)local_2a8,pLVar4->intensity,(json *)&local_328);
        if ((string *)local_2b8._0_8_ != (string *)local_2a8) {
          operator_delete((void *)local_2b8._0_8_);
        }
        if (0.0 < pLVar4->range) {
          local_2a8[4] = 'e';
          local_2a8[0] = 'r';
          local_2a8[1] = 'a';
          local_2a8[2] = 'n';
          local_2a8[3] = 'g';
          local_2b8._8_8_ = (pointer)0x5;
          local_2a8[5] = '\0';
          local_2b8._0_8_ = (string *)local_2a8;
          SerializeNumberProperty<double>((string *)local_2a8,pLVar4->range,(json *)&local_328);
          if ((string *)local_2b8._0_8_ != (string *)local_2a8) {
            operator_delete((void *)local_2b8._0_8_);
          }
        }
        local_2a8[4] = 'r';
        local_2a8[0] = 'c';
        local_2a8[1] = 'o';
        local_2a8[2] = 'l';
        local_2a8[3] = 'o';
        local_2b8._8_8_ = (pointer)0x5;
        local_2a8[5] = '\0';
        local_2b8._0_8_ = (string *)local_2a8;
        SerializeNumberArrayProperty<double>((string *)local_2b8,&pLVar4->color,(json *)&local_328);
        if ((string *)local_2b8._0_8_ != (string *)local_2a8) {
          operator_delete((void *)local_2b8._0_8_);
        }
        local_2a8[0] = 't';
        local_2a8[1] = 'y';
        local_2a8[2] = 'p';
        local_2a8[3] = 'e';
        local_2b8._8_8_ = (string *)0x4;
        local_2a8[4] = '\0';
        local_2b8._0_8_ = (string *)local_2a8;
        SerializeStringProperty
                  ((string *)local_2a8,(string *)(pLVar4->type)._M_dataplus._M_p,(json *)&local_328)
        ;
        if ((string *)local_2b8._0_8_ != (string *)local_2a8) {
          operator_delete((void *)local_2b8._0_8_);
        }
        iVar22 = std::__cxx11::string::compare((char *)&pLVar4->type);
        if (iVar22 == 0) {
          local_2d0 = (ExtensionMap *)CONCAT44(local_2d0._4_4_,uVar40);
          local_378._0_8_ = local_378._0_8_ & 0xffffffffffffff00;
          local_378._8_8_ = (object_t *)0x0;
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)local_378,true);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)local_378,true);
          local_2a8[8] = 'e';
          local_2a8[9] = 'A';
          local_2a8[10] = 'n';
          local_2a8[0xb] = 'g';
          local_2a8[0xc] = 'l';
          local_2a8[0xd] = 'e';
          local_2a8[0] = 'i';
          local_2a8[1] = 'n';
          local_2a8[2] = 'n';
          local_2a8[3] = 'e';
          local_2a8[4] = 'r';
          local_2a8[5] = 'C';
          local_2a8[6] = 'o';
          local_2a8[7] = 'n';
          local_2b8._8_8_ = (pointer)0xe;
          local_2a8[0xe] = '\0';
          local_2b8._0_8_ = (string *)local_2a8;
          SerializeNumberProperty<double>
                    ((string *)local_2a8,(pLVar4->spot).innerConeAngle,(json *)local_378);
          if ((string *)local_2b8._0_8_ != (string *)local_2a8) {
            operator_delete((void *)local_2b8._0_8_);
          }
          local_2a8[8] = 'e';
          local_2a8[9] = 'A';
          local_2a8[10] = 'n';
          local_2a8[0xb] = 'g';
          local_2a8[0xc] = 'l';
          local_2a8[0xd] = 'e';
          local_2a8[0] = 'o';
          local_2a8[1] = 'u';
          local_2a8[2] = 't';
          local_2a8[3] = 'e';
          local_2a8[4] = 'r';
          local_2a8[5] = 'C';
          local_2a8[6] = 'o';
          local_2a8[7] = 'n';
          local_2b8._8_8_ = (string *)0xe;
          local_2a8[0xe] = '\0';
          local_2b8._0_8_ = (string *)local_2a8;
          SerializeNumberProperty<double>
                    ((string *)local_2a8,(pLVar4->spot).outerConeAngle,(json *)local_378);
          uVar40 = (uint)local_2d0;
          if ((string *)local_2b8._0_8_ != (string *)local_2a8) {
            operator_delete((void *)local_2b8._0_8_);
          }
          SerializeExtensionMap(&(pLVar4->spot).extensions,(json *)local_378);
          SerializeExtras(&(pLVar4->spot).extras,(json *)local_378);
          detail::JsonAddMember((json *)&local_328,"spot",(json *)local_378);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         *)local_378);
        }
        SerializeExtensionMap(&pLVar4->extensions,(json *)&local_328);
        SerializeExtras(&pLVar4->extras,(json *)&local_328);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::push_back((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)local_348,
                    (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)&local_328);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                       *)&local_328);
        uVar25 = (ulong)uVar40;
        uVar34 = ((long)(local_350->lights).
                        super__Vector_base<tinygltf::Light,_std::allocator<tinygltf::Light>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)(local_350->lights).
                        super__Vector_base<tinygltf::Light,_std::allocator<tinygltf::Light>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 3) * 0x2c3f35ba781948b1;
        uVar40 = uVar40 + 1;
        model = local_350;
      } while (uVar25 <= uVar34 && uVar34 - uVar25 != 0);
    }
    local_378._0_8_ = local_378._0_8_ & 0xffffffffffffff00;
    local_378._8_8_ = (object_t *)0x0;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)local_378,true);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)local_378,true);
    detail::JsonAddMember((json *)local_378,"lights",(json *)local_348);
    local_328._M_allocated_capacity = local_328._M_allocated_capacity & 0xffffffffffffff00;
    local_328._8_8_ = (string *)0x0;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)&local_328,true);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)&local_328,true);
    local_2a8[0] = '\0';
    local_2a8[1] = '\0';
    local_2a8[2] = '\0';
    local_2a8[3] = '\0';
    local_2a8[4] = '\0';
    local_2a8[5] = '\0';
    local_2a8[6] = '\0';
    local_2a8[7] = '\0';
    local_2b8._0_8_ = (string *)0x0;
    local_2b8._8_8_ = (string *)0x0;
    local_2a8[8] = '\0';
    local_2a8[9] = '\0';
    local_2a8[10] = '\0';
    local_2a8[0xb] = '\0';
    local_2a8[0xc] = '\0';
    local_2a8[0xd] = '\0';
    local_2a8[0xe] = '\0';
    local_2a8[0xf] = -0x80;
    bVar54 = detail::FindMember((json *)local_318.field_2._8_8_,"extensions",
                                (json_const_iterator *)local_2b8);
    if (bVar54) {
      pbVar29 = nlohmann::detail::
                iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)local_2b8);
      detail::JsonAssign((json *)&local_328,pbVar29);
    }
    detail::JsonAddMember((json *)&local_328,"KHR_lights_punctual",(json *)local_378);
    detail::JsonAddMember((json *)local_318.field_2._8_8_,"extensions",(json *)&local_328);
    pdVar21 = local_2f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish;
    jVar37.number_integer._1_7_ =
         local_2f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start._1_7_;
    jVar37.boolean =
         (boolean_t)
         local_2f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start._0_1_;
    lVar49 = (long)local_2f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)jVar37;
    if (0 < lVar49 >> 7) {
      lVar43 = (lVar49 >> 7) + 1;
      do {
        iVar22 = std::__cxx11::string::compare((char *)jVar37.object);
        model = local_350;
        jVar38 = jVar37;
        if (iVar22 == 0) goto LAB_00122fa3;
        iVar22 = std::__cxx11::string::compare(&(jVar37.binary)->m_has_subtype);
        model = local_350;
        jVar38 = (json_value)&(jVar37.binary)->m_has_subtype;
        if (iVar22 == 0) goto LAB_00122fa3;
        iVar22 = std::__cxx11::string::compare((char *)(jVar37.number_integer + 0x40));
        model = local_350;
        jVar38.object = (object_t *)(jVar37.number_integer + 0x40);
        if (iVar22 == 0) goto LAB_00122fa3;
        iVar22 = std::__cxx11::string::compare((char *)(jVar37.number_integer + 0x60));
        model = local_350;
        jVar38.object = (object_t *)(jVar37.number_integer + 0x60);
        if (iVar22 == 0) goto LAB_00122fa3;
        jVar37.object = (object_t *)(jVar37.number_integer + 0x80);
        lVar43 = lVar43 + -1;
        lVar49 = lVar49 + -0x80;
      } while (1 < lVar43);
    }
    lVar49 = lVar49 >> 5;
    model = local_350;
    if (lVar49 == 1) {
LAB_00122f81:
      iVar22 = std::__cxx11::string::compare((char *)jVar37.object);
      jVar38 = (json_value)pdVar21;
      if (iVar22 == 0) {
        jVar38 = jVar37;
      }
    }
    else if (lVar49 == 2) {
LAB_00122f5f:
      model = local_350;
      iVar22 = std::__cxx11::string::compare((char *)jVar37.object);
      jVar38 = jVar37;
      if (iVar22 != 0) {
        jVar37.object = (object_t *)&(jVar37.binary)->m_has_subtype;
        goto LAB_00122f81;
      }
    }
    else {
      jVar38 = (json_value)pdVar21;
      if ((lVar49 == 3) &&
         (iVar22 = std::__cxx11::string::compare((char *)jVar37.object), model = local_350,
         jVar38 = jVar37, iVar22 != 0)) {
        jVar37.object =
             (object_t *)&((jVar37.object)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right;
        goto LAB_00122f5f;
      }
    }
LAB_00122fa3:
    if (jVar38.object ==
        (object_t *)
        local_2f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      local_2b8._0_8_ = local_2a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"KHR_lights_punctual","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_2f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b8);
      if ((string *)local_2b8._0_8_ != (string *)local_2a8) {
        operator_delete((void *)local_2b8._0_8_);
      }
    }
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)&local_328);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)local_378);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)local_348);
  }
  if (((model->audioEmitters).
       super__Vector_base<tinygltf::AudioEmitter,_std::allocator<tinygltf::AudioEmitter>_>._M_impl.
       super__Vector_impl_data._M_start !=
       (model->audioEmitters).
       super__Vector_base<tinygltf::AudioEmitter,_std::allocator<tinygltf::AudioEmitter>_>._M_impl.
       super__Vector_impl_data._M_finish) ||
     ((model->audioSources).
      super__Vector_base<tinygltf::AudioSource,_std::allocator<tinygltf::AudioSource>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (model->audioSources).
      super__Vector_base<tinygltf::AudioSource,_std::allocator<tinygltf::AudioSource>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    local_2e0.m_type = null;
    local_2e0.m_value.object = (object_t *)0x0;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::assert_invariant(&local_2e0,true);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::assert_invariant(&local_2e0,true);
    if ((model->audioEmitters).
        super__Vector_base<tinygltf::AudioEmitter,_std::allocator<tinygltf::AudioEmitter>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (model->audioEmitters).
        super__Vector_base<tinygltf::AudioEmitter,_std::allocator<tinygltf::AudioEmitter>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar25 = 1;
      uVar34 = 0;
      do {
        uVar51 = uVar25;
        local_348._0_8_ = local_348._0_8_ & 0xffffffffffffff00;
        local_348._8_8_ = (string *)0x0;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            *)local_348,true);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            *)local_348,true);
        pAVar17 = (model->audioEmitters).
                  super__Vector_base<tinygltf::AudioEmitter,_std::allocator<tinygltf::AudioEmitter>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pAVar5 = pAVar17 + uVar34;
        if (pAVar17[uVar34].name._M_string_length != 0) {
          local_2a8[0] = 'n';
          local_2a8[1] = 'a';
          local_2a8[2] = 'm';
          local_2a8[3] = 'e';
          local_2b8._8_8_ = (string *)0x4;
          local_2a8[4] = '\0';
          local_2b8._0_8_ = (string *)local_2a8;
          SerializeStringProperty
                    ((string *)local_2a8,(string *)(pAVar5->name)._M_dataplus._M_p,
                     (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)local_348);
          if ((string *)local_2b8._0_8_ != (string *)local_2a8) {
            operator_delete((void *)local_2b8._0_8_);
          }
        }
        if (1e-12 <= ABS(1.0 - pAVar5->gain)) {
          local_2a8[0] = 'g';
          local_2a8[1] = 'a';
          local_2a8[2] = 'i';
          local_2a8[3] = 'n';
          local_2b8._8_8_ = (string *)0x4;
          local_2a8[4] = '\0';
          local_2b8._0_8_ = (string *)local_2a8;
          SerializeNumberProperty<double>
                    ((string *)local_2a8,pAVar5->gain,
                     (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)local_348);
          if ((string *)local_2b8._0_8_ != (string *)local_2a8) {
            operator_delete((void *)local_2b8._0_8_);
          }
        }
        if (pAVar5->loop == true) {
          local_2a8[0] = 'l';
          local_2a8[1] = 'o';
          local_2a8[2] = 'o';
          local_2a8[3] = 'p';
          local_2b8._8_8_ = (string *)0x4;
          local_2a8[4] = '\0';
          local_2b8._0_8_ = (string *)local_2a8;
          SerializeNumberProperty<bool>
                    ((string *)local_2a8,pAVar5->loop,
                     (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)local_348);
          if ((string *)local_2b8._0_8_ != (string *)local_2a8) {
            operator_delete((void *)local_2b8._0_8_);
          }
        }
        if (pAVar5->playing == true) {
          local_2a8[4] = 'i';
          local_2a8[5] = 'n';
          local_2a8[6] = 'g';
          local_2a8[0] = 'p';
          local_2a8[1] = 'l';
          local_2a8[2] = 'a';
          local_2a8[3] = 'y';
          local_2b8._8_8_ = (string *)0x7;
          local_2a8[7] = '\0';
          local_2b8._0_8_ = (string *)local_2a8;
          SerializeNumberProperty<bool>
                    ((string *)local_2a8,pAVar5->playing,
                     (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)local_348);
          if ((string *)local_2b8._0_8_ != (string *)local_2a8) {
            operator_delete((void *)local_2b8._0_8_);
          }
        }
        if ((pAVar5->type)._M_string_length != 0) {
          local_2a8[0] = 't';
          local_2a8[1] = 'y';
          local_2a8[2] = 'p';
          local_2a8[3] = 'e';
          local_2b8._8_8_ = (string *)0x4;
          local_2a8[4] = '\0';
          local_2b8._0_8_ = (string *)local_2a8;
          SerializeStringProperty
                    ((string *)local_2a8,(string *)(pAVar5->type)._M_dataplus._M_p,
                     (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)local_348);
          if ((string *)local_2b8._0_8_ != (string *)local_2a8) {
            operator_delete((void *)local_2b8._0_8_);
          }
        }
        if ((pAVar5->distanceModel)._M_string_length != 0) {
          local_2a8[8] = 'M';
          local_2a8[9] = 'o';
          local_2a8[10] = 'd';
          local_2a8[0xb] = 'e';
          local_2a8[0xc] = 'l';
          local_2a8[0] = 'd';
          local_2a8[1] = 'i';
          local_2a8[2] = 's';
          local_2a8[3] = 't';
          local_2a8[4] = 'a';
          local_2a8[5] = 'n';
          local_2a8[6] = 'c';
          local_2a8[7] = 'e';
          local_2b8._8_8_ = (string *)0xd;
          local_2a8[0xd] = '\0';
          local_2b8._0_8_ = (string *)local_2a8;
          SerializeStringProperty
                    ((string *)local_2a8,(string *)(pAVar5->distanceModel)._M_dataplus._M_p,
                     (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)local_348);
          if ((string *)local_2b8._0_8_ != (string *)local_2a8) {
            operator_delete((void *)local_2b8._0_8_);
          }
        }
        iVar22 = std::__cxx11::string::compare((char *)&pAVar5->type);
        if (iVar22 == 0) {
          local_378._0_8_ = local_378._0_8_ & 0xffffffffffffff00;
          local_378._8_8_ = (object_t *)0x0;
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)local_378,true);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)local_378,true);
          dVar7 = (pAVar5->positional).coneInnerAngle;
          if (1e-12 <= ABS(6.283185307179586 - dVar7)) {
            local_2a8[8] = 'r';
            local_2a8[9] = 'A';
            local_2a8[10] = 'n';
            local_2a8[0xb] = 'g';
            local_2a8[0xc] = 'l';
            local_2a8[0xd] = 'e';
            local_2a8[0] = 'c';
            local_2a8[1] = 'o';
            local_2a8[2] = 'n';
            local_2a8[3] = 'e';
            local_2a8[4] = 'I';
            local_2a8[5] = 'n';
            local_2a8[6] = 'n';
            local_2a8[7] = 'e';
            local_2b8._8_8_ = (string *)0xe;
            local_2a8[0xe] = '\0';
            local_2b8._0_8_ = (string *)local_2a8;
            SerializeNumberProperty<double>((string *)local_2a8,dVar7,(json *)local_378);
            if ((string *)local_2b8._0_8_ != (string *)local_2a8) {
              operator_delete((void *)local_2b8._0_8_);
            }
          }
          dVar7 = (pAVar5->positional).coneOuterAngle;
          if (1e-12 <= ABS(6.283185307179586 - dVar7)) {
            local_2a8[8] = 'r';
            local_2a8[9] = 'A';
            local_2a8[10] = 'n';
            local_2a8[0xb] = 'g';
            local_2a8[0xc] = 'l';
            local_2a8[0xd] = 'e';
            local_2a8[0] = 'c';
            local_2a8[1] = 'o';
            local_2a8[2] = 'n';
            local_2a8[3] = 'e';
            local_2a8[4] = 'O';
            local_2a8[5] = 'u';
            local_2a8[6] = 't';
            local_2a8[7] = 'e';
            local_2b8._8_8_ = (string *)0xe;
            local_2a8[0xe] = '\0';
            local_2b8._0_8_ = (string *)local_2a8;
            SerializeNumberProperty<double>((string *)local_2a8,dVar7,(json *)local_378);
            if ((string *)local_2b8._0_8_ != (string *)local_2a8) {
              operator_delete((void *)local_2b8._0_8_);
            }
          }
          dVar7 = (pAVar5->positional).coneOuterGain;
          if (0.0 < dVar7) {
            local_2a8[8] = 'r';
            local_2a8[9] = 'G';
            local_2a8[10] = 'a';
            local_2a8[0xb] = 'i';
            local_2a8[0xc] = 'n';
            local_2a8[0] = 'c';
            local_2a8[1] = 'o';
            local_2a8[2] = 'n';
            local_2a8[3] = 'e';
            local_2a8[4] = 'O';
            local_2a8[5] = 'u';
            local_2a8[6] = 't';
            local_2a8[7] = 'e';
            local_2b8._8_8_ = (string *)0xd;
            local_2a8[0xd] = '\0';
            local_2b8._0_8_ = (string *)local_2a8;
            SerializeNumberProperty<double>((string *)local_2a8,dVar7,(json *)local_378);
            if ((string *)local_2b8._0_8_ != (string *)local_2a8) {
              operator_delete((void *)local_2b8._0_8_);
            }
          }
          dVar7 = (pAVar5->positional).maxDistance;
          if (1e-12 <= ABS(100.0 - dVar7)) {
            local_2a8[0] = 'm';
            local_2a8[1] = 'a';
            local_2a8[2] = 'x';
            local_2a8[3] = 'D';
            local_2a8[4] = 'i';
            local_2a8[5] = 's';
            local_2a8[6] = 't';
            local_2a8[7] = 'a';
            local_2a8[8] = 'n';
            local_2a8[9] = 'c';
            local_2a8[10] = 'e';
            local_2b8._8_8_ = (string *)0xb;
            local_2a8[0xb] = '\0';
            local_2b8._0_8_ = (string *)local_2a8;
            SerializeNumberProperty<double>((string *)local_2a8,dVar7,(json *)local_378);
            if ((string *)local_2b8._0_8_ != (string *)local_2a8) {
              operator_delete((void *)local_2b8._0_8_);
            }
          }
          dVar7 = (pAVar5->positional).refDistance;
          if (1e-12 <= ABS(1.0 - dVar7)) {
            local_2a8[0] = 'r';
            local_2a8[1] = 'e';
            local_2a8[2] = 'f';
            local_2a8[3] = 'D';
            local_2a8[4] = 'i';
            local_2a8[5] = 's';
            local_2a8[6] = 't';
            local_2a8[7] = 'a';
            local_2a8[8] = 'n';
            local_2a8[9] = 'c';
            local_2a8[10] = 'e';
            local_2b8._8_8_ = (string *)0xb;
            local_2a8[0xb] = '\0';
            local_2b8._0_8_ = (string *)local_2a8;
            SerializeNumberProperty<double>((string *)local_2a8,dVar7,(json *)local_378);
            if ((string *)local_2b8._0_8_ != (string *)local_2a8) {
              operator_delete((void *)local_2b8._0_8_);
            }
          }
          dVar7 = (pAVar5->positional).rolloffFactor;
          if (1e-12 <= ABS(1.0 - dVar7)) {
            local_2a8[8] = 'a';
            local_2a8[9] = 'c';
            local_2a8[10] = 't';
            local_2a8[0xb] = 'o';
            local_2a8[0xc] = 'r';
            local_2a8[0] = 'r';
            local_2a8[1] = 'o';
            local_2a8[2] = 'l';
            local_2a8[3] = 'l';
            local_2a8[4] = 'o';
            local_2a8[5] = 'f';
            local_2a8[6] = 'f';
            local_2a8[7] = 'F';
            local_2b8._8_8_ = (string *)0xd;
            local_2a8[0xd] = '\0';
            local_2b8._0_8_ = (string *)local_2a8;
            SerializeNumberProperty<double>((string *)local_2a8,dVar7,(json *)local_378);
            if ((string *)local_2b8._0_8_ != (string *)local_2a8) {
              operator_delete((void *)local_2b8._0_8_);
            }
          }
          SerializeExtensionMap(&(pAVar5->positional).extensions,(json *)local_378);
          SerializeExtras(&(pAVar5->positional).extras,(json *)local_378);
          detail::JsonAddMember
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)local_348,"positional",(json *)local_378);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         *)local_378);
        }
        local_2a8[4] = 'c';
        local_2a8[5] = 'e';
        local_2a8[0] = 's';
        local_2a8[1] = 'o';
        local_2a8[2] = 'u';
        local_2a8[3] = 'r';
        local_2b8._8_8_ = (string *)0x6;
        local_2a8[6] = '\0';
        local_2b8._0_8_ = (string *)local_2a8;
        SerializeNumberProperty<int>
                  ((string *)local_2a8,pAVar5->source,
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)local_348);
        if ((string *)local_2b8._0_8_ != (string *)local_2a8) {
          operator_delete((void *)local_2b8._0_8_);
        }
        SerializeExtensionMap
                  (&pAVar5->extensions,
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)local_348);
        SerializeExtras(&pAVar5->extras,
                        (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         *)local_348);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::push_back(&local_2e0,
                    (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)local_348);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                       *)local_348);
        uVar30 = ((long)(local_350->audioEmitters).
                        super__Vector_base<tinygltf::AudioEmitter,_std::allocator<tinygltf::AudioEmitter>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(local_350->audioEmitters).
                        super__Vector_base<tinygltf::AudioEmitter,_std::allocator<tinygltf::AudioEmitter>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x66fd0eb66fd0eb67;
        model = local_350;
        uVar25 = (ulong)((int)uVar51 + 1);
        uVar34 = uVar51;
      } while (uVar51 <= uVar30 && uVar30 - uVar51 != 0);
    }
    local_78.m_type = null;
    local_78.m_value.object = (object_t *)0x0;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::assert_invariant(&local_78,true);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::assert_invariant(&local_78,true);
    detail::JsonAddMember(&local_78,"emitters",&local_2e0);
    local_60.m_type = null;
    local_60.m_value.object = (object_t *)0x0;
    uVar40 = 1;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::assert_invariant(&local_60,true);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::assert_invariant(&local_60,true);
    if ((local_350->audioSources).
        super__Vector_base<tinygltf::AudioSource,_std::allocator<tinygltf::AudioSource>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (local_350->audioSources).
        super__Vector_base<tinygltf::AudioSource,_std::allocator<tinygltf::AudioSource>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar25 = 0;
      do {
        pMVar20 = local_350;
        local_40.m_type = null;
        local_40.m_value.object = (object_t *)0x0;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::assert_invariant(&local_40,true);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::assert_invariant(&local_40,true);
        pAVar18 = (pMVar20->audioSources).
                  super__Vector_base<tinygltf::AudioSource,_std::allocator<tinygltf::AudioSource>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pAVar6 = pAVar18 + uVar25;
        local_2b8._8_8_ = (string *)0x0;
        local_2a8[0] = '\0';
        local_378._0_8_ = local_378 + 0x10;
        local_378._8_8_ = (object_t *)0x0;
        local_378[0x10] = '\0';
        local_348._0_8_ = local_348 + 0x10;
        local_348._8_8_ = (string *)0x0;
        local_348._16_8_ = local_348._16_8_ & 0xffffffffffffff00;
        local_2b8._0_8_ = (string *)local_2a8;
        if (pAVar18[uVar25].name._M_string_length != 0) {
          local_328._8_8_ = 4;
          local_318._M_dataplus._M_p._0_5_ = 0x656d616e;
          local_328._M_allocated_capacity = (size_type)&local_318;
          SerializeStringProperty(&local_318,(string *)(pAVar6->name)._M_dataplus._M_p,&local_40);
          if ((string *)local_328._M_allocated_capacity != &local_318) {
            operator_delete((void *)local_328._M_allocated_capacity);
          }
        }
        if ((pAVar6->uri)._M_string_length == 0) {
          local_318._M_dataplus._M_p = (pointer)0x65707954656d696d;
          local_328._8_8_ = 8;
          local_318._M_string_length = local_318._M_string_length & 0xffffffffffffff00;
          local_328._M_allocated_capacity = (size_type)&local_318;
          SerializeStringProperty
                    (&local_318,(string *)(pAVar6->mimeType)._M_dataplus._M_p,&local_40);
          if ((string *)local_328._M_allocated_capacity != &local_318) {
            operator_delete((void *)local_328._M_allocated_capacity);
          }
          local_318._M_dataplus._M_p = (pointer)0x6956726566667562;
          local_328._8_8_ = (string *)0xa;
          local_318._M_string_length = CONCAT53(local_318._M_string_length._3_5_,0x7765);
          local_328._M_allocated_capacity = (size_type)&local_318;
          SerializeNumberProperty<int>(&local_318,pAVar6->bufferView,&local_40);
        }
        else {
          local_328._8_8_ = (string *)0x3;
          local_318._M_dataplus._M_p._0_4_ = 0x697275;
          local_328._M_allocated_capacity = (size_type)&local_318;
          SerializeStringProperty(&local_318,(string *)(pAVar6->uri)._M_dataplus._M_p,&local_40);
        }
        if ((string *)local_328._M_allocated_capacity != &local_318) {
          operator_delete((void *)local_328._M_allocated_capacity);
        }
        SerializeExtensionMap(&pAVar6->extensions,&local_40);
        SerializeExtras(&pAVar6->extras,&local_40);
        if ((string *)local_348._0_8_ != (string *)(local_348 + 0x10)) {
          operator_delete((void *)local_348._0_8_);
        }
        if ((string *)local_378._0_8_ != (string *)(local_378 + 0x10)) {
          operator_delete((void *)local_378._0_8_);
        }
        if ((string *)local_2b8._0_8_ != (string *)local_2a8) {
          operator_delete((void *)local_2b8._0_8_);
        }
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::push_back(&local_60,&local_40);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::~basic_json(&local_40);
        uVar25 = (ulong)uVar40;
        uVar34 = ((long)(local_350->audioSources).
                        super__Vector_base<tinygltf::AudioSource,_std::allocator<tinygltf::AudioSource>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(local_350->audioSources).
                        super__Vector_base<tinygltf::AudioSource,_std::allocator<tinygltf::AudioSource>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x2c8590b21642c859;
        uVar40 = uVar40 + 1;
      } while (uVar25 <= uVar34 && uVar34 - uVar25 != 0);
    }
    detail::JsonAddMember(&local_78,"sources",&local_60);
    local_378._0_8_ = local_378._0_8_ & 0xffffffffffffff00;
    local_378._8_8_ = (object_t *)0x0;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)local_378,true);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)local_378,true);
    local_2a8[0] = '\0';
    local_2a8[1] = '\0';
    local_2a8[2] = '\0';
    local_2a8[3] = '\0';
    local_2a8[4] = '\0';
    local_2a8[5] = '\0';
    local_2a8[6] = '\0';
    local_2a8[7] = '\0';
    local_2b8._0_8_ = (string *)0x0;
    local_2b8._8_8_ = (string *)0x0;
    local_2a8[8] = '\0';
    local_2a8[9] = '\0';
    local_2a8[10] = '\0';
    local_2a8[0xb] = '\0';
    local_2a8[0xc] = '\0';
    local_2a8[0xd] = '\0';
    local_2a8[0xe] = '\0';
    local_2a8[0xf] = -0x80;
    bVar54 = detail::FindMember((json *)local_318.field_2._8_8_,"extensions",
                                (json_const_iterator *)local_2b8);
    if (bVar54) {
      pbVar29 = nlohmann::detail::
                iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)local_2b8);
      detail::JsonAssign((json *)local_378,pbVar29);
    }
    detail::JsonAddMember((json *)local_378,"KHR_audio",&local_78);
    detail::JsonAddMember((json *)local_318.field_2._8_8_,"extensions",(json *)local_378);
    pdVar21 = local_2f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish;
    jVar38.number_integer._1_7_ =
         local_2f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start._1_7_;
    jVar38.boolean =
         (boolean_t)
         local_2f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start._0_1_;
    lVar49 = (long)local_2f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)jVar38;
    if (0 < lVar49 >> 7) {
      lVar43 = (lVar49 >> 7) + 1;
      do {
        iVar22 = std::__cxx11::string::compare((char *)jVar38.object);
        model = local_350;
        jVar37 = jVar38;
        if (iVar22 == 0) goto LAB_00123be1;
        iVar22 = std::__cxx11::string::compare(&(jVar38.binary)->m_has_subtype);
        model = local_350;
        jVar37 = (json_value)&(jVar38.binary)->m_has_subtype;
        if (iVar22 == 0) goto LAB_00123be1;
        iVar22 = std::__cxx11::string::compare((char *)(jVar38.number_integer + 0x40));
        model = local_350;
        jVar37.object = (object_t *)(jVar38.number_integer + 0x40);
        if (iVar22 == 0) goto LAB_00123be1;
        iVar22 = std::__cxx11::string::compare((char *)(jVar38.number_integer + 0x60));
        model = local_350;
        jVar37.object = (object_t *)(jVar38.number_integer + 0x60);
        if (iVar22 == 0) goto LAB_00123be1;
        jVar38.object = (object_t *)(jVar38.number_integer + 0x80);
        lVar43 = lVar43 + -1;
        lVar49 = lVar49 + -0x80;
      } while (1 < lVar43);
    }
    lVar49 = lVar49 >> 5;
    model = local_350;
    if (lVar49 == 1) {
LAB_00123bbf:
      iVar22 = std::__cxx11::string::compare((char *)jVar38.object);
      jVar37 = (json_value)pdVar21;
      if (iVar22 == 0) {
        jVar37 = jVar38;
      }
    }
    else if (lVar49 == 2) {
LAB_00123b9d:
      model = local_350;
      iVar22 = std::__cxx11::string::compare((char *)jVar38.object);
      jVar37 = jVar38;
      if (iVar22 != 0) {
        jVar38.object = (object_t *)&(jVar38.binary)->m_has_subtype;
        goto LAB_00123bbf;
      }
    }
    else {
      jVar37 = (json_value)pdVar21;
      if ((lVar49 == 3) &&
         (iVar22 = std::__cxx11::string::compare((char *)jVar38.object), model = local_350,
         jVar37 = jVar38, iVar22 != 0)) {
        jVar38.object =
             (object_t *)&((jVar38.object)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right;
        goto LAB_00123b9d;
      }
    }
LAB_00123be1:
    if (jVar37.object ==
        (object_t *)
        local_2f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      local_2b8._0_8_ = local_2a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"KHR_audio","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_2f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b8);
      if ((string *)local_2b8._0_8_ != (string *)local_2a8) {
        operator_delete((void *)local_2b8._0_8_);
      }
    }
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)local_378);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json(&local_60);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json(&local_78);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json(&local_2e0);
  }
  pdVar21 = local_2f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish;
  pNVar35 = (model->nodes).super__Vector_base<tinygltf::Node,_std::allocator<tinygltf::Node>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pNVar19 = (model->nodes).super__Vector_base<tinygltf::Node,_std::allocator<tinygltf::Node>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  lVar43 = (long)pNVar19 - (long)pNVar35;
  lVar49 = (lVar43 >> 3) * 0x4fbcda3ac10c9715 >> 2;
  if (0 < lVar49) {
    lVar43 = lVar49 + 1;
    pNVar33 = pNVar35 + 2;
    do {
      if (pNVar33[-2].lods.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start !=
          pNVar33[-2].lods.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pNVar33 = pNVar33 + -2;
        goto LAB_00123d8d;
      }
      if (pNVar33[-1].lods.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start !=
          pNVar33[-1].lods.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pNVar33 = pNVar33 + -1;
        goto LAB_00123d8d;
      }
      if ((pNVar33->lods).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start !=
          (pNVar33->lods).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish) goto LAB_00123d8d;
      if (pNVar33[1].lods.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start !=
          pNVar33[1].lods.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pNVar33 = pNVar33 + 1;
        goto LAB_00123d8d;
      }
      lVar43 = lVar43 + -1;
      pNVar33 = pNVar33 + 4;
    } while (1 < lVar43);
    lVar43 = (long)pNVar19 - (long)(pNVar35 + lVar49 * 4);
    pNVar35 = pNVar35 + lVar49 * 4;
  }
  lVar49 = (lVar43 >> 3) * 0x4fbcda3ac10c9715;
  if (lVar49 == 1) {
LAB_00123d63:
    pNVar33 = pNVar35;
    if ((pNVar35->lods).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (pNVar35->lods).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pNVar33 = pNVar19;
    }
  }
  else if (lVar49 == 2) {
LAB_00123d52:
    pNVar33 = pNVar35;
    if ((pNVar35->lods).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (pNVar35->lods).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pNVar35 = pNVar35 + 1;
      goto LAB_00123d63;
    }
  }
  else {
    pNVar33 = pNVar19;
    if ((lVar49 == 3) &&
       (pNVar33 = pNVar35,
       (pNVar35->lods).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
       ._M_start ==
       (pNVar35->lods).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
       ._M_finish)) {
      pNVar35 = pNVar35 + 1;
      goto LAB_00123d52;
    }
  }
LAB_00123d8d:
  pMVar44 = (model->materials).
            super__Vector_base<tinygltf::Material,_std::allocator<tinygltf::Material>_>._M_impl.
            super__Vector_impl_data._M_start;
  pMVar12 = (model->materials).
            super__Vector_base<tinygltf::Material,_std::allocator<tinygltf::Material>_>._M_impl.
            super__Vector_impl_data._M_finish;
  lVar43 = (long)pMVar12 - (long)pMVar44;
  lVar49 = (lVar43 >> 3) * -0x2a825c935d853211 >> 2;
  if (0 < lVar49) {
    lVar43 = lVar49 + 1;
    pMVar46 = pMVar44 + 2;
    do {
      if (pMVar46[-2].lods.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start !=
          pMVar46[-2].lods.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pMVar46 = pMVar46 + -2;
        goto LAB_00123eb5;
      }
      if (pMVar46[-1].lods.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start !=
          pMVar46[-1].lods.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pMVar46 = pMVar46 + -1;
        goto LAB_00123eb5;
      }
      if ((pMVar46->lods).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start !=
          (pMVar46->lods).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish) goto LAB_00123eb5;
      if (pMVar46[1].lods.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start !=
          pMVar46[1].lods.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pMVar46 = pMVar46 + 1;
        goto LAB_00123eb5;
      }
      lVar43 = lVar43 + -1;
      pMVar46 = pMVar46 + 4;
    } while (1 < lVar43);
    lVar43 = (long)pMVar12 - (long)(pMVar44 + lVar49 * 4);
    pMVar44 = pMVar44 + lVar49 * 4;
  }
  lVar49 = (lVar43 >> 3) * -0x2a825c935d853211;
  if (lVar49 == 1) {
LAB_00123e8b:
    pMVar46 = pMVar44;
    if ((pMVar44->lods).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (pMVar44->lods).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pMVar46 = pMVar12;
    }
  }
  else if (lVar49 == 2) {
LAB_00123e7a:
    pMVar46 = pMVar44;
    if ((pMVar44->lods).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (pMVar44->lods).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pMVar44 = pMVar44 + 1;
      goto LAB_00123e8b;
    }
  }
  else {
    pMVar46 = pMVar12;
    if ((lVar49 == 3) &&
       (pMVar46 = pMVar44,
       (pMVar44->lods).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
       ._M_start ==
       (pMVar44->lods).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
       ._M_finish)) {
      pMVar44 = pMVar44 + 1;
      goto LAB_00123e7a;
    }
  }
LAB_00123eb5:
  if ((pNVar33 == pNVar19) && (pMVar46 == pMVar12)) goto LAB_0012404d;
  jVar39.number_integer._1_7_ =
       local_2f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
       ._M_start._1_7_;
  jVar39.boolean =
       (boolean_t)
       local_2f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
       ._M_start._0_1_;
  lVar49 = (long)local_2f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)jVar39;
  if (0 < lVar49 >> 7) {
    lVar43 = (lVar49 >> 7) + 1;
    do {
      iVar22 = std::__cxx11::string::compare((char *)jVar39.object);
      jVar37 = jVar39;
      if (iVar22 == 0) goto LAB_00123ffe;
      iVar22 = std::__cxx11::string::compare(&(jVar39.binary)->m_has_subtype);
      jVar37 = (json_value)&(jVar39.binary)->m_has_subtype;
      if (iVar22 == 0) goto LAB_00123ffe;
      iVar22 = std::__cxx11::string::compare((char *)(jVar39.number_integer + 0x40));
      jVar37.object = (object_t *)(jVar39.number_integer + 0x40);
      if (iVar22 == 0) goto LAB_00123ffe;
      iVar22 = std::__cxx11::string::compare((char *)(jVar39.number_integer + 0x60));
      jVar37.object = (object_t *)(jVar39.number_integer + 0x60);
      if (iVar22 == 0) goto LAB_00123ffe;
      jVar39.object = (object_t *)(jVar39.number_integer + 0x80);
      lVar43 = lVar43 + -1;
      lVar49 = lVar49 + -0x80;
    } while (1 < lVar43);
  }
  lVar49 = lVar49 >> 5;
  if (lVar49 == 1) {
LAB_00123fd9:
    iVar22 = std::__cxx11::string::compare((char *)jVar39.object);
    jVar37 = (json_value)pdVar21;
    if (iVar22 == 0) {
      jVar37 = jVar39;
    }
  }
  else if (lVar49 == 2) {
LAB_00123fb4:
    iVar22 = std::__cxx11::string::compare((char *)jVar39.object);
    jVar37 = jVar39;
    if (iVar22 != 0) {
      jVar39.object = (object_t *)&(jVar39.binary)->m_has_subtype;
      goto LAB_00123fd9;
    }
  }
  else {
    jVar37 = (json_value)pdVar21;
    if ((lVar49 == 3) &&
       (iVar22 = std::__cxx11::string::compare((char *)jVar39.object), jVar37 = jVar39, iVar22 != 0)
       ) {
      jVar39.object =
           (object_t *)&((jVar39.object)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right;
      goto LAB_00123fb4;
    }
  }
LAB_00123ffe:
  if (jVar37.object ==
      (object_t *)
      local_2f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    local_2b8._0_8_ = (string *)local_2a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"MSFT_lod","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_2f8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b8);
    if ((string *)local_2b8._0_8_ != (string *)local_2a8) {
      operator_delete((void *)local_2b8._0_8_);
    }
  }
LAB_0012404d:
  if ((object_t *)
      local_2f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      (object_t *)
      CONCAT71(local_2f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start._1_7_,
               local_2f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start._0_1_)) {
    local_2b8._0_8_ = (string *)local_2a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"extensionsUsed","");
    SerializeStringArrayProperty
              ((string *)local_2b8,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_2f8,(json *)local_318.field_2._8_8_);
    if ((string *)local_2b8._0_8_ != (string *)local_2a8) {
      operator_delete((void *)local_2b8._0_8_);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_2f8);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&local_2c8);
  return;
}

Assistant:

static void SerializeGltfModel(const Model *model, detail::json &o) {
  // ACCESSORS
  if (model->accessors.size()) {
    detail::json accessors;
    detail::JsonReserveArray(accessors, model->accessors.size());
    for (unsigned int i = 0; i < model->accessors.size(); ++i) {
      detail::json accessor;
      SerializeGltfAccessor(model->accessors[i], accessor);
      detail::JsonPushBack(accessors, std::move(accessor));
    }
    detail::JsonAddMember(o, "accessors", std::move(accessors));
  }

  // ANIMATIONS
  if (model->animations.size()) {
    detail::json animations;
    detail::JsonReserveArray(animations, model->animations.size());
    for (unsigned int i = 0; i < model->animations.size(); ++i) {
      if (model->animations[i].channels.size()) {
        detail::json animation;
        SerializeGltfAnimation(model->animations[i], animation);
        detail::JsonPushBack(animations, std::move(animation));
      }
    }

    detail::JsonAddMember(o, "animations", std::move(animations));
  }

  // ASSET
  detail::json asset;
  SerializeGltfAsset(model->asset, asset);
  detail::JsonAddMember(o, "asset", std::move(asset));

  // BUFFERVIEWS
  if (model->bufferViews.size()) {
    detail::json bufferViews;
    detail::JsonReserveArray(bufferViews, model->bufferViews.size());
    for (unsigned int i = 0; i < model->bufferViews.size(); ++i) {
      detail::json bufferView;
      SerializeGltfBufferView(model->bufferViews[i], bufferView);
      detail::JsonPushBack(bufferViews, std::move(bufferView));
    }
    detail::JsonAddMember(o, "bufferViews", std::move(bufferViews));
  }

  // Extensions required
  if (model->extensionsRequired.size()) {
    SerializeStringArrayProperty("extensionsRequired",
                                 model->extensionsRequired, o);
  }

  // MATERIALS
  if (model->materials.size()) {
    detail::json materials;
    detail::JsonReserveArray(materials, model->materials.size());
    for (unsigned int i = 0; i < model->materials.size(); ++i) {
      detail::json material;
      SerializeGltfMaterial(model->materials[i], material);

      if (detail::JsonIsNull(material)) {
        // Issue 294.
        // `material` does not have any required parameters
        // so the result may be null(unmodified) when all material parameters
        // have default value.
        //
        // null is not allowed thus we create an empty JSON object.
        detail::JsonSetObject(material);
      }
      detail::JsonPushBack(materials, std::move(material));
    }
    detail::JsonAddMember(o, "materials", std::move(materials));
  }

  // MESHES
  if (model->meshes.size()) {
    detail::json meshes;
    detail::JsonReserveArray(meshes, model->meshes.size());
    for (unsigned int i = 0; i < model->meshes.size(); ++i) {
      detail::json mesh;
      SerializeGltfMesh(model->meshes[i], mesh);
      detail::JsonPushBack(meshes, std::move(mesh));
    }
    detail::JsonAddMember(o, "meshes", std::move(meshes));
  }

  // NODES
  if (model->nodes.size()) {
    detail::json nodes;
    detail::JsonReserveArray(nodes, model->nodes.size());
    for (unsigned int i = 0; i < model->nodes.size(); ++i) {
      detail::json node;
      SerializeGltfNode(model->nodes[i], node);

      if (detail::JsonIsNull(node)) {
        // Issue 457.
        // `node` does not have any required parameters,
        // so the result may be null(unmodified) when all node parameters
        // have default value.
        //
        // null is not allowed thus we create an empty JSON object.
        detail::JsonSetObject(node);
      }
      detail::JsonPushBack(nodes, std::move(node));
    }
    detail::JsonAddMember(o, "nodes", std::move(nodes));
  }

  // SCENE
  if (model->defaultScene > -1) {
    SerializeNumberProperty<int>("scene", model->defaultScene, o);
  }

  // SCENES
  if (model->scenes.size()) {
    detail::json scenes;
    detail::JsonReserveArray(scenes, model->scenes.size());
    for (unsigned int i = 0; i < model->scenes.size(); ++i) {
      detail::json currentScene;
      SerializeGltfScene(model->scenes[i], currentScene);
      if (detail::JsonIsNull(currentScene)) {
        // Issue 464.
        // `scene` does not have any required parameters,
        // so the result may be null(unmodified) when all scene parameters
        // have default value.
        //
        // null is not allowed thus we create an empty JSON object.
        detail::JsonSetObject(currentScene);
      }
      detail::JsonPushBack(scenes, std::move(currentScene));
    }
    detail::JsonAddMember(o, "scenes", std::move(scenes));
  }

  // SKINS
  if (model->skins.size()) {
    detail::json skins;
    detail::JsonReserveArray(skins, model->skins.size());
    for (unsigned int i = 0; i < model->skins.size(); ++i) {
      detail::json skin;
      SerializeGltfSkin(model->skins[i], skin);
      detail::JsonPushBack(skins, std::move(skin));
    }
    detail::JsonAddMember(o, "skins", std::move(skins));
  }

  // TEXTURES
  if (model->textures.size()) {
    detail::json textures;
    detail::JsonReserveArray(textures, model->textures.size());
    for (unsigned int i = 0; i < model->textures.size(); ++i) {
      detail::json texture;
      SerializeGltfTexture(model->textures[i], texture);
      detail::JsonPushBack(textures, std::move(texture));
    }
    detail::JsonAddMember(o, "textures", std::move(textures));
  }

  // SAMPLERS
  if (model->samplers.size()) {
    detail::json samplers;
    detail::JsonReserveArray(samplers, model->samplers.size());
    for (unsigned int i = 0; i < model->samplers.size(); ++i) {
      detail::json sampler;
      SerializeGltfSampler(model->samplers[i], sampler);
      detail::JsonPushBack(samplers, std::move(sampler));
    }
    detail::JsonAddMember(o, "samplers", std::move(samplers));
  }

  // CAMERAS
  if (model->cameras.size()) {
    detail::json cameras;
    detail::JsonReserveArray(cameras, model->cameras.size());
    for (unsigned int i = 0; i < model->cameras.size(); ++i) {
      detail::json camera;
      SerializeGltfCamera(model->cameras[i], camera);
      detail::JsonPushBack(cameras, std::move(camera));
    }
    detail::JsonAddMember(o, "cameras", std::move(cameras));
  }

  // EXTRAS & EXTENSIONS
  SerializeExtrasAndExtensions(*model, o);

  auto extensionsUsed = model->extensionsUsed;

  // LIGHTS as KHR_lights_punctual
  if (model->lights.size()) {
    detail::json lights;
    detail::JsonReserveArray(lights, model->lights.size());
    for (unsigned int i = 0; i < model->lights.size(); ++i) {
      detail::json light;
      SerializeGltfLight(model->lights[i], light);
      detail::JsonPushBack(lights, std::move(light));
    }
    detail::json khr_lights_cmn;
    detail::JsonAddMember(khr_lights_cmn, "lights", std::move(lights));
    detail::json ext_j;

    {
      detail::json_const_iterator it;
      if (detail::FindMember(o, "extensions", it)) {
        detail::JsonAssign(ext_j, detail::GetValue(it));
      }
    }

    detail::JsonAddMember(ext_j, "KHR_lights_punctual",
                          std::move(khr_lights_cmn));

    detail::JsonAddMember(o, "extensions", std::move(ext_j));

    // Also add "KHR_lights_punctual" to `extensionsUsed`
    {
      auto has_khr_lights_punctual =
          std::find_if(extensionsUsed.begin(), extensionsUsed.end(),
                       [](const std::string &s) {
                         return (s.compare("KHR_lights_punctual") == 0);
                       });

      if (has_khr_lights_punctual == extensionsUsed.end()) {
        extensionsUsed.push_back("KHR_lights_punctual");
      }
    }
  }

  // KHR_audio
  if (!model->audioEmitters.empty() || !model->audioSources.empty()) {
    detail::json emitters;
    detail::JsonReserveArray(emitters, model->audioEmitters.size());
    for (unsigned int i = 0; i < model->audioEmitters.size(); ++i) {
      detail::json emitter;
      SerializeGltfAudioEmitter(model->audioEmitters[i], emitter);
      detail::JsonPushBack(emitters, std::move(emitter));
    }
    detail::json khr_audio_cmn;
    detail::JsonAddMember(khr_audio_cmn, "emitters", std::move(emitters));

    detail::json sources;
    detail::JsonReserveArray(sources, model->audioSources.size());
    for (unsigned int i = 0; i < model->audioSources.size(); ++i) {
      detail::json source;
      SerializeGltfAudioSource(model->audioSources[i], source);
      detail::JsonPushBack(sources, std::move(source));
    }
    detail::JsonAddMember(khr_audio_cmn, "sources", std::move(sources));

    detail::json ext_j;
    {
      detail::json_const_iterator it;
      if (detail::FindMember(o, "extensions", it)) {
        detail::JsonAssign(ext_j, detail::GetValue(it));
      }
    }

    detail::JsonAddMember(ext_j, "KHR_audio", std::move(khr_audio_cmn));

    detail::JsonAddMember(o, "extensions", std::move(ext_j));

    // Also add "KHR_audio" to `extensionsUsed`
    {
      auto has_khr_audio = std::find_if(
          extensionsUsed.begin(), extensionsUsed.end(),
          [](const std::string &s) { return (s.compare("KHR_audio") == 0); });

      if (has_khr_audio == extensionsUsed.end()) {
        extensionsUsed.push_back("KHR_audio");
      }
    }
  }

  // MSFT_lod

  // Look if there is a node that employs MSFT_lod
  auto msft_lod_nodes_it = std::find_if(
    model->nodes.begin(), model->nodes.end(),
    [](const Node& node) { return !node.lods.empty(); });

  // Look if there is a material that employs MSFT_lod
  auto msft_lod_materials_it = std::find_if(
    model->materials.begin(), model->materials.end(),
    [](const Material& material) {return !material.lods.empty(); });

  // If either a node or a material employ MSFT_lod, then we need
  // to add MSFT_lod to the list of used extensions.
  if (msft_lod_nodes_it != model->nodes.end() || msft_lod_materials_it != model->materials.end()) {
    // First check if MSFT_lod is already registered as used extension
    auto has_msft_lod = std::find_if(
      extensionsUsed.begin(), extensionsUsed.end(),
      [](const std::string &s) { return (s.compare("MSFT_lod") == 0); });

    // If MSFT_lod is not registered yet, add it
    if (has_msft_lod == extensionsUsed.end()) {
      extensionsUsed.push_back("MSFT_lod");
    }
  }

  // Extensions used
  if (extensionsUsed.size()) {
    SerializeStringArrayProperty("extensionsUsed", extensionsUsed, o);
  }
}